

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersector1<8>::
     occluded_t<embree::avx::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [32];
  undefined1 (*pauVar10) [16];
  undefined1 (*pauVar11) [28];
  undefined4 uVar12;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  Primitive PVar33;
  __int_type_conflict _Var34;
  RTCFilterFunctionN p_Var35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [28];
  undefined1 auVar136 [28];
  undefined1 auVar137 [12];
  undefined1 auVar138 [28];
  undefined1 auVar139 [28];
  undefined1 auVar140 [28];
  undefined1 auVar141 [28];
  undefined1 auVar142 [28];
  uint uVar143;
  int iVar144;
  ulong uVar145;
  RTCIntersectArguments *pRVar146;
  uint uVar147;
  ulong uVar148;
  long lVar149;
  long lVar150;
  long lVar151;
  Geometry *pGVar152;
  long lVar153;
  bool bVar154;
  float fVar156;
  float fVar157;
  undefined1 auVar158 [16];
  float fVar155;
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar171;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar172;
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar189;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [24];
  float fVar187;
  float fVar190;
  float fVar193;
  float fVar197;
  undefined1 auVar178 [32];
  float fVar195;
  float fVar199;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  float fVar188;
  float fVar192;
  float fVar194;
  float fVar196;
  float fVar198;
  float fVar200;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar191;
  undefined1 auVar186 [64];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  float fVar212;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar213;
  undefined1 auVar209 [32];
  float fVar214;
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar215;
  float fVar232;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar231;
  float fVar233;
  float fVar234;
  float fVar236;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  float fVar235;
  float fVar237;
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar238;
  undefined1 auVar230 [64];
  float fVar239;
  float fVar247;
  float fVar248;
  float fVar249;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar250;
  float fVar251;
  float fVar252;
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar253;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar254;
  float fVar260;
  float fVar261;
  undefined1 auVar255 [16];
  float fVar263;
  float fVar264;
  float fVar265;
  undefined1 auVar256 [32];
  float fVar262;
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar266;
  undefined1 auVar259 [32];
  float fVar267;
  float fVar268;
  undefined1 auVar269 [16];
  float fVar276;
  float fVar278;
  float fVar282;
  float fVar284;
  float fVar286;
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  float fVar277;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar283;
  float fVar285;
  float fVar287;
  float fVar288;
  float fVar289;
  undefined1 auVar275 [32];
  float fVar296;
  float fVar297;
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  float fVar298;
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  float fVar299;
  float fVar307;
  float fVar308;
  float fVar309;
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  float fVar310;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  float fVar332;
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  float fVar340;
  float fVar346;
  float fVar347;
  float fVar348;
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar349 [16];
  float in_register_0000151c;
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  float fVar365;
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [64];
  float fVar366;
  float fVar370;
  float fVar371;
  float fVar372;
  float in_register_0000159c;
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  float fVar376;
  float in_register_000015dc;
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar377 [16];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  int local_7c4;
  uint local_7c0;
  undefined4 uStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [16];
  undefined1 auStack_790 [16];
  undefined1 local_780 [48];
  ulong local_750;
  Precalculations *local_748;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  RTCFilterFunctionNArguments local_6b0;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_650 [8];
  undefined8 uStack_648;
  undefined8 local_640;
  undefined4 local_638;
  float local_634;
  uint local_630;
  undefined4 local_62c;
  undefined4 local_628;
  uint local_624;
  uint local_620;
  ulong local_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  undefined8 uStack_578;
  undefined1 local_570 [8];
  undefined8 uStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined4 uStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  uint local_280;
  uint local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined1 local_240 [16];
  undefined1 local_220 [32];
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  
  local_748 = pre;
  PVar33 = prim[1];
  uVar148 = (ulong)(byte)PVar33;
  lVar151 = uVar148 * 0x25;
  fVar215 = *(float *)(prim + lVar151 + 0x12);
  auVar217 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar151 + 6));
  auVar255._0_4_ = fVar215 * (ray->dir).field_0.m128[0];
  auVar255._4_4_ = fVar215 * (ray->dir).field_0.m128[1];
  auVar255._8_4_ = fVar215 * (ray->dir).field_0.m128[2];
  auVar255._12_4_ = fVar215 * (ray->dir).field_0.m128[3];
  auVar377 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 4 + 6)));
  auVar173._0_4_ = fVar215 * auVar217._0_4_;
  auVar173._4_4_ = fVar215 * auVar217._4_4_;
  auVar173._8_4_ = fVar215 * auVar217._8_4_;
  auVar173._12_4_ = fVar215 * auVar217._12_4_;
  auVar217 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 4 + 10)));
  auVar160._16_16_ = auVar217;
  auVar160._0_16_ = auVar377;
  auVar160 = vcvtdq2ps_avx(auVar160);
  lVar153 = uVar148 * 5;
  auVar377 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar153 + 6)));
  auVar217 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar153 + 10)));
  auVar206._16_16_ = auVar217;
  auVar206._0_16_ = auVar377;
  auVar377 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 6 + 6)));
  auVar217 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 6 + 10)));
  auVar37 = vcvtdq2ps_avx(auVar206);
  auVar221._16_16_ = auVar217;
  auVar221._0_16_ = auVar377;
  auVar38 = vcvtdq2ps_avx(auVar221);
  auVar377 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 0xf + 6)));
  auVar217 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 0xf + 10)));
  auVar222._16_16_ = auVar217;
  auVar222._0_16_ = auVar377;
  auVar39 = vcvtdq2ps_avx(auVar222);
  lVar149 = (ulong)(byte)PVar33 * 0x10;
  auVar377 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar149 + 6)));
  auVar217 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar149 + 10)));
  auVar270._16_16_ = auVar217;
  auVar270._0_16_ = auVar377;
  auVar377 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar149 + uVar148 + 6)));
  auVar40 = vcvtdq2ps_avx(auVar270);
  auVar217 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar149 + uVar148 + 10)));
  auVar290._16_16_ = auVar217;
  auVar290._0_16_ = auVar377;
  auVar377 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 0x1a + 6)));
  auVar41 = vcvtdq2ps_avx(auVar290);
  auVar217 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 0x1a + 10)));
  auVar291._16_16_ = auVar217;
  auVar291._0_16_ = auVar377;
  auVar42 = vcvtdq2ps_avx(auVar291);
  auVar377 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 0x1b + 6)));
  auVar217 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 0x1b + 10)));
  auVar311._16_16_ = auVar217;
  auVar311._0_16_ = auVar377;
  auVar377 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 0x1c + 6)));
  auVar217 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar148 * 0x1c + 10)));
  auVar43 = vcvtdq2ps_avx(auVar311);
  auVar333._16_16_ = auVar217;
  auVar333._0_16_ = auVar377;
  auVar44 = vcvtdq2ps_avx(auVar333);
  auVar377 = vshufps_avx(auVar255,auVar255,0);
  auVar217 = vshufps_avx(auVar255,auVar255,0x55);
  auVar218 = vshufps_avx(auVar255,auVar255,0xaa);
  fVar215 = auVar218._0_4_;
  fVar187 = auVar218._4_4_;
  fVar231 = auVar218._8_4_;
  fVar190 = auVar218._12_4_;
  fVar212 = auVar217._0_4_;
  fVar296 = auVar217._4_4_;
  fVar232 = auVar217._8_4_;
  fVar297 = auVar217._12_4_;
  fVar233 = auVar377._0_4_;
  fVar234 = auVar377._4_4_;
  fVar236 = auVar377._8_4_;
  fVar239 = auVar377._12_4_;
  auVar350._0_4_ = fVar233 * auVar160._0_4_ + fVar212 * auVar37._0_4_ + fVar215 * auVar38._0_4_;
  auVar350._4_4_ = fVar234 * auVar160._4_4_ + fVar296 * auVar37._4_4_ + fVar187 * auVar38._4_4_;
  auVar350._8_4_ = fVar236 * auVar160._8_4_ + fVar232 * auVar37._8_4_ + fVar231 * auVar38._8_4_;
  auVar350._12_4_ = fVar239 * auVar160._12_4_ + fVar297 * auVar37._12_4_ + fVar190 * auVar38._12_4_;
  auVar350._16_4_ = fVar233 * auVar160._16_4_ + fVar212 * auVar37._16_4_ + fVar215 * auVar38._16_4_;
  auVar350._20_4_ = fVar234 * auVar160._20_4_ + fVar296 * auVar37._20_4_ + fVar187 * auVar38._20_4_;
  auVar350._24_4_ = fVar236 * auVar160._24_4_ + fVar232 * auVar37._24_4_ + fVar231 * auVar38._24_4_;
  auVar350._28_4_ = fVar297 + in_register_000015dc + in_register_0000151c;
  auVar341._0_4_ = fVar233 * auVar39._0_4_ + fVar212 * auVar40._0_4_ + auVar41._0_4_ * fVar215;
  auVar341._4_4_ = fVar234 * auVar39._4_4_ + fVar296 * auVar40._4_4_ + auVar41._4_4_ * fVar187;
  auVar341._8_4_ = fVar236 * auVar39._8_4_ + fVar232 * auVar40._8_4_ + auVar41._8_4_ * fVar231;
  auVar341._12_4_ = fVar239 * auVar39._12_4_ + fVar297 * auVar40._12_4_ + auVar41._12_4_ * fVar190;
  auVar341._16_4_ = fVar233 * auVar39._16_4_ + fVar212 * auVar40._16_4_ + auVar41._16_4_ * fVar215;
  auVar341._20_4_ = fVar234 * auVar39._20_4_ + fVar296 * auVar40._20_4_ + auVar41._20_4_ * fVar187;
  auVar341._24_4_ = fVar236 * auVar39._24_4_ + fVar232 * auVar40._24_4_ + auVar41._24_4_ * fVar231;
  auVar341._28_4_ = fVar297 + in_register_000015dc + in_register_0000159c;
  auVar256._0_4_ = fVar233 * auVar42._0_4_ + fVar212 * auVar43._0_4_ + auVar44._0_4_ * fVar215;
  auVar256._4_4_ = fVar234 * auVar42._4_4_ + fVar296 * auVar43._4_4_ + auVar44._4_4_ * fVar187;
  auVar256._8_4_ = fVar236 * auVar42._8_4_ + fVar232 * auVar43._8_4_ + auVar44._8_4_ * fVar231;
  auVar256._12_4_ = fVar239 * auVar42._12_4_ + fVar297 * auVar43._12_4_ + auVar44._12_4_ * fVar190;
  auVar256._16_4_ = fVar233 * auVar42._16_4_ + fVar212 * auVar43._16_4_ + auVar44._16_4_ * fVar215;
  auVar256._20_4_ = fVar234 * auVar42._20_4_ + fVar296 * auVar43._20_4_ + auVar44._20_4_ * fVar187;
  auVar256._24_4_ = fVar236 * auVar42._24_4_ + fVar232 * auVar43._24_4_ + auVar44._24_4_ * fVar231;
  auVar256._28_4_ = fVar239 + fVar297 + fVar190;
  auVar377 = vshufps_avx(auVar173,auVar173,0);
  auVar217 = vshufps_avx(auVar173,auVar173,0x55);
  auVar218 = vshufps_avx(auVar173,auVar173,0xaa);
  fVar215 = auVar218._0_4_;
  fVar187 = auVar218._4_4_;
  fVar231 = auVar218._8_4_;
  fVar190 = auVar218._12_4_;
  fVar234 = auVar217._0_4_;
  fVar236 = auVar217._4_4_;
  fVar239 = auVar217._8_4_;
  fVar247 = auVar217._12_4_;
  fVar212 = auVar37._28_4_ + auVar38._28_4_;
  fVar296 = auVar377._0_4_;
  fVar232 = auVar377._4_4_;
  fVar297 = auVar377._8_4_;
  fVar233 = auVar377._12_4_;
  auVar178._0_4_ = fVar296 * auVar160._0_4_ + fVar234 * auVar37._0_4_ + fVar215 * auVar38._0_4_;
  auVar178._4_4_ = fVar232 * auVar160._4_4_ + fVar236 * auVar37._4_4_ + fVar187 * auVar38._4_4_;
  auVar178._8_4_ = fVar297 * auVar160._8_4_ + fVar239 * auVar37._8_4_ + fVar231 * auVar38._8_4_;
  auVar178._12_4_ = fVar233 * auVar160._12_4_ + fVar247 * auVar37._12_4_ + fVar190 * auVar38._12_4_;
  auVar178._16_4_ = fVar296 * auVar160._16_4_ + fVar234 * auVar37._16_4_ + fVar215 * auVar38._16_4_;
  auVar178._20_4_ = fVar232 * auVar160._20_4_ + fVar236 * auVar37._20_4_ + fVar187 * auVar38._20_4_;
  auVar178._24_4_ = fVar297 * auVar160._24_4_ + fVar239 * auVar37._24_4_ + fVar231 * auVar38._24_4_;
  auVar178._28_4_ = auVar160._28_4_ + fVar212;
  auVar161._0_4_ = fVar296 * auVar39._0_4_ + auVar41._0_4_ * fVar215 + fVar234 * auVar40._0_4_;
  auVar161._4_4_ = fVar232 * auVar39._4_4_ + auVar41._4_4_ * fVar187 + fVar236 * auVar40._4_4_;
  auVar161._8_4_ = fVar297 * auVar39._8_4_ + auVar41._8_4_ * fVar231 + fVar239 * auVar40._8_4_;
  auVar161._12_4_ = fVar233 * auVar39._12_4_ + auVar41._12_4_ * fVar190 + fVar247 * auVar40._12_4_;
  auVar161._16_4_ = fVar296 * auVar39._16_4_ + auVar41._16_4_ * fVar215 + fVar234 * auVar40._16_4_;
  auVar161._20_4_ = fVar232 * auVar39._20_4_ + auVar41._20_4_ * fVar187 + fVar236 * auVar40._20_4_;
  auVar161._24_4_ = fVar297 * auVar39._24_4_ + auVar41._24_4_ * fVar231 + fVar239 * auVar40._24_4_;
  auVar161._28_4_ = auVar160._28_4_ + auVar41._28_4_ + auVar38._28_4_;
  auVar300._8_4_ = 0x7fffffff;
  auVar300._0_8_ = 0x7fffffff7fffffff;
  auVar300._12_4_ = 0x7fffffff;
  auVar300._16_4_ = 0x7fffffff;
  auVar300._20_4_ = 0x7fffffff;
  auVar300._24_4_ = 0x7fffffff;
  auVar300._28_4_ = 0x7fffffff;
  auVar223._8_4_ = 0x219392ef;
  auVar223._0_8_ = 0x219392ef219392ef;
  auVar223._12_4_ = 0x219392ef;
  auVar223._16_4_ = 0x219392ef;
  auVar223._20_4_ = 0x219392ef;
  auVar223._24_4_ = 0x219392ef;
  auVar223._28_4_ = 0x219392ef;
  auVar160 = vandps_avx(auVar350,auVar300);
  auVar160 = vcmpps_avx(auVar160,auVar223,1);
  auVar37 = vblendvps_avx(auVar350,auVar223,auVar160);
  auVar160 = vandps_avx(auVar341,auVar300);
  auVar160 = vcmpps_avx(auVar160,auVar223,1);
  auVar38 = vblendvps_avx(auVar341,auVar223,auVar160);
  auVar160 = vandps_avx(auVar300,auVar256);
  auVar160 = vcmpps_avx(auVar160,auVar223,1);
  auVar160 = vblendvps_avx(auVar256,auVar223,auVar160);
  auVar207._0_4_ = fVar296 * auVar42._0_4_ + fVar234 * auVar43._0_4_ + auVar44._0_4_ * fVar215;
  auVar207._4_4_ = fVar232 * auVar42._4_4_ + fVar236 * auVar43._4_4_ + auVar44._4_4_ * fVar187;
  auVar207._8_4_ = fVar297 * auVar42._8_4_ + fVar239 * auVar43._8_4_ + auVar44._8_4_ * fVar231;
  auVar207._12_4_ = fVar233 * auVar42._12_4_ + fVar247 * auVar43._12_4_ + auVar44._12_4_ * fVar190;
  auVar207._16_4_ = fVar296 * auVar42._16_4_ + fVar234 * auVar43._16_4_ + auVar44._16_4_ * fVar215;
  auVar207._20_4_ = fVar232 * auVar42._20_4_ + fVar236 * auVar43._20_4_ + auVar44._20_4_ * fVar187;
  auVar207._24_4_ = fVar297 * auVar42._24_4_ + fVar239 * auVar43._24_4_ + auVar44._24_4_ * fVar231;
  auVar207._28_4_ = fVar212 + auVar40._28_4_ + fVar190;
  auVar39 = vrcpps_avx(auVar37);
  fVar215 = auVar39._0_4_;
  fVar231 = auVar39._4_4_;
  auVar40._4_4_ = auVar37._4_4_ * fVar231;
  auVar40._0_4_ = auVar37._0_4_ * fVar215;
  fVar212 = auVar39._8_4_;
  auVar40._8_4_ = auVar37._8_4_ * fVar212;
  fVar232 = auVar39._12_4_;
  auVar40._12_4_ = auVar37._12_4_ * fVar232;
  fVar233 = auVar39._16_4_;
  auVar40._16_4_ = auVar37._16_4_ * fVar233;
  fVar234 = auVar39._20_4_;
  auVar40._20_4_ = auVar37._20_4_ * fVar234;
  fVar236 = auVar39._24_4_;
  auVar40._24_4_ = auVar37._24_4_ * fVar236;
  auVar40._28_4_ = auVar37._28_4_;
  auVar301._8_4_ = 0x3f800000;
  auVar301._0_8_ = 0x3f8000003f800000;
  auVar301._12_4_ = 0x3f800000;
  auVar301._16_4_ = 0x3f800000;
  auVar301._20_4_ = 0x3f800000;
  auVar301._24_4_ = 0x3f800000;
  auVar301._28_4_ = 0x3f800000;
  auVar41 = vsubps_avx(auVar301,auVar40);
  auVar40 = vrcpps_avx(auVar38);
  fVar215 = fVar215 + fVar215 * auVar41._0_4_;
  fVar231 = fVar231 + fVar231 * auVar41._4_4_;
  fVar212 = fVar212 + fVar212 * auVar41._8_4_;
  fVar232 = fVar232 + fVar232 * auVar41._12_4_;
  fVar233 = fVar233 + fVar233 * auVar41._16_4_;
  fVar234 = fVar234 + fVar234 * auVar41._20_4_;
  fVar236 = fVar236 + fVar236 * auVar41._24_4_;
  fVar239 = auVar40._0_4_;
  fVar247 = auVar40._4_4_;
  auVar37._4_4_ = fVar247 * auVar38._4_4_;
  auVar37._0_4_ = fVar239 * auVar38._0_4_;
  fVar248 = auVar40._8_4_;
  auVar37._8_4_ = fVar248 * auVar38._8_4_;
  fVar249 = auVar40._12_4_;
  auVar37._12_4_ = fVar249 * auVar38._12_4_;
  fVar250 = auVar40._16_4_;
  auVar37._16_4_ = fVar250 * auVar38._16_4_;
  fVar251 = auVar40._20_4_;
  auVar37._20_4_ = fVar251 * auVar38._20_4_;
  fVar252 = auVar40._24_4_;
  auVar37._24_4_ = fVar252 * auVar38._24_4_;
  auVar37._28_4_ = auVar41._28_4_;
  auVar38 = vsubps_avx(auVar301,auVar37);
  fVar239 = fVar239 + fVar239 * auVar38._0_4_;
  fVar247 = fVar247 + fVar247 * auVar38._4_4_;
  fVar248 = fVar248 + fVar248 * auVar38._8_4_;
  fVar249 = fVar249 + fVar249 * auVar38._12_4_;
  fVar250 = fVar250 + fVar250 * auVar38._16_4_;
  fVar251 = fVar251 + fVar251 * auVar38._20_4_;
  fVar252 = fVar252 + fVar252 * auVar38._24_4_;
  auVar37 = vrcpps_avx(auVar160);
  fVar254 = auVar37._0_4_;
  fVar260 = auVar37._4_4_;
  auVar42._4_4_ = fVar260 * auVar160._4_4_;
  auVar42._0_4_ = fVar254 * auVar160._0_4_;
  fVar261 = auVar37._8_4_;
  auVar42._8_4_ = fVar261 * auVar160._8_4_;
  fVar262 = auVar37._12_4_;
  auVar42._12_4_ = fVar262 * auVar160._12_4_;
  fVar263 = auVar37._16_4_;
  auVar42._16_4_ = fVar263 * auVar160._16_4_;
  fVar264 = auVar37._20_4_;
  auVar42._20_4_ = fVar264 * auVar160._20_4_;
  fVar265 = auVar37._24_4_;
  auVar42._24_4_ = fVar265 * auVar160._24_4_;
  auVar42._28_4_ = auVar160._28_4_;
  auVar160 = vsubps_avx(auVar301,auVar42);
  fVar254 = fVar254 + fVar254 * auVar160._0_4_;
  fVar260 = fVar260 + fVar260 * auVar160._4_4_;
  fVar261 = fVar261 + fVar261 * auVar160._8_4_;
  fVar262 = fVar262 + fVar262 * auVar160._12_4_;
  fVar263 = fVar263 + fVar263 * auVar160._16_4_;
  fVar264 = fVar264 + fVar264 * auVar160._20_4_;
  fVar265 = fVar265 + fVar265 * auVar160._24_4_;
  auVar377 = ZEXT416((uint)(((ray->dir).field_0.m128[3] - *(float *)(prim + lVar151 + 0x16)) *
                           *(float *)(prim + lVar151 + 0x1a)));
  auVar45 = vshufps_avx(auVar377,auVar377,0);
  auVar377._8_8_ = 0;
  auVar377._0_8_ = *(ulong *)(prim + uVar148 * 7 + 6);
  auVar377 = vpmovsxwd_avx(auVar377);
  auVar217._8_8_ = 0;
  auVar217._0_8_ = *(ulong *)(prim + uVar148 * 7 + 0xe);
  auVar217 = vpmovsxwd_avx(auVar217);
  auVar292._16_16_ = auVar217;
  auVar292._0_16_ = auVar377;
  auVar160 = vcvtdq2ps_avx(auVar292);
  auVar218._8_8_ = 0;
  auVar218._0_8_ = *(ulong *)(prim + uVar148 * 0xb + 6);
  auVar377 = vpmovsxwd_avx(auVar218);
  auVar219._8_8_ = 0;
  auVar219._0_8_ = *(ulong *)(prim + uVar148 * 0xb + 0xe);
  auVar217 = vpmovsxwd_avx(auVar219);
  auVar302._16_16_ = auVar217;
  auVar302._0_16_ = auVar377;
  auVar37 = vcvtdq2ps_avx(auVar302);
  auVar37 = vsubps_avx(auVar37,auVar160);
  fVar187 = auVar45._0_4_;
  fVar190 = auVar45._4_4_;
  fVar296 = auVar45._8_4_;
  fVar297 = auVar45._12_4_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar148 * 9 + 6);
  auVar377 = vpmovsxwd_avx(auVar45);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar148 * 9 + 0xe);
  auVar217 = vpmovsxwd_avx(auVar14);
  auVar293._0_4_ = auVar37._0_4_ * fVar187 + auVar160._0_4_;
  auVar293._4_4_ = auVar37._4_4_ * fVar190 + auVar160._4_4_;
  auVar293._8_4_ = auVar37._8_4_ * fVar296 + auVar160._8_4_;
  auVar293._12_4_ = auVar37._12_4_ * fVar297 + auVar160._12_4_;
  auVar293._16_4_ = auVar37._16_4_ * fVar187 + auVar160._16_4_;
  auVar293._20_4_ = auVar37._20_4_ * fVar190 + auVar160._20_4_;
  auVar293._24_4_ = auVar37._24_4_ * fVar296 + auVar160._24_4_;
  auVar293._28_4_ = auVar37._28_4_ + auVar160._28_4_;
  auVar303._16_16_ = auVar217;
  auVar303._0_16_ = auVar377;
  auVar160 = vcvtdq2ps_avx(auVar303);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar148 * 0xd + 6);
  auVar377 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar148 * 0xd + 0xe);
  auVar217 = vpmovsxwd_avx(auVar16);
  auVar312._16_16_ = auVar217;
  auVar312._0_16_ = auVar377;
  auVar37 = vcvtdq2ps_avx(auVar312);
  auVar37 = vsubps_avx(auVar37,auVar160);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar148 * 0x12 + 6);
  auVar377 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar148 * 0x12 + 0xe);
  auVar217 = vpmovsxwd_avx(auVar18);
  auVar304._0_4_ = auVar160._0_4_ + auVar37._0_4_ * fVar187;
  auVar304._4_4_ = auVar160._4_4_ + auVar37._4_4_ * fVar190;
  auVar304._8_4_ = auVar160._8_4_ + auVar37._8_4_ * fVar296;
  auVar304._12_4_ = auVar160._12_4_ + auVar37._12_4_ * fVar297;
  auVar304._16_4_ = auVar160._16_4_ + auVar37._16_4_ * fVar187;
  auVar304._20_4_ = auVar160._20_4_ + auVar37._20_4_ * fVar190;
  auVar304._24_4_ = auVar160._24_4_ + auVar37._24_4_ * fVar296;
  auVar304._28_4_ = auVar160._28_4_ + auVar37._28_4_;
  auVar313._16_16_ = auVar217;
  auVar313._0_16_ = auVar377;
  auVar160 = vcvtdq2ps_avx(auVar313);
  uVar145 = (ulong)(uint)((int)lVar153 << 2);
  lVar151 = uVar148 * 2 + uVar145;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + lVar151 + 6);
  auVar377 = vpmovsxwd_avx(auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + lVar151 + 0xe);
  auVar217 = vpmovsxwd_avx(auVar20);
  auVar334._16_16_ = auVar217;
  auVar334._0_16_ = auVar377;
  auVar37 = vcvtdq2ps_avx(auVar334);
  auVar37 = vsubps_avx(auVar37,auVar160);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar145 + 6);
  auVar377 = vpmovsxwd_avx(auVar21);
  auVar314._0_4_ = auVar160._0_4_ + auVar37._0_4_ * fVar187;
  auVar314._4_4_ = auVar160._4_4_ + auVar37._4_4_ * fVar190;
  auVar314._8_4_ = auVar160._8_4_ + auVar37._8_4_ * fVar296;
  auVar314._12_4_ = auVar160._12_4_ + auVar37._12_4_ * fVar297;
  auVar314._16_4_ = auVar160._16_4_ + auVar37._16_4_ * fVar187;
  auVar314._20_4_ = auVar160._20_4_ + auVar37._20_4_ * fVar190;
  auVar314._24_4_ = auVar160._24_4_ + auVar37._24_4_ * fVar296;
  auVar314._28_4_ = auVar160._28_4_ + auVar37._28_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar145 + 0xe);
  auVar217 = vpmovsxwd_avx(auVar22);
  auVar335._16_16_ = auVar217;
  auVar335._0_16_ = auVar377;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar148 * 0x18 + 6);
  auVar377 = vpmovsxwd_avx(auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar148 * 0x18 + 0xe);
  auVar217 = vpmovsxwd_avx(auVar24);
  auVar160 = vcvtdq2ps_avx(auVar335);
  auVar342._16_16_ = auVar217;
  auVar342._0_16_ = auVar377;
  auVar37 = vcvtdq2ps_avx(auVar342);
  auVar37 = vsubps_avx(auVar37,auVar160);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar148 * 0x1d + 6);
  auVar377 = vpmovsxwd_avx(auVar25);
  auVar336._0_4_ = auVar160._0_4_ + auVar37._0_4_ * fVar187;
  auVar336._4_4_ = auVar160._4_4_ + auVar37._4_4_ * fVar190;
  auVar336._8_4_ = auVar160._8_4_ + auVar37._8_4_ * fVar296;
  auVar336._12_4_ = auVar160._12_4_ + auVar37._12_4_ * fVar297;
  auVar336._16_4_ = auVar160._16_4_ + auVar37._16_4_ * fVar187;
  auVar336._20_4_ = auVar160._20_4_ + auVar37._20_4_ * fVar190;
  auVar336._24_4_ = auVar160._24_4_ + auVar37._24_4_ * fVar296;
  auVar336._28_4_ = auVar160._28_4_ + auVar37._28_4_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar148 * 0x1d + 0xe);
  auVar217 = vpmovsxwd_avx(auVar26);
  auVar343._16_16_ = auVar217;
  auVar343._0_16_ = auVar377;
  auVar160 = vcvtdq2ps_avx(auVar343);
  lVar151 = uVar148 + (ulong)(byte)PVar33 * 0x20;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + lVar151 + 6);
  auVar377 = vpmovsxwd_avx(auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + lVar151 + 0xe);
  auVar217 = vpmovsxwd_avx(auVar28);
  auVar351._16_16_ = auVar217;
  auVar351._0_16_ = auVar377;
  auVar37 = vcvtdq2ps_avx(auVar351);
  auVar37 = vsubps_avx(auVar37,auVar160);
  auVar344._0_4_ = auVar160._0_4_ + auVar37._0_4_ * fVar187;
  auVar344._4_4_ = auVar160._4_4_ + auVar37._4_4_ * fVar190;
  auVar344._8_4_ = auVar160._8_4_ + auVar37._8_4_ * fVar296;
  auVar344._12_4_ = auVar160._12_4_ + auVar37._12_4_ * fVar297;
  auVar344._16_4_ = auVar160._16_4_ + auVar37._16_4_ * fVar187;
  auVar344._20_4_ = auVar160._20_4_ + auVar37._20_4_ * fVar190;
  auVar344._24_4_ = auVar160._24_4_ + auVar37._24_4_ * fVar296;
  auVar344._28_4_ = auVar160._28_4_ + auVar37._28_4_;
  lVar151 = (ulong)(byte)PVar33 * 0x20 - uVar148;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + lVar151 + 6);
  auVar377 = vpmovsxwd_avx(auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + lVar151 + 0xe);
  auVar217 = vpmovsxwd_avx(auVar30);
  auVar352._16_16_ = auVar217;
  auVar352._0_16_ = auVar377;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar148 * 0x23 + 6);
  auVar377 = vpmovsxwd_avx(auVar31);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar148 * 0x23 + 0xe);
  auVar217 = vpmovsxwd_avx(auVar32);
  auVar359._16_16_ = auVar217;
  auVar359._0_16_ = auVar377;
  auVar160 = vcvtdq2ps_avx(auVar352);
  auVar37 = vcvtdq2ps_avx(auVar359);
  auVar37 = vsubps_avx(auVar37,auVar160);
  auVar353._0_4_ = auVar160._0_4_ + auVar37._0_4_ * fVar187;
  auVar353._4_4_ = auVar160._4_4_ + auVar37._4_4_ * fVar190;
  auVar353._8_4_ = auVar160._8_4_ + auVar37._8_4_ * fVar296;
  auVar353._12_4_ = auVar160._12_4_ + auVar37._12_4_ * fVar297;
  auVar353._16_4_ = auVar160._16_4_ + auVar37._16_4_ * fVar187;
  auVar353._20_4_ = auVar160._20_4_ + auVar37._20_4_ * fVar190;
  auVar353._24_4_ = auVar160._24_4_ + auVar37._24_4_ * fVar296;
  auVar353._28_4_ = auVar160._28_4_ + fVar297;
  auVar160 = vsubps_avx(auVar293,auVar178);
  auVar269._0_4_ = fVar215 * auVar160._0_4_;
  auVar269._4_4_ = fVar231 * auVar160._4_4_;
  auVar269._8_4_ = fVar212 * auVar160._8_4_;
  auVar269._12_4_ = fVar232 * auVar160._12_4_;
  auVar43._16_4_ = fVar233 * auVar160._16_4_;
  auVar43._0_16_ = auVar269;
  auVar43._20_4_ = fVar234 * auVar160._20_4_;
  auVar43._24_4_ = fVar236 * auVar160._24_4_;
  auVar43._28_4_ = auVar160._28_4_;
  auVar160 = vsubps_avx(auVar304,auVar178);
  auVar216._0_4_ = fVar215 * auVar160._0_4_;
  auVar216._4_4_ = fVar231 * auVar160._4_4_;
  auVar216._8_4_ = fVar212 * auVar160._8_4_;
  auVar216._12_4_ = fVar232 * auVar160._12_4_;
  auVar44._16_4_ = fVar233 * auVar160._16_4_;
  auVar44._0_16_ = auVar216;
  auVar44._20_4_ = fVar234 * auVar160._20_4_;
  auVar44._24_4_ = fVar236 * auVar160._24_4_;
  auVar44._28_4_ = auVar39._28_4_ + auVar41._28_4_;
  auVar160 = vsubps_avx(auVar314,auVar161);
  auVar174._0_4_ = fVar239 * auVar160._0_4_;
  auVar174._4_4_ = fVar247 * auVar160._4_4_;
  auVar174._8_4_ = fVar248 * auVar160._8_4_;
  auVar174._12_4_ = fVar249 * auVar160._12_4_;
  auVar39._16_4_ = fVar250 * auVar160._16_4_;
  auVar39._0_16_ = auVar174;
  auVar39._20_4_ = fVar251 * auVar160._20_4_;
  auVar39._24_4_ = fVar252 * auVar160._24_4_;
  auVar39._28_4_ = auVar160._28_4_;
  auVar160 = vsubps_avx(auVar336,auVar161);
  auVar240._0_4_ = fVar239 * auVar160._0_4_;
  auVar240._4_4_ = fVar247 * auVar160._4_4_;
  auVar240._8_4_ = fVar248 * auVar160._8_4_;
  auVar240._12_4_ = fVar249 * auVar160._12_4_;
  auVar41._16_4_ = fVar250 * auVar160._16_4_;
  auVar41._0_16_ = auVar240;
  auVar41._20_4_ = fVar251 * auVar160._20_4_;
  auVar41._24_4_ = fVar252 * auVar160._24_4_;
  auVar41._28_4_ = auVar40._28_4_ + auVar38._28_4_;
  auVar160 = vsubps_avx(auVar344,auVar207);
  auVar158._0_4_ = fVar254 * auVar160._0_4_;
  auVar158._4_4_ = fVar260 * auVar160._4_4_;
  auVar158._8_4_ = fVar261 * auVar160._8_4_;
  auVar158._12_4_ = fVar262 * auVar160._12_4_;
  auVar38._16_4_ = fVar263 * auVar160._16_4_;
  auVar38._0_16_ = auVar158;
  auVar38._20_4_ = fVar264 * auVar160._20_4_;
  auVar38._24_4_ = fVar265 * auVar160._24_4_;
  auVar38._28_4_ = auVar160._28_4_;
  auVar160 = vsubps_avx(auVar353,auVar207);
  auVar201._0_4_ = fVar254 * auVar160._0_4_;
  auVar201._4_4_ = fVar260 * auVar160._4_4_;
  auVar201._8_4_ = fVar261 * auVar160._8_4_;
  auVar201._12_4_ = fVar262 * auVar160._12_4_;
  auVar46._16_4_ = fVar263 * auVar160._16_4_;
  auVar46._0_16_ = auVar201;
  auVar46._20_4_ = fVar264 * auVar160._20_4_;
  auVar46._24_4_ = fVar265 * auVar160._24_4_;
  auVar46._28_4_ = auVar160._28_4_;
  auVar377 = vpminsd_avx(auVar43._16_16_,auVar44._16_16_);
  auVar217 = vpminsd_avx(auVar269,auVar216);
  auVar305._16_16_ = auVar377;
  auVar305._0_16_ = auVar217;
  auVar377 = vpminsd_avx(auVar39._16_16_,auVar41._16_16_);
  auVar217 = vpminsd_avx(auVar174,auVar240);
  auVar345._16_16_ = auVar377;
  auVar345._0_16_ = auVar217;
  auVar160 = vmaxps_avx(auVar305,auVar345);
  auVar377 = vpminsd_avx(auVar38._16_16_,auVar46._16_16_);
  auVar217 = vpminsd_avx(auVar158,auVar201);
  auVar360._16_16_ = auVar377;
  auVar360._0_16_ = auVar217;
  uVar12 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar367._4_4_ = uVar12;
  auVar367._0_4_ = uVar12;
  auVar367._8_4_ = uVar12;
  auVar367._12_4_ = uVar12;
  auVar367._16_4_ = uVar12;
  auVar367._20_4_ = uVar12;
  auVar367._24_4_ = uVar12;
  auVar367._28_4_ = uVar12;
  auVar37 = vmaxps_avx(auVar360,auVar367);
  auVar160 = vmaxps_avx(auVar160,auVar37);
  local_80._4_4_ = auVar160._4_4_ * 0.99999964;
  local_80._0_4_ = auVar160._0_4_ * 0.99999964;
  local_80._8_4_ = auVar160._8_4_ * 0.99999964;
  local_80._12_4_ = auVar160._12_4_ * 0.99999964;
  local_80._16_4_ = auVar160._16_4_ * 0.99999964;
  local_80._20_4_ = auVar160._20_4_ * 0.99999964;
  local_80._24_4_ = auVar160._24_4_ * 0.99999964;
  local_80._28_4_ = auVar160._28_4_;
  auVar377 = vpmaxsd_avx(auVar43._16_16_,auVar44._16_16_);
  auVar217 = vpmaxsd_avx(auVar269,auVar216);
  auVar224._16_16_ = auVar377;
  auVar224._0_16_ = auVar217;
  auVar377 = vpmaxsd_avx(auVar39._16_16_,auVar41._16_16_);
  auVar217 = vpmaxsd_avx(auVar174,auVar240);
  auVar179._16_16_ = auVar377;
  auVar179._0_16_ = auVar217;
  auVar160 = vminps_avx(auVar224,auVar179);
  auVar377 = vpmaxsd_avx(auVar38._16_16_,auVar46._16_16_);
  auVar217 = vpmaxsd_avx(auVar158,auVar201);
  fVar215 = ray->tfar;
  auVar208._4_4_ = fVar215;
  auVar208._0_4_ = fVar215;
  auVar208._8_4_ = fVar215;
  auVar208._12_4_ = fVar215;
  auVar208._16_4_ = fVar215;
  auVar208._20_4_ = fVar215;
  auVar208._24_4_ = fVar215;
  auVar208._28_4_ = fVar215;
  auVar162._16_16_ = auVar377;
  auVar162._0_16_ = auVar217;
  auVar37 = vminps_avx(auVar162,auVar208);
  auVar160 = vminps_avx(auVar160,auVar37);
  auVar36._4_4_ = auVar160._4_4_ * 1.0000004;
  auVar36._0_4_ = auVar160._0_4_ * 1.0000004;
  auVar36._8_4_ = auVar160._8_4_ * 1.0000004;
  auVar36._12_4_ = auVar160._12_4_ * 1.0000004;
  auVar36._16_4_ = auVar160._16_4_ * 1.0000004;
  auVar36._20_4_ = auVar160._20_4_ * 1.0000004;
  auVar36._24_4_ = auVar160._24_4_ * 1.0000004;
  auVar36._28_4_ = auVar160._28_4_;
  auVar160 = vcmpps_avx(local_80,auVar36,2);
  auVar377 = vpshufd_avx(ZEXT116((byte)PVar33),0);
  auVar180._16_16_ = auVar377;
  auVar180._0_16_ = auVar377;
  auVar37 = vcvtdq2ps_avx(auVar180);
  auVar37 = vcmpps_avx(_DAT_01faff40,auVar37,1);
  auVar160 = vandps_avx(auVar160,auVar37);
  uVar143 = vmovmskps_avx(auVar160);
  if (uVar143 != 0) {
    local_4c0 = mm_lookupmask_ps._16_8_;
    uStack_4b8 = mm_lookupmask_ps._24_8_;
    uStack_4b0 = mm_lookupmask_ps._16_8_;
    uStack_4a8 = mm_lookupmask_ps._24_8_;
    uVar143 = uVar143 & 0xff;
    do {
      lVar151 = 0;
      if (uVar143 != 0) {
        for (; (uVar143 >> lVar151 & 1) == 0; lVar151 = lVar151 + 1) {
        }
      }
      local_750 = (ulong)*(uint *)(prim + 2);
      pGVar152 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
      local_608 = (ulong)*(uint *)(prim + lVar151 * 4 + 6);
      uVar148 = (ulong)*(uint *)(*(long *)&pGVar152->field_0x58 +
                                (ulong)*(uint *)(prim + lVar151 * 4 + 6) *
                                pGVar152[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar215 = (pGVar152->time_range).lower;
      fVar215 = pGVar152->fnumTimeSegments *
                (((ray->dir).field_0.m128[3] - fVar215) / ((pGVar152->time_range).upper - fVar215));
      auVar377 = vroundss_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar215),9);
      auVar377 = vminss_avx(auVar377,ZEXT416((uint)(pGVar152->fnumTimeSegments + -1.0)));
      auVar377 = vmaxss_avx(ZEXT816(0) << 0x20,auVar377);
      fVar215 = fVar215 - auVar377._0_4_;
      _Var34 = pGVar152[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar150 = (long)(int)auVar377._0_4_ * 0x38;
      lVar151 = *(long *)(_Var34 + 0x10 + lVar150);
      lVar153 = *(long *)(_Var34 + 0x38 + lVar150);
      lVar149 = *(long *)(_Var34 + 0x48 + lVar150);
      auVar377 = vshufps_avx(ZEXT416((uint)fVar215),ZEXT416((uint)fVar215),0);
      pfVar1 = (float *)(lVar153 + uVar148 * lVar149);
      fVar187 = auVar377._0_4_;
      fVar231 = auVar377._4_4_;
      fVar190 = auVar377._8_4_;
      fVar212 = auVar377._12_4_;
      pfVar2 = (float *)(lVar153 + (uVar148 + 1) * lVar149);
      pfVar3 = (float *)(lVar153 + (uVar148 + 2) * lVar149);
      pfVar4 = (float *)(lVar153 + lVar149 * (uVar148 + 3));
      lVar153 = *(long *)(_Var34 + lVar150);
      auVar377 = vshufps_avx(ZEXT416((uint)(1.0 - fVar215)),ZEXT416((uint)(1.0 - fVar215)),0);
      pfVar5 = (float *)(lVar153 + lVar151 * uVar148);
      fVar215 = auVar377._0_4_;
      fVar296 = auVar377._4_4_;
      fVar232 = auVar377._8_4_;
      fVar297 = auVar377._12_4_;
      pfVar6 = (float *)(lVar153 + lVar151 * (uVar148 + 1));
      pfVar7 = (float *)(lVar153 + lVar151 * (uVar148 + 2));
      pfVar8 = (float *)(lVar153 + lVar151 * (uVar148 + 3));
      uVar147 = (uint)pGVar152[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar151 = (long)(int)uVar147 * 0x44;
      local_650 = (undefined1  [8])
                  CONCAT44(fVar231 * pfVar1[1] + fVar296 * pfVar5[1],
                           fVar187 * *pfVar1 + fVar215 * *pfVar5);
      uStack_648._0_4_ = fVar190 * pfVar1[2] + fVar232 * pfVar5[2];
      uStack_648._4_4_ = fVar212 * pfVar1[3] + fVar297 * pfVar5[3];
      local_570 = (undefined1  [8])
                  CONCAT44(fVar296 * pfVar6[1] + fVar231 * pfVar2[1],
                           fVar215 * *pfVar6 + fVar187 * *pfVar2);
      uStack_568._0_4_ = fVar232 * pfVar6[2] + fVar190 * pfVar2[2];
      uStack_568._4_4_ = fVar297 * pfVar6[3] + fVar212 * pfVar2[3];
      local_580 = (undefined1  [8])
                  CONCAT44(fVar296 * pfVar7[1] + fVar231 * pfVar3[1],
                           fVar215 * *pfVar7 + fVar187 * *pfVar3);
      uStack_578._0_4_ = fVar232 * pfVar7[2] + fVar190 * pfVar3[2];
      uStack_578._4_4_ = fVar297 * pfVar7[3] + fVar212 * pfVar3[3];
      local_590._0_4_ = fVar215 * *pfVar8 + fVar187 * *pfVar4;
      local_590._4_4_ = fVar296 * pfVar8[1] + fVar231 * pfVar4[1];
      fStack_588 = fVar232 * pfVar8[2] + fVar190 * pfVar4[2];
      fStack_584 = fVar297 * pfVar8[3] + fVar212 * pfVar4[3];
      aVar13 = (ray->org).field_0.field_1;
      auVar218 = vsubps_avx(_local_650,(undefined1  [16])aVar13);
      auVar15 = _local_650;
      auVar377 = vshufps_avx(auVar218,auVar218,0);
      auVar217 = vshufps_avx(auVar218,auVar218,0x55);
      auVar218 = vshufps_avx(auVar218,auVar218,0xaa);
      fVar215 = (local_748->ray_space).vx.field_0.m128[0];
      fVar187 = (local_748->ray_space).vx.field_0.m128[1];
      fVar231 = (local_748->ray_space).vx.field_0.m128[2];
      fVar190 = (local_748->ray_space).vx.field_0.m128[3];
      fVar212 = (local_748->ray_space).vy.field_0.m128[0];
      fVar296 = (local_748->ray_space).vy.field_0.m128[1];
      fVar232 = (local_748->ray_space).vy.field_0.m128[2];
      fVar297 = (local_748->ray_space).vy.field_0.m128[3];
      fVar233 = (local_748->ray_space).vz.field_0.m128[0];
      fVar234 = (local_748->ray_space).vz.field_0.m128[1];
      fVar236 = (local_748->ray_space).vz.field_0.m128[2];
      fVar239 = (local_748->ray_space).vz.field_0.m128[3];
      auVar202._0_4_ =
           auVar377._0_4_ * fVar215 + auVar218._0_4_ * fVar233 + auVar217._0_4_ * fVar212;
      auVar202._4_4_ =
           auVar377._4_4_ * fVar187 + auVar218._4_4_ * fVar234 + auVar217._4_4_ * fVar296;
      auVar202._8_4_ =
           auVar377._8_4_ * fVar231 + auVar218._8_4_ * fVar236 + auVar217._8_4_ * fVar232;
      auVar202._12_4_ =
           auVar377._12_4_ * fVar190 + auVar218._12_4_ * fVar239 + auVar217._12_4_ * fVar297;
      auVar377 = vblendps_avx(auVar202,_local_650,8);
      auVar219 = vsubps_avx(_local_570,(undefined1  [16])aVar13);
      auVar217 = vshufps_avx(auVar219,auVar219,0);
      auVar218 = vshufps_avx(auVar219,auVar219,0x55);
      auVar219 = vshufps_avx(auVar219,auVar219,0xaa);
      auVar349._0_4_ =
           auVar217._0_4_ * fVar215 + auVar219._0_4_ * fVar233 + auVar218._0_4_ * fVar212;
      auVar349._4_4_ =
           auVar217._4_4_ * fVar187 + auVar219._4_4_ * fVar234 + auVar218._4_4_ * fVar296;
      auVar349._8_4_ =
           auVar217._8_4_ * fVar231 + auVar219._8_4_ * fVar236 + auVar218._8_4_ * fVar232;
      auVar349._12_4_ =
           auVar217._12_4_ * fVar190 + auVar219._12_4_ * fVar239 + auVar218._12_4_ * fVar297;
      auVar217 = vblendps_avx(auVar349,_local_570,8);
      auVar45 = vsubps_avx(_local_580,(undefined1  [16])aVar13);
      auVar218 = vshufps_avx(auVar45,auVar45,0);
      auVar219 = vshufps_avx(auVar45,auVar45,0x55);
      auVar45 = vshufps_avx(auVar45,auVar45,0xaa);
      auVar241._0_4_ = auVar218._0_4_ * fVar215 + auVar219._0_4_ * fVar212 + auVar45._0_4_ * fVar233
      ;
      auVar241._4_4_ = auVar218._4_4_ * fVar187 + auVar219._4_4_ * fVar296 + auVar45._4_4_ * fVar234
      ;
      auVar241._8_4_ = auVar218._8_4_ * fVar231 + auVar219._8_4_ * fVar232 + auVar45._8_4_ * fVar236
      ;
      auVar241._12_4_ =
           auVar218._12_4_ * fVar190 + auVar219._12_4_ * fVar297 + auVar45._12_4_ * fVar239;
      auVar218 = vblendps_avx(auVar241,_local_580,8);
      local_4a0 = aVar13.x;
      fStack_49c = aVar13.y;
      fStack_498 = aVar13.z;
      aStack_494 = aVar13.field_3;
      auVar14 = vsubps_avx(_local_590,(undefined1  [16])aVar13);
      auVar219 = vshufps_avx(auVar14,auVar14,0xaa);
      auVar45 = vshufps_avx(auVar14,auVar14,0);
      auVar14 = vshufps_avx(auVar14,auVar14,0x55);
      auVar175._0_4_ = auVar45._0_4_ * fVar215 + auVar219._0_4_ * fVar233 + auVar14._0_4_ * fVar212;
      auVar175._4_4_ = auVar45._4_4_ * fVar187 + auVar219._4_4_ * fVar234 + auVar14._4_4_ * fVar296;
      auVar175._8_4_ = auVar45._8_4_ * fVar231 + auVar219._8_4_ * fVar236 + auVar14._8_4_ * fVar232;
      auVar175._12_4_ =
           auVar45._12_4_ * fVar190 + auVar219._12_4_ * fVar239 + auVar14._12_4_ * fVar297;
      auVar219 = vblendps_avx(auVar175,_local_590,8);
      auVar242._8_4_ = 0x7fffffff;
      auVar242._0_8_ = 0x7fffffff7fffffff;
      auVar242._12_4_ = 0x7fffffff;
      auVar377 = vandps_avx(auVar377,auVar242);
      auVar217 = vandps_avx(auVar217,auVar242);
      auVar45 = vmaxps_avx(auVar377,auVar217);
      auVar377 = vandps_avx(auVar218,auVar242);
      auVar217 = vandps_avx(auVar219,auVar242);
      auVar377 = vmaxps_avx(auVar377,auVar217);
      auVar377 = vmaxps_avx(auVar45,auVar377);
      auVar217 = vmovshdup_avx(auVar377);
      auVar217 = vmaxss_avx(auVar217,auVar377);
      auVar377 = vshufpd_avx(auVar377,auVar377,1);
      auVar377 = vmaxss_avx(auVar377,auVar217);
      fVar236 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar151 + 0x908);
      fVar239 = *(float *)(catmullrom_basis0 + lVar151 + 0x90c);
      fVar249 = *(float *)(catmullrom_basis0 + lVar151 + 0x910);
      fVar250 = *(float *)(catmullrom_basis0 + lVar151 + 0x914);
      fVar251 = *(float *)(catmullrom_basis0 + lVar151 + 0x918);
      fVar252 = *(float *)(catmullrom_basis0 + lVar151 + 0x91c);
      fVar254 = *(float *)(catmullrom_basis0 + lVar151 + 0x920);
      auVar136 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar151 + 0x908);
      local_780._0_16_ = auVar241;
      auVar217 = vshufps_avx(auVar241,auVar241,0);
      local_720._16_16_ = auVar217;
      local_720._0_16_ = auVar217;
      fVar260 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar151 + 0xd8c);
      fVar261 = *(float *)(catmullrom_basis0 + lVar151 + 0xd90);
      fVar262 = *(float *)(catmullrom_basis0 + lVar151 + 0xd94);
      fVar263 = *(float *)(catmullrom_basis0 + lVar151 + 0xd98);
      fVar264 = *(float *)(catmullrom_basis0 + lVar151 + 0xd9c);
      fVar265 = *(float *)(catmullrom_basis0 + lVar151 + 0xda0);
      fVar267 = *(float *)(catmullrom_basis0 + lVar151 + 0xda4);
      auVar135 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar151 + 0xd8c);
      auVar218 = vshufps_avx(auVar175,auVar175,0);
      register0x00001210 = auVar218;
      _local_400 = auVar218;
      fVar215 = auVar218._0_4_;
      fVar212 = auVar218._4_4_;
      fVar233 = auVar218._8_4_;
      fVar247 = auVar218._12_4_;
      fVar157 = auVar217._0_4_;
      fVar253 = auVar217._4_4_;
      fVar288 = auVar217._8_4_;
      fVar191 = auVar217._12_4_;
      auVar217 = vshufps_avx(auVar241,auVar241,0x55);
      register0x00001410 = auVar217;
      _local_6e0 = auVar217;
      auVar218 = vshufps_avx(auVar175,auVar175,0x55);
      register0x00001350 = auVar218;
      _local_740 = auVar218;
      fVar187 = auVar218._0_4_;
      fVar296 = auVar218._4_4_;
      fVar234 = auVar218._8_4_;
      fVar248 = auVar218._12_4_;
      fVar299 = auVar217._0_4_;
      fVar307 = auVar217._4_4_;
      fVar308 = auVar217._8_4_;
      fVar309 = auVar217._12_4_;
      auVar14 = _local_580;
      auVar217 = vshufps_avx(_local_580,_local_580,0xff);
      register0x00001310 = auVar217;
      _local_a0 = auVar217;
      auVar218 = vshufps_avx(_local_590,_local_590,0xff);
      register0x000013d0 = auVar218;
      _local_120 = auVar218;
      fVar231 = auVar218._0_4_;
      fVar190 = auVar218._4_4_;
      fVar232 = auVar218._8_4_;
      fVar297 = auVar218._12_4_;
      fVar235 = auVar217._0_4_;
      fVar188 = auVar217._4_4_;
      fVar189 = auVar217._8_4_;
      fVar192 = auVar217._12_4_;
      auVar217 = vshufps_avx(auVar349,auVar349,0);
      register0x00001550 = auVar217;
      _local_420 = auVar217;
      pauVar10 = (undefined1 (*) [16])(catmullrom_basis0 + lVar151 + 0x484);
      fVar276 = *(float *)*pauVar10;
      fVar278 = *(float *)(catmullrom_basis0 + lVar151 + 0x488);
      fVar280 = *(float *)(catmullrom_basis0 + lVar151 + 0x48c);
      auVar137 = *(undefined1 (*) [12])*pauVar10;
      fVar282 = *(float *)(catmullrom_basis0 + lVar151 + 0x490);
      fStack_310 = *(float *)(catmullrom_basis0 + lVar151 + 0x494);
      fStack_30c = *(float *)(catmullrom_basis0 + lVar151 + 0x498);
      fStack_308 = *(float *)(catmullrom_basis0 + lVar151 + 0x49c);
      fVar281 = auVar217._0_4_;
      fVar283 = auVar217._4_4_;
      fVar285 = auVar217._8_4_;
      fVar287 = auVar217._12_4_;
      auVar217 = vshufps_avx(auVar349,auVar349,0x55);
      register0x000014d0 = auVar217;
      _local_700 = auVar217;
      fVar340 = auVar217._0_4_;
      fVar346 = auVar217._4_4_;
      fVar347 = auVar217._8_4_;
      fVar348 = auVar217._12_4_;
      auVar16 = _local_570;
      auVar217 = vshufps_avx(_local_570,_local_570,0xff);
      register0x00001590 = auVar217;
      _local_140 = auVar217;
      _local_320 = *pauVar10;
      auVar17 = _local_320;
      uStack_304 = *(undefined4 *)(catmullrom_basis0 + lVar151 + 0x4a0);
      fVar289 = auVar217._0_4_;
      fVar322 = auVar217._4_4_;
      fVar324 = auVar217._8_4_;
      fVar326 = auVar217._12_4_;
      fVar213 = *(float *)(catmullrom_basis0 + lVar151 + 0x924) + 0.0 + 0.0;
      auVar217 = vshufps_avx(auVar202,auVar202,0);
      register0x00001390 = auVar217;
      _local_100 = auVar217;
      pauVar9 = (undefined1 (*) [32])(catmullrom_basis0 + lVar151);
      fVar284 = *(float *)*pauVar9;
      fVar286 = *(float *)(catmullrom_basis0 + lVar151 + 4);
      fVar310 = *(float *)(catmullrom_basis0 + lVar151 + 8);
      fVar321 = *(float *)(catmullrom_basis0 + lVar151 + 0xc);
      fVar323 = *(float *)(catmullrom_basis0 + lVar151 + 0x10);
      fVar325 = *(float *)(catmullrom_basis0 + lVar151 + 0x14);
      fVar327 = *(float *)(catmullrom_basis0 + lVar151 + 0x18);
      auVar138 = *(undefined1 (*) [28])*pauVar9;
      fVar194 = auVar217._0_4_;
      fVar196 = auVar217._4_4_;
      fVar198 = auVar217._8_4_;
      fVar200 = auVar217._12_4_;
      auVar315._0_4_ = fVar194 * fVar284 + fVar281 * fVar276 + fVar157 * fVar236 + fVar260 * fVar215
      ;
      auVar315._4_4_ = fVar196 * fVar286 + fVar283 * fVar278 + fVar253 * fVar239 + fVar261 * fVar212
      ;
      auVar315._8_4_ = fVar198 * fVar310 + fVar285 * fVar280 + fVar288 * fVar249 + fVar262 * fVar233
      ;
      auVar315._12_4_ =
           fVar200 * fVar321 + fVar287 * fVar282 + fVar191 * fVar250 + fVar263 * fVar247;
      auVar315._16_4_ =
           fVar194 * fVar323 + fVar281 * fStack_310 + fVar157 * fVar251 + fVar264 * fVar215;
      auVar315._20_4_ =
           fVar196 * fVar325 + fVar283 * fStack_30c + fVar253 * fVar252 + fVar265 * fVar212;
      auVar315._24_4_ =
           fVar198 * fVar327 + fVar285 * fStack_308 + fVar288 * fVar254 + fVar267 * fVar233;
      auVar315._28_4_ = fVar200 + fVar191 + fVar247 + 0.0;
      auVar217 = vshufps_avx(auVar202,auVar202,0x55);
      register0x000015d0 = auVar217;
      _local_c0 = auVar217;
      fVar328 = auVar217._0_4_;
      fVar329 = auVar217._4_4_;
      fVar331 = auVar217._8_4_;
      fVar376 = auVar217._12_4_;
      auVar354._0_4_ = fVar328 * fVar284 + fVar340 * fVar276 + fVar299 * fVar236 + fVar260 * fVar187
      ;
      auVar354._4_4_ = fVar329 * fVar286 + fVar346 * fVar278 + fVar307 * fVar239 + fVar261 * fVar296
      ;
      auVar354._8_4_ = fVar331 * fVar310 + fVar347 * fVar280 + fVar308 * fVar249 + fVar262 * fVar234
      ;
      auVar354._12_4_ =
           fVar376 * fVar321 + fVar348 * fVar282 + fVar309 * fVar250 + fVar263 * fVar248;
      auVar354._16_4_ =
           fVar328 * fVar323 + fVar340 * fStack_310 + fVar299 * fVar251 + fVar264 * fVar187;
      auVar354._20_4_ =
           fVar329 * fVar325 + fVar346 * fStack_30c + fVar307 * fVar252 + fVar265 * fVar296;
      auVar354._24_4_ =
           fVar331 * fVar327 + fVar347 * fStack_308 + fVar308 * fVar254 + fVar267 * fVar234;
      auVar354._28_4_ = 0;
      auVar217 = vpermilps_avx(_local_650,0xff);
      register0x00001490 = auVar217;
      _local_160 = auVar217;
      _local_340 = *pauVar9;
      auVar41 = _local_340;
      fVar268 = auVar217._0_4_;
      fVar277 = auVar217._4_4_;
      fVar279 = auVar217._8_4_;
      fVar155 = fVar268 * fVar284 + fVar289 * fVar276 + fVar235 * fVar236 + fVar260 * fVar231;
      fVar171 = fVar277 * fVar286 + fVar322 * fVar278 + fVar188 * fVar239 + fVar261 * fVar190;
      fStack_7b8 = fVar279 * fVar310 + fVar324 * fVar280 + fVar189 * fVar249 + fVar262 * fVar232;
      fStack_7b4 = auVar217._12_4_ * fVar321 +
                   fVar326 * fVar282 + fVar192 * fVar250 + fVar263 * fVar297;
      fStack_7b0 = fVar268 * fVar323 + fVar289 * fStack_310 + fVar235 * fVar251 + fVar264 * fVar231;
      fStack_7ac = fVar277 * fVar325 + fVar322 * fStack_30c + fVar188 * fVar252 + fVar265 * fVar190;
      fStack_7a8 = fVar279 * fVar327 + fVar324 * fStack_308 + fVar189 * fVar254 + fVar267 * fVar232;
      fStack_7a4 = fVar213 + 0.0;
      auVar160 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar151 + 0x908);
      auVar186 = ZEXT3264(auVar160);
      fVar263 = *(float *)(catmullrom_basis1 + lVar151 + 0xd8c);
      fVar264 = *(float *)(catmullrom_basis1 + lVar151 + 0xd90);
      fVar265 = *(float *)(catmullrom_basis1 + lVar151 + 0xd94);
      fVar267 = *(float *)(catmullrom_basis1 + lVar151 + 0xd98);
      fVar276 = *(float *)(catmullrom_basis1 + lVar151 + 0xd9c);
      fVar278 = *(float *)(catmullrom_basis1 + lVar151 + 0xda0);
      fVar280 = *(float *)(catmullrom_basis1 + lVar151 + 0xda4);
      fVar172 = auVar160._0_4_;
      fVar266 = auVar160._4_4_;
      fVar199 = auVar160._8_4_;
      fVar298 = auVar160._12_4_;
      fVar193 = auVar160._16_4_;
      fVar195 = auVar160._20_4_;
      fVar197 = auVar160._24_4_;
      fVar284 = *(float *)(catmullrom_basis1 + lVar151 + 0x484);
      fVar286 = *(float *)(catmullrom_basis1 + lVar151 + 0x488);
      fVar310 = *(float *)(catmullrom_basis1 + lVar151 + 0x48c);
      fVar321 = *(float *)(catmullrom_basis1 + lVar151 + 0x490);
      fVar323 = *(float *)(catmullrom_basis1 + lVar151 + 0x494);
      fVar325 = *(float *)(catmullrom_basis1 + lVar151 + 0x498);
      fVar327 = *(float *)(catmullrom_basis1 + lVar151 + 0x49c);
      fVar239 = fVar287 + fVar213 + 0.0;
      fVar213 = *(float *)(catmullrom_basis1 + lVar151);
      fVar330 = *(float *)(catmullrom_basis1 + lVar151 + 4);
      fVar214 = *(float *)(catmullrom_basis1 + lVar151 + 8);
      fVar238 = *(float *)(catmullrom_basis1 + lVar151 + 0xc);
      fVar237 = *(float *)(catmullrom_basis1 + lVar151 + 0x10);
      fVar332 = *(float *)(catmullrom_basis1 + lVar151 + 0x14);
      fVar156 = *(float *)(catmullrom_basis1 + lVar151 + 0x18);
      local_380._0_4_ =
           fVar194 * fVar213 + fVar281 * fVar284 + fVar172 * fVar157 + fVar263 * fVar215;
      local_380._4_4_ =
           fVar196 * fVar330 + fVar283 * fVar286 + fVar266 * fVar253 + fVar264 * fVar212;
      local_380._8_4_ =
           fVar198 * fVar214 + fVar285 * fVar310 + fVar199 * fVar288 + fVar265 * fVar233;
      local_380._12_4_ =
           fVar200 * fVar238 + fVar287 * fVar321 + fVar298 * fVar191 + fVar267 * fVar247;
      local_380._16_4_ =
           fVar194 * fVar237 + fVar281 * fVar323 + fVar193 * fVar157 + fVar276 * fVar215;
      local_380._20_4_ =
           fVar196 * fVar332 + fVar283 * fVar325 + fVar195 * fVar253 + fVar278 * fVar212;
      local_380._24_4_ =
           fVar198 * fVar156 + fVar285 * fVar327 + fVar197 * fVar288 + fVar280 * fVar233;
      local_380._28_4_ = fVar326 + fVar239;
      local_440._0_4_ =
           fVar328 * fVar213 + fVar340 * fVar284 + fVar299 * fVar172 + fVar187 * fVar263;
      local_440._4_4_ =
           fVar329 * fVar330 + fVar346 * fVar286 + fVar307 * fVar266 + fVar296 * fVar264;
      fStack_438 = fVar331 * fVar214 + fVar347 * fVar310 + fVar308 * fVar199 + fVar234 * fVar265;
      fStack_434 = fVar376 * fVar238 + fVar348 * fVar321 + fVar309 * fVar298 + fVar248 * fVar267;
      fStack_430 = fVar328 * fVar237 + fVar340 * fVar323 + fVar299 * fVar193 + fVar187 * fVar276;
      fStack_42c = fVar329 * fVar332 + fVar346 * fVar325 + fVar307 * fVar195 + fVar296 * fVar278;
      fStack_428 = fVar331 * fVar156 + fVar347 * fVar327 + fVar308 * fVar197 + fVar234 * fVar280;
      fStack_424 = fVar239 + fVar287 + fVar200 + 0.0;
      local_480._0_4_ =
           fVar289 * fVar284 + fVar235 * fVar172 + fVar231 * fVar263 + fVar268 * fVar213;
      local_480._4_4_ =
           fVar322 * fVar286 + fVar188 * fVar266 + fVar190 * fVar264 + fVar277 * fVar330;
      local_480._8_4_ =
           fVar324 * fVar310 + fVar189 * fVar199 + fVar232 * fVar265 + fVar279 * fVar214;
      local_480._12_4_ =
           fVar326 * fVar321 + fVar192 * fVar298 + fVar297 * fVar267 + auVar217._12_4_ * fVar238;
      local_480._16_4_ =
           fVar289 * fVar323 + fVar235 * fVar193 + fVar231 * fVar276 + fVar268 * fVar237;
      local_480._20_4_ =
           fVar322 * fVar325 + fVar188 * fVar195 + fVar190 * fVar278 + fVar277 * fVar332;
      local_480._24_4_ =
           fVar324 * fVar327 + fVar189 * fVar197 + fVar232 * fVar280 + fVar279 * fVar156;
      local_480._28_4_ = fVar287 + fVar297 + fVar200 + fVar239;
      auVar39 = vsubps_avx(local_380,auVar315);
      _local_460 = vsubps_avx(_local_440,auVar354);
      fVar231 = auVar39._0_4_;
      fVar232 = auVar39._4_4_;
      auVar47._4_4_ = auVar354._4_4_ * fVar232;
      auVar47._0_4_ = auVar354._0_4_ * fVar231;
      fVar236 = auVar39._8_4_;
      auVar47._8_4_ = auVar354._8_4_ * fVar236;
      fVar249 = auVar39._12_4_;
      auVar47._12_4_ = auVar354._12_4_ * fVar249;
      fVar251 = auVar39._16_4_;
      auVar47._16_4_ = auVar354._16_4_ * fVar251;
      fVar254 = auVar39._20_4_;
      auVar47._20_4_ = auVar354._20_4_ * fVar254;
      fVar261 = auVar39._24_4_;
      auVar47._24_4_ = auVar354._24_4_ * fVar261;
      auVar47._28_4_ = fVar239;
      fVar190 = local_460._0_4_;
      fVar297 = local_460._4_4_;
      auVar48._4_4_ = auVar315._4_4_ * fVar297;
      auVar48._0_4_ = auVar315._0_4_ * fVar190;
      fVar239 = local_460._8_4_;
      auVar48._8_4_ = auVar315._8_4_ * fVar239;
      fVar250 = local_460._12_4_;
      auVar48._12_4_ = auVar315._12_4_ * fVar250;
      fVar252 = local_460._16_4_;
      auVar48._16_4_ = auVar315._16_4_ * fVar252;
      fVar260 = local_460._20_4_;
      auVar48._20_4_ = auVar315._20_4_ * fVar260;
      fVar262 = local_460._24_4_;
      auVar48._24_4_ = auVar315._24_4_ * fVar262;
      auVar48._28_4_ = fStack_424;
      auVar38 = vsubps_avx(auVar47,auVar48);
      auVar130._4_4_ = fVar171;
      auVar130._0_4_ = fVar155;
      auVar130._8_4_ = fStack_7b8;
      auVar130._12_4_ = fStack_7b4;
      auVar130._16_4_ = fStack_7b0;
      auVar130._20_4_ = fStack_7ac;
      auVar130._24_4_ = fStack_7a8;
      auVar130._28_4_ = fStack_7a4;
      auVar37 = vmaxps_avx(auVar130,local_480);
      auVar49._4_4_ = auVar37._4_4_ * auVar37._4_4_ * (fVar232 * fVar232 + fVar297 * fVar297);
      auVar49._0_4_ = auVar37._0_4_ * auVar37._0_4_ * (fVar231 * fVar231 + fVar190 * fVar190);
      auVar49._8_4_ = auVar37._8_4_ * auVar37._8_4_ * (fVar236 * fVar236 + fVar239 * fVar239);
      auVar49._12_4_ = auVar37._12_4_ * auVar37._12_4_ * (fVar249 * fVar249 + fVar250 * fVar250);
      auVar49._16_4_ = auVar37._16_4_ * auVar37._16_4_ * (fVar251 * fVar251 + fVar252 * fVar252);
      auVar49._20_4_ = auVar37._20_4_ * auVar37._20_4_ * (fVar254 * fVar254 + fVar260 * fVar260);
      auVar49._24_4_ = auVar37._24_4_ * auVar37._24_4_ * (fVar261 * fVar261 + fVar262 * fVar262);
      auVar49._28_4_ = fVar192 + fStack_424;
      auVar50._4_4_ = auVar38._4_4_ * auVar38._4_4_;
      auVar50._0_4_ = auVar38._0_4_ * auVar38._0_4_;
      auVar50._8_4_ = auVar38._8_4_ * auVar38._8_4_;
      auVar50._12_4_ = auVar38._12_4_ * auVar38._12_4_;
      auVar50._16_4_ = auVar38._16_4_ * auVar38._16_4_;
      auVar50._20_4_ = auVar38._20_4_ * auVar38._20_4_;
      auVar50._24_4_ = auVar38._24_4_ * auVar38._24_4_;
      auVar50._28_4_ = auVar38._28_4_;
      auVar37 = vcmpps_avx(auVar50,auVar49,2);
      auVar217 = ZEXT416((uint)(float)(int)uVar147);
      _local_3e0 = auVar217;
      auVar217 = vshufps_avx(auVar217,auVar217,0);
      auVar225._16_16_ = auVar217;
      auVar225._0_16_ = auVar217;
      auVar38 = vcmpps_avx(_DAT_01faff40,auVar225,1);
      auVar217 = vpermilps_avx(auVar202,0xaa);
      register0x00001490 = auVar217;
      _local_680 = auVar217;
      auVar218 = vpermilps_avx(auVar349,0xaa);
      register0x00001550 = auVar218;
      _local_300 = auVar218;
      auVar219 = vpermilps_avx(auVar241,0xaa);
      register0x00001590 = auVar219;
      _local_e0 = auVar219;
      auVar45 = vpermilps_avx(auVar175,0xaa);
      register0x00001310 = auVar45;
      _local_600 = auVar45;
      auVar40 = auVar38 & auVar37;
      auVar377 = ZEXT416((uint)(auVar377._0_4_ * 4.7683716e-07));
      fVar231 = fVar187;
      fVar190 = fVar296;
      fVar232 = fVar234;
      fVar297 = fVar248;
      fVar236 = fVar299;
      fVar239 = fVar307;
      fVar249 = fVar308;
      fVar250 = fVar340;
      fVar251 = fVar346;
      fVar252 = fVar347;
      if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar40 >> 0x7f,0) == '\0') &&
            (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar40 >> 0xbf,0) == '\0') &&
          (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar40[0x1f])
      {
        bVar154 = false;
        auVar364 = ZEXT3264(local_720);
        auVar230 = ZEXT1664(auVar377);
        _local_650 = auVar15;
        _local_580 = auVar14;
        _local_570 = auVar16;
      }
      else {
        auVar37 = vandps_avx(auVar37,auVar38);
        fVar268 = auVar217._0_4_;
        fVar277 = auVar217._4_4_;
        fVar279 = auVar217._8_4_;
        fVar289 = auVar217._12_4_;
        fVar322 = auVar218._0_4_;
        fVar324 = auVar218._4_4_;
        fVar326 = auVar218._8_4_;
        fVar365 = auVar218._12_4_;
        fVar366 = auVar219._0_4_;
        fVar370 = auVar219._4_4_;
        fVar371 = auVar219._8_4_;
        fVar372 = auVar219._12_4_;
        fVar235 = auVar45._0_4_;
        fVar188 = auVar45._4_4_;
        fVar189 = auVar45._8_4_;
        fVar192 = auVar45._12_4_;
        fVar254 = auVar38._28_4_ + auVar160._28_4_ + local_380._28_4_;
        local_360._0_4_ =
             fVar268 * fVar213 + fVar322 * fVar284 + fVar366 * fVar172 + fVar235 * fVar263;
        local_360._4_4_ =
             fVar277 * fVar330 + fVar324 * fVar286 + fVar370 * fVar266 + fVar188 * fVar264;
        fStack_358 = fVar279 * fVar214 + fVar326 * fVar310 + fVar371 * fVar199 + fVar189 * fVar265;
        fStack_354 = fVar289 * fVar238 + fVar365 * fVar321 + fVar372 * fVar298 + fVar192 * fVar267;
        fStack_350 = fVar268 * fVar237 + fVar322 * fVar323 + fVar366 * fVar193 + fVar235 * fVar276;
        fStack_34c = fVar277 * fVar332 + fVar324 * fVar325 + fVar370 * fVar195 + fVar188 * fVar278;
        fStack_348 = fVar279 * fVar156 + fVar326 * fVar327 + fVar371 * fVar197 + fVar189 * fVar280;
        fStack_344 = auVar37._28_4_ + fVar254;
        local_340._0_4_ = auVar138._0_4_;
        local_340._4_4_ = auVar138._4_4_;
        fStack_338 = auVar138._8_4_;
        fStack_334 = auVar138._12_4_;
        fStack_330 = auVar138._16_4_;
        fStack_32c = auVar138._20_4_;
        fStack_328 = auVar138._24_4_;
        local_320._0_4_ = auVar137._0_4_;
        local_320._4_4_ = auVar137._4_4_;
        fStack_318 = auVar137._8_4_;
        local_560._0_4_ = auVar136._0_4_;
        local_560._4_4_ = auVar136._4_4_;
        fStack_558 = auVar136._8_4_;
        fStack_554 = auVar136._12_4_;
        fStack_550 = auVar136._16_4_;
        fStack_54c = auVar136._20_4_;
        fStack_548 = auVar136._24_4_;
        local_5e0._0_4_ = auVar135._0_4_;
        local_5e0._4_4_ = auVar135._4_4_;
        fStack_5d8 = auVar135._8_4_;
        fStack_5d4 = auVar135._12_4_;
        fStack_5d0 = auVar135._16_4_;
        fStack_5cc = auVar135._20_4_;
        fStack_5c8 = auVar135._24_4_;
        local_560._0_4_ =
             fVar268 * (float)local_340._0_4_ +
             fVar322 * (float)local_320._0_4_ +
             fVar366 * (float)local_560._0_4_ + fVar235 * (float)local_5e0._0_4_;
        local_560._4_4_ =
             fVar277 * (float)local_340._4_4_ +
             fVar324 * (float)local_320._4_4_ +
             fVar370 * (float)local_560._4_4_ + fVar188 * (float)local_5e0._4_4_;
        fStack_558 = fVar279 * fStack_338 +
                     fVar326 * fStack_318 + fVar371 * fStack_558 + fVar189 * fStack_5d8;
        fStack_554 = fVar289 * fStack_334 +
                     fVar365 * fVar282 + fVar372 * fStack_554 + fVar192 * fStack_5d4;
        fStack_550 = fVar268 * fStack_330 +
                     fVar322 * fStack_310 + fVar366 * fStack_550 + fVar235 * fStack_5d0;
        fStack_54c = fVar277 * fStack_32c +
                     fVar324 * fStack_30c + fVar370 * fStack_54c + fVar188 * fStack_5cc;
        fStack_548 = fVar279 * fStack_328 +
                     fVar326 * fStack_308 + fVar371 * fStack_548 + fVar189 * fStack_5c8;
        fStack_544 = fStack_344 + fVar254 + auVar37._28_4_ + auVar38._28_4_;
        fVar254 = *(float *)(catmullrom_basis0 + lVar151 + 0x1210);
        fVar260 = *(float *)(catmullrom_basis0 + lVar151 + 0x1214);
        fVar261 = *(float *)(catmullrom_basis0 + lVar151 + 0x1218);
        fVar262 = *(float *)(catmullrom_basis0 + lVar151 + 0x121c);
        fVar263 = *(float *)(catmullrom_basis0 + lVar151 + 0x1220);
        fVar264 = *(float *)(catmullrom_basis0 + lVar151 + 0x1224);
        fVar265 = *(float *)(catmullrom_basis0 + lVar151 + 0x1228);
        fVar267 = *(float *)(catmullrom_basis0 + lVar151 + 0x1694);
        fVar276 = *(float *)(catmullrom_basis0 + lVar151 + 0x1698);
        fVar278 = *(float *)(catmullrom_basis0 + lVar151 + 0x169c);
        fVar280 = *(float *)(catmullrom_basis0 + lVar151 + 0x16a0);
        fVar282 = *(float *)(catmullrom_basis0 + lVar151 + 0x16a4);
        fVar284 = *(float *)(catmullrom_basis0 + lVar151 + 0x16a8);
        fVar286 = *(float *)(catmullrom_basis0 + lVar151 + 0x16ac);
        fVar310 = *(float *)(catmullrom_basis0 + lVar151 + 0x1b18);
        fVar321 = *(float *)(catmullrom_basis0 + lVar151 + 0x1b1c);
        fVar323 = *(float *)(catmullrom_basis0 + lVar151 + 0x1b20);
        fVar325 = *(float *)(catmullrom_basis0 + lVar151 + 0x1b24);
        fVar327 = *(float *)(catmullrom_basis0 + lVar151 + 0x1b28);
        fVar213 = *(float *)(catmullrom_basis0 + lVar151 + 0x1b2c);
        fVar330 = *(float *)(catmullrom_basis0 + lVar151 + 0x1b30);
        fVar214 = *(float *)(catmullrom_basis0 + lVar151 + 0x1f9c);
        fVar238 = *(float *)(catmullrom_basis0 + lVar151 + 0x1fa0);
        fVar237 = *(float *)(catmullrom_basis0 + lVar151 + 0x1fa4);
        fVar332 = *(float *)(catmullrom_basis0 + lVar151 + 0x1fa8);
        fVar156 = *(float *)(catmullrom_basis0 + lVar151 + 0x1fac);
        fVar172 = *(float *)(catmullrom_basis0 + lVar151 + 0x1fb0);
        fVar266 = *(float *)(catmullrom_basis0 + lVar151 + 0x1fb4);
        local_780._0_16_ = auVar377;
        fVar199 = *(float *)(catmullrom_basis0 + lVar151 + 0x1b34) +
                  *(float *)(catmullrom_basis0 + lVar151 + 0x1fb8);
        fVar298 = *(float *)(catmullrom_basis0 + lVar151 + 0x16b0) + fVar199;
        local_5e0._4_4_ =
             fVar196 * fVar260 + fVar276 * fVar283 + fVar253 * fVar321 + fVar212 * fVar238;
        local_5e0._0_4_ =
             fVar194 * fVar254 + fVar267 * fVar281 + fVar157 * fVar310 + fVar215 * fVar214;
        fStack_5d8 = fVar198 * fVar261 + fVar278 * fVar285 + fVar288 * fVar323 + fVar233 * fVar237;
        fStack_5d4 = fVar200 * fVar262 + fVar280 * fVar287 + fVar191 * fVar325 + fVar247 * fVar332;
        fStack_5d0 = fVar194 * fVar263 + fVar282 * fVar281 + fVar157 * fVar327 + fVar215 * fVar156;
        fStack_5cc = fVar196 * fVar264 + fVar284 * fVar283 + fVar253 * fVar213 + fVar212 * fVar172;
        fStack_5c8 = fVar198 * fVar265 + fVar286 * fVar285 + fVar288 * fVar330 + fVar233 * fVar266;
        fStack_5c4 = *(float *)(catmullrom_basis0 + lVar151 + 0x16b0) +
                     *(float *)(catmullrom_basis0 + lVar151 + 0x1fb8) +
                     *(float *)(catmullrom_basis1 + lVar151 + 0x4a0) + 0.0;
        auVar181._0_4_ =
             fVar328 * fVar254 + fVar340 * fVar267 + fVar299 * fVar310 + fVar187 * fVar214;
        auVar181._4_4_ =
             fVar329 * fVar260 + fVar346 * fVar276 + fVar307 * fVar321 + fVar296 * fVar238;
        auVar181._8_4_ =
             fVar331 * fVar261 + fVar347 * fVar278 + fVar308 * fVar323 + fVar234 * fVar237;
        auVar181._12_4_ =
             fVar376 * fVar262 + fVar348 * fVar280 + fVar309 * fVar325 + fVar248 * fVar332;
        auVar181._16_4_ =
             fVar328 * fVar263 + fVar340 * fVar282 + fVar299 * fVar327 + fVar187 * fVar156;
        auVar181._20_4_ =
             fVar329 * fVar264 + fVar346 * fVar284 + fVar307 * fVar213 + fVar296 * fVar172;
        auVar181._24_4_ =
             fVar331 * fVar265 + fVar347 * fVar286 + fVar308 * fVar330 + fVar234 * fVar266;
        auVar181._28_4_ =
             fVar199 + *(float *)(catmullrom_basis1 + lVar151 + 0x4a0) + 0.0 +
                       *(float *)(catmullrom_basis1 + lVar151 + 0x1c) + 0.0;
        auVar271._0_4_ =
             fVar268 * fVar254 + fVar322 * fVar267 + fVar366 * fVar310 + fVar235 * fVar214;
        auVar271._4_4_ =
             fVar277 * fVar260 + fVar324 * fVar276 + fVar370 * fVar321 + fVar188 * fVar238;
        auVar271._8_4_ =
             fVar279 * fVar261 + fVar326 * fVar278 + fVar371 * fVar323 + fVar189 * fVar237;
        auVar271._12_4_ =
             fVar289 * fVar262 + fVar365 * fVar280 + fVar372 * fVar325 + fVar192 * fVar332;
        auVar271._16_4_ =
             fVar268 * fVar263 + fVar322 * fVar282 + fVar366 * fVar327 + fVar235 * fVar156;
        auVar271._20_4_ =
             fVar277 * fVar264 + fVar324 * fVar284 + fVar370 * fVar213 + fVar188 * fVar172;
        auVar271._24_4_ =
             fVar279 * fVar265 + fVar326 * fVar286 + fVar371 * fVar330 + fVar189 * fVar266;
        auVar271._28_4_ = *(float *)(catmullrom_basis0 + lVar151 + 0x122c) + fVar298;
        fVar254 = *(float *)(catmullrom_basis1 + lVar151 + 0x1b18);
        fVar260 = *(float *)(catmullrom_basis1 + lVar151 + 0x1b1c);
        fVar261 = *(float *)(catmullrom_basis1 + lVar151 + 0x1b20);
        fVar262 = *(float *)(catmullrom_basis1 + lVar151 + 0x1b24);
        fVar263 = *(float *)(catmullrom_basis1 + lVar151 + 0x1b28);
        fVar264 = *(float *)(catmullrom_basis1 + lVar151 + 0x1b2c);
        fVar265 = *(float *)(catmullrom_basis1 + lVar151 + 0x1b30);
        fVar267 = *(float *)(catmullrom_basis1 + lVar151 + 0x1f9c);
        fVar276 = *(float *)(catmullrom_basis1 + lVar151 + 0x1fa0);
        fVar278 = *(float *)(catmullrom_basis1 + lVar151 + 0x1fa4);
        fVar280 = *(float *)(catmullrom_basis1 + lVar151 + 0x1fa8);
        fVar282 = *(float *)(catmullrom_basis1 + lVar151 + 0x1fac);
        fVar284 = *(float *)(catmullrom_basis1 + lVar151 + 0x1fb0);
        fVar286 = *(float *)(catmullrom_basis1 + lVar151 + 0x1fb4);
        fVar310 = *(float *)(catmullrom_basis1 + lVar151 + 0x1694);
        fVar321 = *(float *)(catmullrom_basis1 + lVar151 + 0x1698);
        fVar323 = *(float *)(catmullrom_basis1 + lVar151 + 0x169c);
        fVar325 = *(float *)(catmullrom_basis1 + lVar151 + 0x16a0);
        fVar327 = *(float *)(catmullrom_basis1 + lVar151 + 0x16a4);
        fVar213 = *(float *)(catmullrom_basis1 + lVar151 + 0x16a8);
        fVar330 = *(float *)(catmullrom_basis1 + lVar151 + 0x16ac);
        fVar214 = *(float *)(catmullrom_basis1 + lVar151 + 0x1210);
        fVar238 = *(float *)(catmullrom_basis1 + lVar151 + 0x1214);
        fVar237 = *(float *)(catmullrom_basis1 + lVar151 + 0x1218);
        fVar332 = *(float *)(catmullrom_basis1 + lVar151 + 0x121c);
        fVar156 = *(float *)(catmullrom_basis1 + lVar151 + 0x1220);
        fVar172 = *(float *)(catmullrom_basis1 + lVar151 + 0x1224);
        fVar266 = *(float *)(catmullrom_basis1 + lVar151 + 0x1228);
        auVar294._0_4_ =
             fVar194 * fVar214 + fVar310 * fVar281 + fVar157 * fVar254 + fVar215 * fVar267;
        auVar294._4_4_ =
             fVar196 * fVar238 + fVar321 * fVar283 + fVar253 * fVar260 + fVar212 * fVar276;
        auVar294._8_4_ =
             fVar198 * fVar237 + fVar323 * fVar285 + fVar288 * fVar261 + fVar233 * fVar278;
        auVar294._12_4_ =
             fVar200 * fVar332 + fVar325 * fVar287 + fVar191 * fVar262 + fVar247 * fVar280;
        auVar294._16_4_ =
             fVar194 * fVar156 + fVar327 * fVar281 + fVar157 * fVar263 + fVar215 * fVar282;
        auVar294._20_4_ =
             fVar196 * fVar172 + fVar213 * fVar283 + fVar253 * fVar264 + fVar212 * fVar284;
        auVar294._24_4_ =
             fVar198 * fVar266 + fVar330 * fVar285 + fVar288 * fVar265 + fVar233 * fVar286;
        auVar294._28_4_ = fVar247 + fVar247 + fVar298 + 0.0;
        auVar316._0_4_ =
             fVar328 * fVar214 + fVar340 * fVar310 + fVar299 * fVar254 + fVar187 * fVar267;
        auVar316._4_4_ =
             fVar329 * fVar238 + fVar346 * fVar321 + fVar307 * fVar260 + fVar296 * fVar276;
        auVar316._8_4_ =
             fVar331 * fVar237 + fVar347 * fVar323 + fVar308 * fVar261 + fVar234 * fVar278;
        auVar316._12_4_ =
             fVar376 * fVar332 + fVar348 * fVar325 + fVar309 * fVar262 + fVar248 * fVar280;
        auVar316._16_4_ =
             fVar328 * fVar156 + fVar340 * fVar327 + fVar299 * fVar263 + fVar187 * fVar282;
        auVar316._20_4_ =
             fVar329 * fVar172 + fVar346 * fVar213 + fVar307 * fVar264 + fVar296 * fVar284;
        auVar316._24_4_ =
             fVar331 * fVar266 + fVar347 * fVar330 + fVar308 * fVar265 + fVar234 * fVar286;
        auVar316._28_4_ = fVar247 + fVar247 + fVar247 + 0.0;
        auVar209._0_4_ =
             fVar268 * fVar214 + fVar322 * fVar310 + fVar366 * fVar254 + fVar267 * fVar235;
        auVar209._4_4_ =
             fVar277 * fVar238 + fVar324 * fVar321 + fVar370 * fVar260 + fVar276 * fVar188;
        auVar209._8_4_ =
             fVar279 * fVar237 + fVar326 * fVar323 + fVar371 * fVar261 + fVar278 * fVar189;
        auVar209._12_4_ =
             fVar289 * fVar332 + fVar365 * fVar325 + fVar372 * fVar262 + fVar280 * fVar192;
        auVar209._16_4_ =
             fVar268 * fVar156 + fVar322 * fVar327 + fVar366 * fVar263 + fVar282 * fVar235;
        auVar209._20_4_ =
             fVar277 * fVar172 + fVar324 * fVar213 + fVar370 * fVar264 + fVar284 * fVar188;
        auVar209._24_4_ =
             fVar279 * fVar266 + fVar326 * fVar330 + fVar371 * fVar265 + fVar286 * fVar189;
        auVar209._28_4_ =
             *(float *)(catmullrom_basis1 + lVar151 + 0x122c) +
             *(float *)(catmullrom_basis1 + lVar151 + 0x16b0) +
             *(float *)(catmullrom_basis1 + lVar151 + 0x1b34) +
             *(float *)(catmullrom_basis1 + lVar151 + 0x1fb8);
        auVar243._8_4_ = 0x7fffffff;
        auVar243._0_8_ = 0x7fffffff7fffffff;
        auVar243._12_4_ = 0x7fffffff;
        auVar243._16_4_ = 0x7fffffff;
        auVar243._20_4_ = 0x7fffffff;
        auVar243._24_4_ = 0x7fffffff;
        auVar243._28_4_ = 0x7fffffff;
        auVar160 = vandps_avx(_local_5e0,auVar243);
        auVar38 = vandps_avx(auVar181,auVar243);
        auVar38 = vmaxps_avx(auVar160,auVar38);
        auVar160 = vandps_avx(auVar271,auVar243);
        auVar160 = vmaxps_avx(auVar38,auVar160);
        auVar217 = vpermilps_avx(auVar377,0);
        auVar272._16_16_ = auVar217;
        auVar272._0_16_ = auVar217;
        auVar160 = vcmpps_avx(auVar160,auVar272,1);
        auVar40 = vblendvps_avx(_local_5e0,auVar39,auVar160);
        auVar42 = vblendvps_avx(auVar181,_local_460,auVar160);
        auVar160 = vandps_avx(auVar294,auVar243);
        auVar38 = vandps_avx(auVar316,auVar243);
        auVar43 = vmaxps_avx(auVar160,auVar38);
        auVar160 = vandps_avx(auVar209,auVar243);
        auVar160 = vmaxps_avx(auVar43,auVar160);
        auVar43 = vcmpps_avx(auVar160,auVar272,1);
        auVar160 = vblendvps_avx(auVar294,auVar39,auVar43);
        auVar39 = vblendvps_avx(auVar316,_local_460,auVar43);
        fVar156 = auVar40._0_4_;
        fVar157 = auVar40._4_4_;
        fVar172 = auVar40._8_4_;
        fVar253 = auVar40._12_4_;
        fVar266 = auVar40._16_4_;
        fVar288 = auVar40._20_4_;
        fVar199 = auVar40._24_4_;
        fVar191 = auVar160._0_4_;
        fVar298 = auVar160._4_4_;
        fVar193 = auVar160._8_4_;
        fVar195 = auVar160._12_4_;
        fVar197 = auVar160._16_4_;
        fVar235 = auVar160._20_4_;
        fVar188 = auVar160._24_4_;
        fVar189 = -auVar160._28_4_;
        fVar215 = auVar42._0_4_;
        fVar254 = auVar42._4_4_;
        fVar263 = auVar42._8_4_;
        fVar276 = auVar42._12_4_;
        fVar284 = auVar42._16_4_;
        fVar323 = auVar42._20_4_;
        fVar330 = auVar42._24_4_;
        auVar163._0_4_ = fVar215 * fVar215 + fVar156 * fVar156;
        auVar163._4_4_ = fVar254 * fVar254 + fVar157 * fVar157;
        auVar163._8_4_ = fVar263 * fVar263 + fVar172 * fVar172;
        auVar163._12_4_ = fVar276 * fVar276 + fVar253 * fVar253;
        auVar163._16_4_ = fVar284 * fVar284 + fVar266 * fVar266;
        auVar163._20_4_ = fVar323 * fVar323 + fVar288 * fVar288;
        auVar163._24_4_ = fVar330 * fVar330 + fVar199 * fVar199;
        auVar163._28_4_ = auVar316._28_4_ + auVar40._28_4_;
        auVar40 = vrsqrtps_avx(auVar163);
        fVar212 = auVar40._0_4_;
        fVar233 = auVar40._4_4_;
        auVar51._4_4_ = fVar233 * 1.5;
        auVar51._0_4_ = fVar212 * 1.5;
        fVar247 = auVar40._8_4_;
        auVar51._8_4_ = fVar247 * 1.5;
        fVar260 = auVar40._12_4_;
        auVar51._12_4_ = fVar260 * 1.5;
        fVar261 = auVar40._16_4_;
        auVar51._16_4_ = fVar261 * 1.5;
        fVar262 = auVar40._20_4_;
        auVar51._20_4_ = fVar262 * 1.5;
        fVar264 = auVar40._24_4_;
        fVar332 = auVar38._28_4_;
        auVar51._24_4_ = fVar264 * 1.5;
        auVar51._28_4_ = fVar332;
        auVar52._4_4_ = fVar233 * fVar233 * fVar233 * auVar163._4_4_ * 0.5;
        auVar52._0_4_ = fVar212 * fVar212 * fVar212 * auVar163._0_4_ * 0.5;
        auVar52._8_4_ = fVar247 * fVar247 * fVar247 * auVar163._8_4_ * 0.5;
        auVar52._12_4_ = fVar260 * fVar260 * fVar260 * auVar163._12_4_ * 0.5;
        auVar52._16_4_ = fVar261 * fVar261 * fVar261 * auVar163._16_4_ * 0.5;
        auVar52._20_4_ = fVar262 * fVar262 * fVar262 * auVar163._20_4_ * 0.5;
        auVar52._24_4_ = fVar264 * fVar264 * fVar264 * auVar163._24_4_ * 0.5;
        auVar52._28_4_ = auVar163._28_4_;
        auVar38 = vsubps_avx(auVar51,auVar52);
        fVar212 = auVar38._0_4_;
        fVar260 = auVar38._4_4_;
        fVar264 = auVar38._8_4_;
        fVar278 = auVar38._12_4_;
        fVar286 = auVar38._16_4_;
        fVar325 = auVar38._20_4_;
        fVar214 = auVar38._24_4_;
        fVar233 = auVar39._0_4_;
        fVar261 = auVar39._4_4_;
        fVar265 = auVar39._8_4_;
        fVar280 = auVar39._12_4_;
        fVar310 = auVar39._16_4_;
        fVar327 = auVar39._20_4_;
        fVar238 = auVar39._24_4_;
        auVar164._0_4_ = fVar233 * fVar233 + fVar191 * fVar191;
        auVar164._4_4_ = fVar261 * fVar261 + fVar298 * fVar298;
        auVar164._8_4_ = fVar265 * fVar265 + fVar193 * fVar193;
        auVar164._12_4_ = fVar280 * fVar280 + fVar195 * fVar195;
        auVar164._16_4_ = fVar310 * fVar310 + fVar197 * fVar197;
        auVar164._20_4_ = fVar327 * fVar327 + fVar235 * fVar235;
        auVar164._24_4_ = fVar238 * fVar238 + fVar188 * fVar188;
        auVar164._28_4_ = auVar160._28_4_ + auVar38._28_4_;
        auVar160 = vrsqrtps_avx(auVar164);
        fVar247 = auVar160._0_4_;
        fVar262 = auVar160._4_4_;
        auVar53._4_4_ = fVar262 * 1.5;
        auVar53._0_4_ = fVar247 * 1.5;
        fVar267 = auVar160._8_4_;
        auVar53._8_4_ = fVar267 * 1.5;
        fVar282 = auVar160._12_4_;
        auVar53._12_4_ = fVar282 * 1.5;
        fVar321 = auVar160._16_4_;
        auVar53._16_4_ = fVar321 * 1.5;
        fVar213 = auVar160._20_4_;
        auVar53._20_4_ = fVar213 * 1.5;
        fVar237 = auVar160._24_4_;
        auVar53._24_4_ = fVar237 * 1.5;
        auVar53._28_4_ = fVar332;
        auVar54._4_4_ = fVar262 * fVar262 * fVar262 * auVar164._4_4_ * 0.5;
        auVar54._0_4_ = fVar247 * fVar247 * fVar247 * auVar164._0_4_ * 0.5;
        auVar54._8_4_ = fVar267 * fVar267 * fVar267 * auVar164._8_4_ * 0.5;
        auVar54._12_4_ = fVar282 * fVar282 * fVar282 * auVar164._12_4_ * 0.5;
        auVar54._16_4_ = fVar321 * fVar321 * fVar321 * auVar164._16_4_ * 0.5;
        auVar54._20_4_ = fVar213 * fVar213 * fVar213 * auVar164._20_4_ * 0.5;
        auVar54._24_4_ = fVar237 * fVar237 * fVar237 * auVar164._24_4_ * 0.5;
        auVar54._28_4_ = auVar164._28_4_;
        auVar160 = vsubps_avx(auVar53,auVar54);
        fVar247 = auVar160._0_4_;
        fVar262 = auVar160._4_4_;
        fVar267 = auVar160._8_4_;
        fVar282 = auVar160._12_4_;
        fVar321 = auVar160._16_4_;
        fVar213 = auVar160._20_4_;
        fVar237 = auVar160._24_4_;
        fVar215 = fVar155 * fVar215 * fVar212;
        fVar254 = fVar171 * fVar254 * fVar260;
        auVar55._4_4_ = fVar254;
        auVar55._0_4_ = fVar215;
        fVar263 = fStack_7b8 * fVar263 * fVar264;
        auVar55._8_4_ = fVar263;
        fVar276 = fStack_7b4 * fVar276 * fVar278;
        auVar55._12_4_ = fVar276;
        fVar284 = fStack_7b0 * fVar284 * fVar286;
        auVar55._16_4_ = fVar284;
        fVar323 = fStack_7ac * fVar323 * fVar325;
        auVar55._20_4_ = fVar323;
        fVar330 = fStack_7a8 * fVar330 * fVar214;
        auVar55._24_4_ = fVar330;
        auVar55._28_4_ = fVar189;
        local_5e0._4_4_ = auVar315._4_4_ + fVar254;
        local_5e0._0_4_ = auVar315._0_4_ + fVar215;
        fStack_5d8 = auVar315._8_4_ + fVar263;
        fStack_5d4 = auVar315._12_4_ + fVar276;
        fStack_5d0 = auVar315._16_4_ + fVar284;
        fStack_5cc = auVar315._20_4_ + fVar323;
        fStack_5c8 = auVar315._24_4_ + fVar330;
        fStack_5c4 = auVar315._28_4_ + fVar189;
        fVar215 = fVar155 * fVar212 * -fVar156;
        fVar254 = fVar171 * fVar260 * -fVar157;
        auVar56._4_4_ = fVar254;
        auVar56._0_4_ = fVar215;
        fVar263 = fStack_7b8 * fVar264 * -fVar172;
        auVar56._8_4_ = fVar263;
        fVar276 = fStack_7b4 * fVar278 * -fVar253;
        auVar56._12_4_ = fVar276;
        fVar284 = fStack_7b0 * fVar286 * -fVar266;
        auVar56._16_4_ = fVar284;
        fVar323 = fStack_7ac * fVar325 * -fVar288;
        auVar56._20_4_ = fVar323;
        fVar330 = fStack_7a8 * fVar214 * -fVar199;
        auVar56._24_4_ = fVar330;
        auVar56._28_4_ = fVar332;
        local_540._4_4_ = fVar254 + auVar354._4_4_;
        local_540._0_4_ = fVar215 + auVar354._0_4_;
        fStack_538 = fVar263 + auVar354._8_4_;
        fStack_534 = fVar276 + auVar354._12_4_;
        fStack_530 = fVar284 + auVar354._16_4_;
        fStack_52c = fVar323 + auVar354._20_4_;
        fStack_528 = fVar330 + auVar354._24_4_;
        fStack_524 = fVar332 + 0.0;
        fVar215 = fVar155 * fVar212 * 0.0;
        fVar212 = fVar171 * fVar260 * 0.0;
        auVar57._4_4_ = fVar212;
        auVar57._0_4_ = fVar215;
        fVar254 = fStack_7b8 * fVar264 * 0.0;
        auVar57._8_4_ = fVar254;
        fVar260 = fStack_7b4 * fVar278 * 0.0;
        auVar57._12_4_ = fVar260;
        fVar263 = fStack_7b0 * fVar286 * 0.0;
        auVar57._16_4_ = fVar263;
        fVar264 = fStack_7ac * fVar325 * 0.0;
        auVar57._20_4_ = fVar264;
        fVar276 = fStack_7a8 * fVar214 * 0.0;
        auVar57._24_4_ = fVar276;
        auVar57._28_4_ = fVar248;
        auVar273._0_4_ = (float)local_560._0_4_ + fVar215;
        auVar273._4_4_ = (float)local_560._4_4_ + fVar212;
        auVar273._8_4_ = fStack_558 + fVar254;
        auVar273._12_4_ = fStack_554 + fVar260;
        auVar273._16_4_ = fStack_550 + fVar263;
        auVar273._20_4_ = fStack_54c + fVar264;
        auVar273._24_4_ = fStack_548 + fVar276;
        auVar273._28_4_ = fStack_544 + fVar248;
        fVar215 = (float)local_480._0_4_ * fVar233 * fVar247;
        fVar212 = local_480._4_4_ * fVar261 * fVar262;
        auVar58._4_4_ = fVar212;
        auVar58._0_4_ = fVar215;
        fVar233 = local_480._8_4_ * fVar265 * fVar267;
        auVar58._8_4_ = fVar233;
        fVar254 = local_480._12_4_ * fVar280 * fVar282;
        auVar58._12_4_ = fVar254;
        fVar260 = local_480._16_4_ * fVar310 * fVar321;
        auVar58._16_4_ = fVar260;
        fVar261 = local_480._20_4_ * fVar327 * fVar213;
        auVar58._20_4_ = fVar261;
        fVar263 = local_480._24_4_ * fVar238 * fVar237;
        auVar58._24_4_ = fVar263;
        auVar58._28_4_ = auVar39._28_4_;
        auVar42 = vsubps_avx(auVar315,auVar55);
        auVar317._0_4_ = local_380._0_4_ + fVar215;
        auVar317._4_4_ = local_380._4_4_ + fVar212;
        auVar317._8_4_ = local_380._8_4_ + fVar233;
        auVar317._12_4_ = local_380._12_4_ + fVar254;
        auVar317._16_4_ = local_380._16_4_ + fVar260;
        auVar317._20_4_ = local_380._20_4_ + fVar261;
        auVar317._24_4_ = local_380._24_4_ + fVar263;
        auVar317._28_4_ = local_380._28_4_ + auVar39._28_4_;
        fVar215 = (float)local_480._0_4_ * fVar247 * -fVar191;
        fVar212 = local_480._4_4_ * fVar262 * -fVar298;
        auVar59._4_4_ = fVar212;
        auVar59._0_4_ = fVar215;
        fVar233 = local_480._8_4_ * fVar267 * -fVar193;
        auVar59._8_4_ = fVar233;
        fVar254 = local_480._12_4_ * fVar282 * -fVar195;
        auVar59._12_4_ = fVar254;
        fVar260 = local_480._16_4_ * fVar321 * -fVar197;
        auVar59._16_4_ = fVar260;
        fVar261 = local_480._20_4_ * fVar213 * -fVar235;
        auVar59._20_4_ = fVar261;
        fVar263 = local_480._24_4_ * fVar237 * -fVar188;
        auVar59._24_4_ = fVar263;
        auVar59._28_4_ = fVar365;
        auVar43 = vsubps_avx(auVar354,auVar56);
        auVar337._0_4_ = fVar215 + (float)local_440._0_4_;
        auVar337._4_4_ = fVar212 + (float)local_440._4_4_;
        auVar337._8_4_ = fVar233 + fStack_438;
        auVar337._12_4_ = fVar254 + fStack_434;
        auVar337._16_4_ = fVar260 + fStack_430;
        auVar337._20_4_ = fVar261 + fStack_42c;
        auVar337._24_4_ = fVar263 + fStack_428;
        auVar337._28_4_ = fVar365 + fStack_424;
        fVar215 = (float)local_480._0_4_ * fVar247 * 0.0;
        fVar212 = local_480._4_4_ * fVar262 * 0.0;
        auVar60._4_4_ = fVar212;
        auVar60._0_4_ = fVar215;
        fVar233 = local_480._8_4_ * fVar267 * 0.0;
        auVar60._8_4_ = fVar233;
        fVar247 = local_480._12_4_ * fVar282 * 0.0;
        auVar60._12_4_ = fVar247;
        fVar254 = local_480._16_4_ * fVar321 * 0.0;
        auVar60._16_4_ = fVar254;
        fVar260 = local_480._20_4_ * fVar213 * 0.0;
        auVar60._20_4_ = fVar260;
        fVar261 = local_480._24_4_ * fVar237 * 0.0;
        auVar60._24_4_ = fVar261;
        auVar60._28_4_ = 0x3f000000;
        auVar46 = vsubps_avx(_local_560,auVar57);
        auVar368._0_4_ = fVar215 + (float)local_360._0_4_;
        auVar368._4_4_ = fVar212 + (float)local_360._4_4_;
        auVar368._8_4_ = fVar233 + fStack_358;
        auVar368._12_4_ = fVar247 + fStack_354;
        auVar368._16_4_ = fVar254 + fStack_350;
        auVar368._20_4_ = fVar260 + fStack_34c;
        auVar368._24_4_ = fVar261 + fStack_348;
        auVar368._28_4_ = fStack_344 + 0.5;
        auVar160 = vsubps_avx(local_380,auVar58);
        auVar38 = vsubps_avx(_local_440,auVar59);
        auVar36 = vsubps_avx(_local_360,auVar60);
        auVar39 = vsubps_avx(auVar337,auVar43);
        auVar40 = vsubps_avx(auVar368,auVar46);
        auVar61._4_4_ = auVar46._4_4_ * auVar39._4_4_;
        auVar61._0_4_ = auVar46._0_4_ * auVar39._0_4_;
        auVar61._8_4_ = auVar46._8_4_ * auVar39._8_4_;
        auVar61._12_4_ = auVar46._12_4_ * auVar39._12_4_;
        auVar61._16_4_ = auVar46._16_4_ * auVar39._16_4_;
        auVar61._20_4_ = auVar46._20_4_ * auVar39._20_4_;
        auVar61._24_4_ = auVar46._24_4_ * auVar39._24_4_;
        auVar61._28_4_ = fVar348;
        auVar62._4_4_ = auVar43._4_4_ * auVar40._4_4_;
        auVar62._0_4_ = auVar43._0_4_ * auVar40._0_4_;
        auVar62._8_4_ = auVar43._8_4_ * auVar40._8_4_;
        auVar62._12_4_ = auVar43._12_4_ * auVar40._12_4_;
        auVar62._16_4_ = auVar43._16_4_ * auVar40._16_4_;
        auVar62._20_4_ = auVar43._20_4_ * auVar40._20_4_;
        auVar62._24_4_ = auVar43._24_4_ * auVar40._24_4_;
        auVar62._28_4_ = fStack_344;
        auVar44 = vsubps_avx(auVar62,auVar61);
        auVar63._4_4_ = auVar42._4_4_ * auVar40._4_4_;
        auVar63._0_4_ = auVar42._0_4_ * auVar40._0_4_;
        auVar63._8_4_ = auVar42._8_4_ * auVar40._8_4_;
        auVar63._12_4_ = auVar42._12_4_ * auVar40._12_4_;
        auVar63._16_4_ = auVar42._16_4_ * auVar40._16_4_;
        auVar63._20_4_ = auVar42._20_4_ * auVar40._20_4_;
        auVar63._24_4_ = auVar42._24_4_ * auVar40._24_4_;
        auVar63._28_4_ = auVar40._28_4_;
        auVar161 = vsubps_avx(auVar317,auVar42);
        auVar64._4_4_ = auVar46._4_4_ * auVar161._4_4_;
        auVar64._0_4_ = auVar46._0_4_ * auVar161._0_4_;
        auVar64._8_4_ = auVar46._8_4_ * auVar161._8_4_;
        auVar64._12_4_ = auVar46._12_4_ * auVar161._12_4_;
        auVar64._16_4_ = auVar46._16_4_ * auVar161._16_4_;
        auVar64._20_4_ = auVar46._20_4_ * auVar161._20_4_;
        auVar64._24_4_ = auVar46._24_4_ * auVar161._24_4_;
        auVar64._28_4_ = fStack_424;
        auVar162 = vsubps_avx(auVar64,auVar63);
        auVar65._4_4_ = auVar161._4_4_ * auVar43._4_4_;
        auVar65._0_4_ = auVar161._0_4_ * auVar43._0_4_;
        auVar65._8_4_ = auVar161._8_4_ * auVar43._8_4_;
        auVar65._12_4_ = auVar161._12_4_ * auVar43._12_4_;
        auVar65._16_4_ = auVar161._16_4_ * auVar43._16_4_;
        auVar65._20_4_ = auVar161._20_4_ * auVar43._20_4_;
        auVar65._24_4_ = auVar161._24_4_ * auVar43._24_4_;
        auVar65._28_4_ = auVar40._28_4_;
        auVar66._4_4_ = auVar42._4_4_ * auVar39._4_4_;
        auVar66._0_4_ = auVar42._0_4_ * auVar39._0_4_;
        auVar66._8_4_ = auVar42._8_4_ * auVar39._8_4_;
        auVar66._12_4_ = auVar42._12_4_ * auVar39._12_4_;
        auVar66._16_4_ = auVar42._16_4_ * auVar39._16_4_;
        auVar66._20_4_ = auVar42._20_4_ * auVar39._20_4_;
        auVar66._24_4_ = auVar42._24_4_ * auVar39._24_4_;
        auVar66._28_4_ = auVar39._28_4_;
        auVar39 = vsubps_avx(auVar66,auVar65);
        auVar165._0_4_ = auVar44._0_4_ * 0.0 + auVar39._0_4_ + auVar162._0_4_ * 0.0;
        auVar165._4_4_ = auVar44._4_4_ * 0.0 + auVar39._4_4_ + auVar162._4_4_ * 0.0;
        auVar165._8_4_ = auVar44._8_4_ * 0.0 + auVar39._8_4_ + auVar162._8_4_ * 0.0;
        auVar165._12_4_ = auVar44._12_4_ * 0.0 + auVar39._12_4_ + auVar162._12_4_ * 0.0;
        auVar165._16_4_ = auVar44._16_4_ * 0.0 + auVar39._16_4_ + auVar162._16_4_ * 0.0;
        auVar165._20_4_ = auVar44._20_4_ * 0.0 + auVar39._20_4_ + auVar162._20_4_ * 0.0;
        auVar165._24_4_ = auVar44._24_4_ * 0.0 + auVar39._24_4_ + auVar162._24_4_ * 0.0;
        auVar165._28_4_ = auVar39._28_4_ + auVar39._28_4_ + auVar162._28_4_;
        auVar44 = vcmpps_avx(auVar165,ZEXT432(0) << 0x20,2);
        _local_520 = vblendvps_avx(auVar160,_local_5e0,auVar44);
        _local_5c0 = vblendvps_avx(auVar38,_local_540,auVar44);
        auVar160 = vblendvps_avx(auVar36,auVar273,auVar44);
        auVar38 = vblendvps_avx(auVar42,auVar317,auVar44);
        auVar39 = vblendvps_avx(auVar43,auVar337,auVar44);
        auVar40 = vblendvps_avx(auVar46,auVar368,auVar44);
        auVar42 = vblendvps_avx(auVar317,auVar42,auVar44);
        auVar43 = vblendvps_avx(auVar337,auVar43,auVar44);
        local_7a0 = vpackssdw_avx(auVar37._0_16_,auVar37._16_16_);
        auStack_790 = auVar37._16_16_;
        auVar37 = vblendvps_avx(auVar368,auVar46,auVar44);
        auVar42 = vsubps_avx(auVar42,_local_520);
        auVar46 = vsubps_avx(auVar43,_local_5c0);
        auVar161 = vsubps_avx(auVar37,auVar160);
        auVar37 = vsubps_avx(_local_5c0,auVar39);
        fVar215 = auVar46._0_4_;
        fVar199 = auVar160._0_4_;
        fVar260 = auVar46._4_4_;
        fVar191 = auVar160._4_4_;
        auVar67._4_4_ = fVar191 * fVar260;
        auVar67._0_4_ = fVar199 * fVar215;
        fVar265 = auVar46._8_4_;
        fVar298 = auVar160._8_4_;
        auVar67._8_4_ = fVar298 * fVar265;
        fVar282 = auVar46._12_4_;
        fVar193 = auVar160._12_4_;
        auVar67._12_4_ = fVar193 * fVar282;
        fVar323 = auVar46._16_4_;
        fVar195 = auVar160._16_4_;
        auVar67._16_4_ = fVar195 * fVar323;
        fVar214 = auVar46._20_4_;
        fVar197 = auVar160._20_4_;
        auVar67._20_4_ = fVar197 * fVar214;
        fVar157 = auVar46._24_4_;
        fVar235 = auVar160._24_4_;
        auVar67._24_4_ = fVar235 * fVar157;
        auVar67._28_4_ = auVar43._28_4_;
        fVar212 = local_5c0._0_4_;
        fVar268 = auVar161._0_4_;
        fVar261 = local_5c0._4_4_;
        fVar277 = auVar161._4_4_;
        auVar68._4_4_ = fVar277 * fVar261;
        auVar68._0_4_ = fVar268 * fVar212;
        fVar267 = local_5c0._8_4_;
        fVar279 = auVar161._8_4_;
        auVar68._8_4_ = fVar279 * fVar267;
        fVar284 = local_5c0._12_4_;
        fVar281 = auVar161._12_4_;
        auVar68._12_4_ = fVar281 * fVar284;
        fVar325 = local_5c0._16_4_;
        fVar283 = auVar161._16_4_;
        auVar68._16_4_ = fVar283 * fVar325;
        fVar238 = local_5c0._20_4_;
        fVar285 = auVar161._20_4_;
        auVar68._20_4_ = fVar285 * fVar238;
        fVar172 = local_5c0._24_4_;
        fVar287 = auVar161._24_4_;
        uVar12 = auVar36._28_4_;
        auVar68._24_4_ = fVar287 * fVar172;
        auVar68._28_4_ = uVar12;
        auVar43 = vsubps_avx(auVar68,auVar67);
        fVar233 = local_520._0_4_;
        fVar262 = local_520._4_4_;
        auVar69._4_4_ = fVar277 * fVar262;
        auVar69._0_4_ = fVar268 * fVar233;
        fVar276 = local_520._8_4_;
        auVar69._8_4_ = fVar279 * fVar276;
        fVar286 = local_520._12_4_;
        auVar69._12_4_ = fVar281 * fVar286;
        fVar327 = local_520._16_4_;
        auVar69._16_4_ = fVar283 * fVar327;
        fVar237 = local_520._20_4_;
        auVar69._20_4_ = fVar285 * fVar237;
        fVar253 = local_520._24_4_;
        auVar69._24_4_ = fVar287 * fVar253;
        auVar69._28_4_ = uVar12;
        fVar247 = auVar42._0_4_;
        fVar263 = auVar42._4_4_;
        auVar70._4_4_ = fVar191 * fVar263;
        auVar70._0_4_ = fVar199 * fVar247;
        fVar278 = auVar42._8_4_;
        auVar70._8_4_ = fVar298 * fVar278;
        fVar310 = auVar42._12_4_;
        auVar70._12_4_ = fVar193 * fVar310;
        fVar213 = auVar42._16_4_;
        auVar70._16_4_ = fVar195 * fVar213;
        fVar332 = auVar42._20_4_;
        auVar70._20_4_ = fVar197 * fVar332;
        fVar266 = auVar42._24_4_;
        auVar70._24_4_ = fVar235 * fVar266;
        auVar70._28_4_ = auVar368._28_4_;
        auVar36 = vsubps_avx(auVar70,auVar69);
        auVar71._4_4_ = fVar261 * fVar263;
        auVar71._0_4_ = fVar212 * fVar247;
        auVar71._8_4_ = fVar267 * fVar278;
        auVar71._12_4_ = fVar284 * fVar310;
        auVar71._16_4_ = fVar325 * fVar213;
        auVar71._20_4_ = fVar238 * fVar332;
        auVar71._24_4_ = fVar172 * fVar266;
        auVar71._28_4_ = uVar12;
        auVar373._0_4_ = fVar233 * fVar215;
        auVar373._4_4_ = fVar262 * fVar260;
        auVar373._8_4_ = fVar276 * fVar265;
        auVar373._12_4_ = fVar286 * fVar282;
        auVar373._16_4_ = fVar327 * fVar323;
        auVar373._20_4_ = fVar237 * fVar214;
        auVar373._24_4_ = fVar253 * fVar157;
        auVar373._28_4_ = 0;
        auVar162 = vsubps_avx(auVar373,auVar71);
        auVar178 = vsubps_avx(auVar160,auVar40);
        fVar254 = auVar162._28_4_ + auVar36._28_4_;
        auVar182._0_4_ = auVar162._0_4_ + auVar36._0_4_ * 0.0 + auVar43._0_4_ * 0.0;
        auVar182._4_4_ = auVar162._4_4_ + auVar36._4_4_ * 0.0 + auVar43._4_4_ * 0.0;
        auVar182._8_4_ = auVar162._8_4_ + auVar36._8_4_ * 0.0 + auVar43._8_4_ * 0.0;
        auVar182._12_4_ = auVar162._12_4_ + auVar36._12_4_ * 0.0 + auVar43._12_4_ * 0.0;
        auVar182._16_4_ = auVar162._16_4_ + auVar36._16_4_ * 0.0 + auVar43._16_4_ * 0.0;
        auVar182._20_4_ = auVar162._20_4_ + auVar36._20_4_ * 0.0 + auVar43._20_4_ * 0.0;
        auVar182._24_4_ = auVar162._24_4_ + auVar36._24_4_ * 0.0 + auVar43._24_4_ * 0.0;
        auVar182._28_4_ = fVar254 + auVar43._28_4_;
        auVar186 = ZEXT3264(auVar182);
        fVar188 = auVar37._0_4_;
        fVar189 = auVar37._4_4_;
        auVar72._4_4_ = fVar189 * auVar40._4_4_;
        auVar72._0_4_ = fVar188 * auVar40._0_4_;
        fVar192 = auVar37._8_4_;
        auVar72._8_4_ = fVar192 * auVar40._8_4_;
        fVar194 = auVar37._12_4_;
        auVar72._12_4_ = fVar194 * auVar40._12_4_;
        fVar196 = auVar37._16_4_;
        auVar72._16_4_ = fVar196 * auVar40._16_4_;
        fVar198 = auVar37._20_4_;
        auVar72._20_4_ = fVar198 * auVar40._20_4_;
        fVar200 = auVar37._24_4_;
        auVar72._24_4_ = fVar200 * auVar40._24_4_;
        auVar72._28_4_ = fVar254;
        fVar254 = auVar178._0_4_;
        fVar264 = auVar178._4_4_;
        auVar73._4_4_ = auVar39._4_4_ * fVar264;
        auVar73._0_4_ = auVar39._0_4_ * fVar254;
        fVar280 = auVar178._8_4_;
        auVar73._8_4_ = auVar39._8_4_ * fVar280;
        fVar321 = auVar178._12_4_;
        auVar73._12_4_ = auVar39._12_4_ * fVar321;
        fVar330 = auVar178._16_4_;
        auVar73._16_4_ = auVar39._16_4_ * fVar330;
        fVar156 = auVar178._20_4_;
        auVar73._20_4_ = auVar39._20_4_ * fVar156;
        fVar288 = auVar178._24_4_;
        auVar73._24_4_ = auVar39._24_4_ * fVar288;
        auVar73._28_4_ = auVar162._28_4_;
        auVar37 = vsubps_avx(auVar73,auVar72);
        auVar36 = vsubps_avx(_local_520,auVar38);
        fVar289 = auVar36._0_4_;
        fVar322 = auVar36._4_4_;
        auVar74._4_4_ = fVar322 * auVar40._4_4_;
        auVar74._0_4_ = fVar289 * auVar40._0_4_;
        fVar324 = auVar36._8_4_;
        auVar74._8_4_ = fVar324 * auVar40._8_4_;
        fVar326 = auVar36._12_4_;
        auVar74._12_4_ = fVar326 * auVar40._12_4_;
        fVar328 = auVar36._16_4_;
        auVar74._16_4_ = fVar328 * auVar40._16_4_;
        fVar329 = auVar36._20_4_;
        auVar74._20_4_ = fVar329 * auVar40._20_4_;
        fVar331 = auVar36._24_4_;
        auVar74._24_4_ = fVar331 * auVar40._24_4_;
        auVar74._28_4_ = auVar40._28_4_;
        auVar75._4_4_ = auVar38._4_4_ * fVar264;
        auVar75._0_4_ = auVar38._0_4_ * fVar254;
        auVar75._8_4_ = auVar38._8_4_ * fVar280;
        auVar75._12_4_ = auVar38._12_4_ * fVar321;
        auVar75._16_4_ = auVar38._16_4_ * fVar330;
        auVar75._20_4_ = auVar38._20_4_ * fVar156;
        auVar75._24_4_ = auVar38._24_4_ * fVar288;
        auVar75._28_4_ = auVar43._28_4_;
        auVar43 = vsubps_avx(auVar74,auVar75);
        auVar76._4_4_ = auVar39._4_4_ * fVar322;
        auVar76._0_4_ = auVar39._0_4_ * fVar289;
        auVar76._8_4_ = auVar39._8_4_ * fVar324;
        auVar76._12_4_ = auVar39._12_4_ * fVar326;
        auVar76._16_4_ = auVar39._16_4_ * fVar328;
        auVar76._20_4_ = auVar39._20_4_ * fVar329;
        auVar76._24_4_ = auVar39._24_4_ * fVar331;
        auVar76._28_4_ = auVar40._28_4_;
        auVar77._4_4_ = auVar38._4_4_ * fVar189;
        auVar77._0_4_ = auVar38._0_4_ * fVar188;
        auVar77._8_4_ = auVar38._8_4_ * fVar192;
        auVar77._12_4_ = auVar38._12_4_ * fVar194;
        auVar77._16_4_ = auVar38._16_4_ * fVar196;
        auVar77._20_4_ = auVar38._20_4_ * fVar198;
        auVar77._24_4_ = auVar38._24_4_ * fVar200;
        auVar77._28_4_ = auVar38._28_4_;
        auVar38 = vsubps_avx(auVar77,auVar76);
        auVar244._0_4_ = auVar37._0_4_ * 0.0 + auVar38._0_4_ + auVar43._0_4_ * 0.0;
        auVar244._4_4_ = auVar37._4_4_ * 0.0 + auVar38._4_4_ + auVar43._4_4_ * 0.0;
        auVar244._8_4_ = auVar37._8_4_ * 0.0 + auVar38._8_4_ + auVar43._8_4_ * 0.0;
        auVar244._12_4_ = auVar37._12_4_ * 0.0 + auVar38._12_4_ + auVar43._12_4_ * 0.0;
        auVar244._16_4_ = auVar37._16_4_ * 0.0 + auVar38._16_4_ + auVar43._16_4_ * 0.0;
        auVar244._20_4_ = auVar37._20_4_ * 0.0 + auVar38._20_4_ + auVar43._20_4_ * 0.0;
        auVar244._24_4_ = auVar37._24_4_ * 0.0 + auVar38._24_4_ + auVar43._24_4_ * 0.0;
        auVar244._28_4_ = auVar38._28_4_ + auVar38._28_4_ + auVar43._28_4_;
        auVar37 = vmaxps_avx(auVar182,auVar244);
        auVar37 = vcmpps_avx(auVar37,ZEXT832(0) << 0x20,2);
        auVar217 = vpackssdw_avx(auVar37._0_16_,auVar37._16_16_);
        auVar217 = vpand_avx(auVar217,local_7a0);
        auVar218 = vpmovsxwd_avx(auVar217);
        auVar219 = vpunpckhwd_avx(auVar217,auVar217);
        auVar226._16_16_ = auVar219;
        auVar226._0_16_ = auVar218;
        if ((((((((auVar226 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar226 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar226 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar226 >> 0x7f,0) == '\0') &&
              (auVar226 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar219 >> 0x3f,0) == '\0') &&
            (auVar226 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar219[0xf]) {
LAB_011b6dc3:
          auVar170 = ZEXT3264(CONCAT824(uStack_4a8,
                                        CONCAT816(uStack_4b0,CONCAT88(uStack_4b8,local_4c0))));
          auVar369._4_4_ = fVar171;
          auVar369._0_4_ = fVar155;
          auVar369._8_4_ = fStack_7b8;
          auVar369._12_4_ = fStack_7b4;
          auVar369._16_4_ = fStack_7b0;
          auVar369._20_4_ = fStack_7ac;
          auVar369._24_4_ = fStack_7a8;
          auVar369._28_4_ = fStack_7a4;
        }
        else {
          auVar78._4_4_ = fVar264 * fVar260;
          auVar78._0_4_ = fVar254 * fVar215;
          auVar78._8_4_ = fVar280 * fVar265;
          auVar78._12_4_ = fVar321 * fVar282;
          auVar78._16_4_ = fVar330 * fVar323;
          auVar78._20_4_ = fVar156 * fVar214;
          auVar78._24_4_ = fVar288 * fVar157;
          auVar78._28_4_ = auVar219._12_4_;
          auVar355._0_4_ = fVar188 * fVar268;
          auVar355._4_4_ = fVar189 * fVar277;
          auVar355._8_4_ = fVar192 * fVar279;
          auVar355._12_4_ = fVar194 * fVar281;
          auVar355._16_4_ = fVar196 * fVar283;
          auVar355._20_4_ = fVar198 * fVar285;
          auVar355._24_4_ = fVar200 * fVar287;
          auVar355._28_4_ = 0;
          auVar38 = vsubps_avx(auVar355,auVar78);
          auVar79._4_4_ = fVar322 * fVar277;
          auVar79._0_4_ = fVar289 * fVar268;
          auVar79._8_4_ = fVar324 * fVar279;
          auVar79._12_4_ = fVar326 * fVar281;
          auVar79._16_4_ = fVar328 * fVar283;
          auVar79._20_4_ = fVar329 * fVar285;
          auVar79._24_4_ = fVar331 * fVar287;
          auVar79._28_4_ = auVar161._28_4_;
          auVar80._4_4_ = fVar264 * fVar263;
          auVar80._0_4_ = fVar254 * fVar247;
          auVar80._8_4_ = fVar280 * fVar278;
          auVar80._12_4_ = fVar321 * fVar310;
          auVar80._16_4_ = fVar330 * fVar213;
          auVar80._20_4_ = fVar156 * fVar332;
          auVar80._24_4_ = fVar288 * fVar266;
          auVar80._28_4_ = auVar178._28_4_;
          auVar39 = vsubps_avx(auVar80,auVar79);
          auVar81._4_4_ = fVar189 * fVar263;
          auVar81._0_4_ = fVar188 * fVar247;
          auVar81._8_4_ = fVar192 * fVar278;
          auVar81._12_4_ = fVar194 * fVar310;
          auVar81._16_4_ = fVar196 * fVar213;
          auVar81._20_4_ = fVar198 * fVar332;
          auVar81._24_4_ = fVar200 * fVar266;
          auVar81._28_4_ = auVar182._28_4_;
          auVar82._4_4_ = fVar322 * fVar260;
          auVar82._0_4_ = fVar289 * fVar215;
          auVar82._8_4_ = fVar324 * fVar265;
          auVar82._12_4_ = fVar326 * fVar282;
          auVar82._16_4_ = fVar328 * fVar323;
          auVar82._20_4_ = fVar329 * fVar214;
          auVar82._24_4_ = fVar331 * fVar157;
          auVar82._28_4_ = auVar46._28_4_;
          auVar40 = vsubps_avx(auVar82,auVar81);
          auVar295._0_4_ = auVar38._0_4_ * 0.0 + auVar40._0_4_ + auVar39._0_4_ * 0.0;
          auVar295._4_4_ = auVar38._4_4_ * 0.0 + auVar40._4_4_ + auVar39._4_4_ * 0.0;
          auVar295._8_4_ = auVar38._8_4_ * 0.0 + auVar40._8_4_ + auVar39._8_4_ * 0.0;
          auVar295._12_4_ = auVar38._12_4_ * 0.0 + auVar40._12_4_ + auVar39._12_4_ * 0.0;
          auVar295._16_4_ = auVar38._16_4_ * 0.0 + auVar40._16_4_ + auVar39._16_4_ * 0.0;
          auVar295._20_4_ = auVar38._20_4_ * 0.0 + auVar40._20_4_ + auVar39._20_4_ * 0.0;
          auVar295._24_4_ = auVar38._24_4_ * 0.0 + auVar40._24_4_ + auVar39._24_4_ * 0.0;
          auVar295._28_4_ = auVar46._28_4_ + auVar40._28_4_ + auVar182._28_4_;
          auVar37 = vrcpps_avx(auVar295);
          fVar247 = auVar37._0_4_;
          fVar254 = auVar37._4_4_;
          auVar83._4_4_ = auVar295._4_4_ * fVar254;
          auVar83._0_4_ = auVar295._0_4_ * fVar247;
          fVar260 = auVar37._8_4_;
          auVar83._8_4_ = auVar295._8_4_ * fVar260;
          fVar263 = auVar37._12_4_;
          auVar83._12_4_ = auVar295._12_4_ * fVar263;
          fVar264 = auVar37._16_4_;
          auVar83._16_4_ = auVar295._16_4_ * fVar264;
          fVar265 = auVar37._20_4_;
          auVar83._20_4_ = auVar295._20_4_ * fVar265;
          fVar278 = auVar37._24_4_;
          auVar83._24_4_ = auVar295._24_4_ * fVar278;
          auVar83._28_4_ = auVar178._28_4_;
          auVar356._8_4_ = 0x3f800000;
          auVar356._0_8_ = 0x3f8000003f800000;
          auVar356._12_4_ = 0x3f800000;
          auVar356._16_4_ = 0x3f800000;
          auVar356._20_4_ = 0x3f800000;
          auVar356._24_4_ = 0x3f800000;
          auVar356._28_4_ = 0x3f800000;
          auVar43 = vsubps_avx(auVar356,auVar83);
          fVar247 = auVar43._0_4_ * fVar247 + fVar247;
          fVar254 = auVar43._4_4_ * fVar254 + fVar254;
          fVar260 = auVar43._8_4_ * fVar260 + fVar260;
          fVar263 = auVar43._12_4_ * fVar263 + fVar263;
          fVar264 = auVar43._16_4_ * fVar264 + fVar264;
          fVar265 = auVar43._20_4_ * fVar265 + fVar265;
          fVar278 = auVar43._24_4_ * fVar278 + fVar278;
          fVar280 = auVar43._28_4_ + auVar37._28_4_;
          auVar186 = ZEXT3264(CONCAT428(fVar280,CONCAT424(fVar278,CONCAT420(fVar265,CONCAT416(
                                                  fVar264,CONCAT412(fVar263,CONCAT48(fVar260,
                                                  CONCAT44(fVar254,fVar247))))))));
          auVar84._4_4_ =
               (auVar38._4_4_ * fVar262 + auVar39._4_4_ * fVar261 + auVar40._4_4_ * fVar191) *
               fVar254;
          auVar84._0_4_ =
               (auVar38._0_4_ * fVar233 + auVar39._0_4_ * fVar212 + auVar40._0_4_ * fVar199) *
               fVar247;
          auVar84._8_4_ =
               (auVar38._8_4_ * fVar276 + auVar39._8_4_ * fVar267 + auVar40._8_4_ * fVar298) *
               fVar260;
          auVar84._12_4_ =
               (auVar38._12_4_ * fVar286 + auVar39._12_4_ * fVar284 + auVar40._12_4_ * fVar193) *
               fVar263;
          auVar84._16_4_ =
               (auVar38._16_4_ * fVar327 + auVar39._16_4_ * fVar325 + auVar40._16_4_ * fVar195) *
               fVar264;
          auVar84._20_4_ =
               (auVar38._20_4_ * fVar237 + auVar39._20_4_ * fVar238 + auVar40._20_4_ * fVar197) *
               fVar265;
          auVar84._24_4_ =
               (auVar38._24_4_ * fVar253 + auVar39._24_4_ * fVar172 + auVar40._24_4_ * fVar235) *
               fVar278;
          auVar84._28_4_ = local_520._28_4_ + auVar42._28_4_ + auVar160._28_4_;
          auVar218 = vpermilps_avx((undefined1  [16])aVar13,0xff);
          auVar227._16_16_ = auVar218;
          auVar227._0_16_ = auVar218;
          auVar160 = vcmpps_avx(auVar227,auVar84,2);
          fVar215 = ray->tfar;
          auVar257._4_4_ = fVar215;
          auVar257._0_4_ = fVar215;
          auVar257._8_4_ = fVar215;
          auVar257._12_4_ = fVar215;
          auVar257._16_4_ = fVar215;
          auVar257._20_4_ = fVar215;
          auVar257._24_4_ = fVar215;
          auVar257._28_4_ = fVar215;
          auVar37 = vcmpps_avx(auVar84,auVar257,2);
          auVar160 = vandps_avx(auVar37,auVar160);
          auVar218 = vpackssdw_avx(auVar160._0_16_,auVar160._16_16_);
          auVar217 = vpand_avx(auVar217,auVar218);
          auVar218 = vpmovsxwd_avx(auVar217);
          auVar219 = vpshufd_avx(auVar217,0xee);
          auVar219 = vpmovsxwd_avx(auVar219);
          auVar228._16_16_ = auVar219;
          auVar228._0_16_ = auVar218;
          if ((((((((auVar228 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar228 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar228 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar228 >> 0x7f,0) == '\0') &&
                (auVar228 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar219 >> 0x3f,0) == '\0') &&
              (auVar228 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar219[0xf]) goto LAB_011b6dc3;
          auVar160 = vcmpps_avx(ZEXT832(0) << 0x20,auVar295,4);
          auVar218 = vpackssdw_avx(auVar160._0_16_,auVar160._16_16_);
          auVar217 = vpand_avx(auVar217,auVar218);
          auVar218 = vpmovsxwd_avx(auVar217);
          auVar217 = vpunpckhwd_avx(auVar217,auVar217);
          auVar274._16_16_ = auVar217;
          auVar274._0_16_ = auVar218;
          auVar170 = ZEXT3264(CONCAT824(uStack_4a8,
                                        CONCAT816(uStack_4b0,CONCAT88(uStack_4b8,local_4c0))));
          auVar369._4_4_ = fVar171;
          auVar369._0_4_ = fVar155;
          auVar369._8_4_ = fStack_7b8;
          auVar369._12_4_ = fStack_7b4;
          auVar369._16_4_ = fStack_7b0;
          auVar369._20_4_ = fStack_7ac;
          auVar369._24_4_ = fStack_7a8;
          auVar369._28_4_ = fStack_7a4;
          if ((((((((auVar274 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar274 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar274 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar274 >> 0x7f,0) != '\0') ||
                (auVar274 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar217 >> 0x3f,0) != '\0') ||
              (auVar274 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar217[0xf] < '\0') {
            auVar229._0_4_ = auVar182._0_4_ * fVar247;
            auVar229._4_4_ = auVar182._4_4_ * fVar254;
            auVar229._8_4_ = auVar182._8_4_ * fVar260;
            auVar229._12_4_ = auVar182._12_4_ * fVar263;
            auVar229._16_4_ = auVar182._16_4_ * fVar264;
            auVar229._20_4_ = auVar182._20_4_ * fVar265;
            auVar229._24_4_ = auVar182._24_4_ * fVar278;
            auVar229._28_4_ = 0;
            auVar85._4_4_ = auVar244._4_4_ * fVar254;
            auVar85._0_4_ = auVar244._0_4_ * fVar247;
            auVar85._8_4_ = auVar244._8_4_ * fVar260;
            auVar85._12_4_ = auVar244._12_4_ * fVar263;
            auVar85._16_4_ = auVar244._16_4_ * fVar264;
            auVar85._20_4_ = auVar244._20_4_ * fVar265;
            auVar85._24_4_ = auVar244._24_4_ * fVar278;
            auVar85._28_4_ = fVar280;
            auVar258._8_4_ = 0x3f800000;
            auVar258._0_8_ = 0x3f8000003f800000;
            auVar258._12_4_ = 0x3f800000;
            auVar258._16_4_ = 0x3f800000;
            auVar258._20_4_ = 0x3f800000;
            auVar258._24_4_ = 0x3f800000;
            auVar258._28_4_ = 0x3f800000;
            auVar160 = vsubps_avx(auVar258,auVar229);
            local_4e0 = vblendvps_avx(auVar160,auVar229,auVar44);
            auVar160 = vsubps_avx(auVar258,auVar85);
            _local_3a0 = vblendvps_avx(auVar160,auVar85,auVar44);
            auVar186 = ZEXT3264(_local_3a0);
            auVar170 = ZEXT3264(auVar274);
            local_500 = auVar84;
          }
        }
        auVar230 = ZEXT1664(auVar377);
        auVar364 = ZEXT3264(local_720);
        auVar160 = auVar170._0_32_;
        if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar160 >> 0x7f,0) != '\0') ||
              (auVar170 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar160 >> 0xbf,0) != '\0') ||
            (auVar170 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar170[0x1f] < '\0') {
          auVar37 = vsubps_avx(local_480,auVar369);
          fVar212 = auVar369._0_4_ + local_4e0._0_4_ * auVar37._0_4_;
          fVar233 = auVar369._4_4_ + local_4e0._4_4_ * auVar37._4_4_;
          fVar247 = auVar369._8_4_ + local_4e0._8_4_ * auVar37._8_4_;
          fVar254 = auVar369._12_4_ + local_4e0._12_4_ * auVar37._12_4_;
          fVar260 = auVar369._16_4_ + local_4e0._16_4_ * auVar37._16_4_;
          fVar261 = auVar369._20_4_ + local_4e0._20_4_ * auVar37._20_4_;
          fVar262 = auVar369._24_4_ + local_4e0._24_4_ * auVar37._24_4_;
          fVar263 = auVar369._28_4_ + auVar37._28_4_;
          fVar215 = local_748->depth_scale;
          auVar186 = ZEXT3264(CONCAT428(fVar215,CONCAT424(fVar215,CONCAT420(fVar215,CONCAT416(
                                                  fVar215,CONCAT412(fVar215,CONCAT48(fVar215,
                                                  CONCAT44(fVar215,fVar215))))))));
          auVar86._4_4_ = (fVar233 + fVar233) * fVar215;
          auVar86._0_4_ = (fVar212 + fVar212) * fVar215;
          auVar86._8_4_ = (fVar247 + fVar247) * fVar215;
          auVar86._12_4_ = (fVar254 + fVar254) * fVar215;
          auVar86._16_4_ = (fVar260 + fVar260) * fVar215;
          auVar86._20_4_ = (fVar261 + fVar261) * fVar215;
          auVar86._24_4_ = (fVar262 + fVar262) * fVar215;
          auVar86._28_4_ = fVar263 + fVar263;
          auVar37 = vcmpps_avx(local_500,auVar86,6);
          auVar38 = auVar160 & auVar37;
          if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar38 >> 0x7f,0) != '\0') ||
                (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar38 >> 0xbf,0) != '\0') ||
              (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar38[0x1f] < '\0') {
            local_220 = vandps_avx(auVar37,auVar160);
            local_3a0._0_4_ = (float)local_3a0._0_4_ + (float)local_3a0._0_4_ + -1.0;
            local_3a0._4_4_ = (float)local_3a0._4_4_ + (float)local_3a0._4_4_ + -1.0;
            fStack_398 = fStack_398 + fStack_398 + -1.0;
            fStack_394 = fStack_394 + fStack_394 + -1.0;
            fStack_390 = fStack_390 + fStack_390 + -1.0;
            fStack_38c = fStack_38c + fStack_38c + -1.0;
            fStack_388 = fStack_388 + fStack_388 + -1.0;
            fStack_384 = fStack_384 + fStack_384 + -1.0;
            local_2e0 = local_4e0;
            local_2c0._4_4_ = local_3a0._4_4_;
            local_2c0._0_4_ = local_3a0._0_4_;
            fStack_2b8 = fStack_398;
            fStack_2b4 = fStack_394;
            fStack_2b0 = fStack_390;
            fStack_2ac = fStack_38c;
            fStack_2a8 = fStack_388;
            fStack_2a4 = fStack_384;
            local_2a0 = local_500;
            local_280 = 0;
            local_27c = uVar147;
            local_270 = local_650;
            uStack_268 = uStack_648;
            local_260 = local_570;
            uStack_258 = uStack_568;
            local_250 = local_580;
            uStack_248 = uStack_578;
            auVar186 = ZEXT1664(_local_590);
            local_240 = _local_590;
            if ((pGVar152->mask & ray->mask) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar154 = true, _local_650 = auVar15, _local_580 = auVar14, _local_570 = auVar16,
                 pGVar152->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar203._0_4_ = 1.0 / (float)(int)uVar147;
                auVar203._4_12_ = SUB6012((undefined1  [60])0x0,0);
                auVar377 = vshufps_avx(auVar203,auVar203,0);
                local_200[0] = auVar377._0_4_ * (local_4e0._0_4_ + 0.0);
                local_200[1] = auVar377._4_4_ * (local_4e0._4_4_ + 1.0);
                local_200[2] = auVar377._8_4_ * (local_4e0._8_4_ + 2.0);
                local_200[3] = auVar377._12_4_ * (local_4e0._12_4_ + 3.0);
                fStack_1f0 = auVar377._0_4_ * (local_4e0._16_4_ + 4.0);
                fStack_1ec = auVar377._4_4_ * (local_4e0._20_4_ + 5.0);
                fStack_1e8 = auVar377._8_4_ * (local_4e0._24_4_ + 6.0);
                fStack_1e4 = local_4e0._28_4_ + 7.0;
                auVar186 = ZEXT3264(_local_3a0);
                local_1e0 = _local_3a0;
                local_1c0 = local_500;
                uStack_7bc = (undefined4)((ulong)context->args >> 0x20);
                local_7c0 = vmovmskps_avx(local_220);
                uVar145 = CONCAT44(uStack_7bc,local_7c0);
                uVar148 = 0;
                if (uVar145 != 0) {
                  for (; (uVar145 >> uVar148 & 1) == 0; uVar148 = uVar148 + 1) {
                  }
                }
                if (local_7c0 == 0) {
                  bVar154 = false;
                  _local_650 = auVar15;
                  _local_580 = auVar14;
                  _local_570 = auVar16;
                }
                else {
                  local_7a0._0_4_ = ray->tfar;
                  _local_650 = auVar15;
                  _local_580 = auVar14;
                  _local_570 = auVar16;
                  _local_340 = auVar41;
                  _local_320 = auVar17;
                  do {
                    local_634 = local_200[uVar148];
                    local_630 = *(uint *)(local_1e0 + uVar148 * 4);
                    auVar186 = ZEXT464(local_630);
                    ray->tfar = *(float *)(local_1c0 + uVar148 * 4);
                    fVar187 = 1.0 - local_634;
                    fVar215 = local_634 * 3.0;
                    auVar377 = ZEXT416((uint)((fVar187 * -2.0 * local_634 + local_634 * local_634) *
                                             0.5));
                    auVar377 = vshufps_avx(auVar377,auVar377,0);
                    auVar217 = ZEXT416((uint)(((fVar187 + fVar187) * (fVar215 + 2.0) +
                                              fVar187 * fVar187 * -3.0) * 0.5));
                    auVar217 = vshufps_avx(auVar217,auVar217,0);
                    auVar218 = ZEXT416((uint)(((local_634 + local_634) * (fVar215 + -5.0) +
                                              local_634 * fVar215) * 0.5));
                    auVar218 = vshufps_avx(auVar218,auVar218,0);
                    auVar219 = ZEXT416((uint)((local_634 * (fVar187 + fVar187) - fVar187 * fVar187)
                                             * 0.5));
                    auVar219 = vshufps_avx(auVar219,auVar219,0);
                    auVar204._0_4_ =
                         auVar219._0_4_ * (float)local_650._0_4_ +
                         auVar218._0_4_ * (float)local_570._0_4_ +
                         auVar377._0_4_ * (float)local_590._0_4_ +
                         auVar217._0_4_ * (float)local_580._0_4_;
                    auVar204._4_4_ =
                         auVar219._4_4_ * (float)local_650._4_4_ +
                         auVar218._4_4_ * (float)local_570._4_4_ +
                         auVar377._4_4_ * (float)local_590._4_4_ +
                         auVar217._4_4_ * (float)local_580._4_4_;
                    auVar204._8_4_ =
                         auVar219._8_4_ * (float)uStack_648 +
                         auVar218._8_4_ * (float)uStack_568 +
                         auVar377._8_4_ * fStack_588 + auVar217._8_4_ * (float)uStack_578;
                    auVar204._12_4_ =
                         auVar219._12_4_ * uStack_648._4_4_ +
                         auVar218._12_4_ * uStack_568._4_4_ +
                         auVar377._12_4_ * fStack_584 + auVar217._12_4_ * uStack_578._4_4_;
                    local_6b0.context = context->user;
                    local_640 = vmovlps_avx(auVar204);
                    local_638 = vextractps_avx(auVar204,2);
                    local_62c = (int)local_608;
                    local_628 = (int)local_750;
                    local_624 = (local_6b0.context)->instID[0];
                    local_620 = (local_6b0.context)->instPrimID[0];
                    local_7c4 = -1;
                    local_6b0.valid = &local_7c4;
                    local_6b0.geometryUserPtr = pGVar152->userPtr;
                    local_6b0.ray = (RTCRayN *)ray;
                    local_6b0.hit = (RTCHitN *)&local_640;
                    local_6b0.N = 1;
                    if (pGVar152->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_011b5ee7:
                      p_Var35 = context->args->filter;
                      if ((p_Var35 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar152->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var35)(&local_6b0);
                        auVar186._8_56_ = extraout_var_02;
                        auVar186._0_8_ = extraout_XMM1_Qa_00;
                        if (*local_6b0.valid == 0) goto LAB_011b5f2c;
                      }
                      bVar154 = true;
                      auVar364 = ZEXT3264(local_720);
                      auVar230 = ZEXT1664(local_780._0_16_);
                      fVar187 = (float)local_740._0_4_;
                      fVar296 = (float)local_740._4_4_;
                      fVar234 = fStack_738;
                      fVar248 = fStack_734;
                      fVar231 = fStack_730;
                      fVar190 = fStack_72c;
                      fVar232 = fStack_728;
                      fVar297 = fStack_724;
                      fVar299 = (float)local_6e0._0_4_;
                      fVar307 = (float)local_6e0._4_4_;
                      fVar308 = fStack_6d8;
                      fVar309 = fStack_6d4;
                      fVar236 = fStack_6d0;
                      fVar239 = fStack_6cc;
                      fVar249 = fStack_6c8;
                      fVar340 = (float)local_700._0_4_;
                      fVar346 = (float)local_700._4_4_;
                      fVar347 = fStack_6f8;
                      fVar348 = fStack_6f4;
                      fVar250 = fStack_6f0;
                      fVar251 = fStack_6ec;
                      fVar252 = fStack_6e8;
                      break;
                    }
                    (*pGVar152->occlusionFilterN)(&local_6b0);
                    auVar186._8_56_ = extraout_var_01;
                    auVar186._0_8_ = extraout_XMM1_Qa;
                    if (*local_6b0.valid != 0) goto LAB_011b5ee7;
LAB_011b5f2c:
                    ray->tfar = (float)local_7a0._0_4_;
                    uVar145 = CONCAT44(uStack_7bc,local_7c0) ^ 1L << (uVar148 & 0x3f);
                    uVar148 = 0;
                    if (uVar145 != 0) {
                      for (; (uVar145 >> uVar148 & 1) == 0; uVar148 = uVar148 + 1) {
                      }
                    }
                    bVar154 = false;
                    local_7c0 = (uint)uVar145;
                    uStack_7bc = (undefined4)(uVar145 >> 0x20);
                    auVar364 = ZEXT3264(local_720);
                    auVar230 = ZEXT1664(local_780._0_16_);
                    fVar187 = (float)local_740._0_4_;
                    fVar296 = (float)local_740._4_4_;
                    fVar234 = fStack_738;
                    fVar248 = fStack_734;
                    fVar231 = fStack_730;
                    fVar190 = fStack_72c;
                    fVar232 = fStack_728;
                    fVar297 = fStack_724;
                    fVar299 = (float)local_6e0._0_4_;
                    fVar307 = (float)local_6e0._4_4_;
                    fVar308 = fStack_6d8;
                    fVar309 = fStack_6d4;
                    fVar236 = fStack_6d0;
                    fVar239 = fStack_6cc;
                    fVar249 = fStack_6c8;
                    fVar340 = (float)local_700._0_4_;
                    fVar346 = (float)local_700._4_4_;
                    fVar347 = fStack_6f8;
                    fVar348 = fStack_6f4;
                    fVar250 = fStack_6f0;
                    fVar251 = fStack_6ec;
                    fVar252 = fStack_6e8;
                  } while (uVar145 != 0);
                }
              }
              goto LAB_011b5b7c;
            }
          }
        }
        bVar154 = false;
        _local_650 = auVar15;
        _local_580 = auVar14;
        _local_570 = auVar16;
      }
LAB_011b5b7c:
      if (8 < (int)uVar147) {
        _local_320 = vpshufd_avx(ZEXT416(uVar147),0);
        auVar377 = vshufps_avx(auVar230._0_16_,auVar230._0_16_,0);
        register0x00001210 = auVar377;
        _local_360 = auVar377;
        auVar133._4_4_ = fStack_49c;
        auVar133._0_4_ = local_4a0;
        auVar133._8_4_ = fStack_498;
        auVar133._12_4_ = aStack_494.a;
        auVar377 = vpermilps_avx(auVar133,0xff);
        local_380._16_16_ = auVar377;
        local_380._0_16_ = auVar377;
        auVar159._0_4_ = 1.0 / (float)local_3e0._0_4_;
        auVar159._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar377 = vshufps_avx(auVar159,auVar159,0);
        _fStack_3d0 = auVar377;
        _local_3e0 = auVar377;
        auVar170 = ZEXT3264(_local_3e0);
        lVar153 = 8;
        do {
          pfVar1 = (float *)(catmullrom_basis0 + lVar153 * 4 + lVar151);
          fVar233 = *pfVar1;
          fVar247 = pfVar1[1];
          fVar254 = pfVar1[2];
          fVar260 = pfVar1[3];
          fStack_490 = pfVar1[4];
          fStack_48c = pfVar1[5];
          fStack_488 = pfVar1[6];
          pauVar11 = (undefined1 (*) [28])(lVar151 + 0x21b37f0 + lVar153 * 4);
          fVar215 = *(float *)*pauVar11;
          fVar212 = *(float *)(*pauVar11 + 4);
          fVar261 = *(float *)(*pauVar11 + 8);
          fVar262 = *(float *)(*pauVar11 + 0xc);
          fVar263 = *(float *)(*pauVar11 + 0x10);
          fVar264 = *(float *)(*pauVar11 + 0x14);
          fVar265 = *(float *)(*pauVar11 + 0x18);
          auVar138 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar151 + 0x21b3c74 + lVar153 * 4);
          fVar267 = *(float *)*pauVar11;
          fVar276 = *(float *)(*pauVar11 + 4);
          fVar278 = *(float *)(*pauVar11 + 8);
          fVar280 = *(float *)(*pauVar11 + 0xc);
          fVar282 = *(float *)(*pauVar11 + 0x10);
          fVar284 = *(float *)(*pauVar11 + 0x14);
          fVar286 = *(float *)(*pauVar11 + 0x18);
          auVar136 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar151 + 0x21b40f8 + lVar153 * 4);
          fVar310 = *(float *)*pauVar11;
          fVar321 = *(float *)(*pauVar11 + 4);
          fVar323 = *(float *)(*pauVar11 + 8);
          fVar325 = *(float *)(*pauVar11 + 0xc);
          fVar327 = *(float *)(*pauVar11 + 0x10);
          fVar213 = *(float *)(*pauVar11 + 0x14);
          fVar330 = *(float *)(*pauVar11 + 0x18);
          auVar135 = *pauVar11;
          fVar199 = auVar364._0_4_;
          fVar191 = auVar364._4_4_;
          fVar298 = auVar364._8_4_;
          fVar193 = auVar364._12_4_;
          fVar195 = auVar364._16_4_;
          fVar197 = auVar364._20_4_;
          fVar235 = auVar364._24_4_;
          fVar238 = auVar230._28_4_;
          fVar214 = fVar238 + *(float *)pauVar11[1];
          fStack_7a4 = fVar238 + fVar238 + auVar170._28_4_;
          auVar318._0_4_ =
               (float)local_100._0_4_ * fVar233 +
               (float)local_420._0_4_ * fVar215 +
               fVar199 * fVar267 + (float)local_400._0_4_ * fVar310;
          auVar318._4_4_ =
               (float)local_100._4_4_ * fVar247 +
               (float)local_420._4_4_ * fVar212 +
               fVar191 * fVar276 + (float)local_400._4_4_ * fVar321;
          auVar318._8_4_ =
               fStack_f8 * fVar254 + fStack_418 * fVar261 + fVar298 * fVar278 + fStack_3f8 * fVar323
          ;
          auVar318._12_4_ =
               fStack_f4 * fVar260 + fStack_414 * fVar262 + fVar193 * fVar280 + fStack_3f4 * fVar325
          ;
          auVar318._16_4_ =
               fStack_f0 * fStack_490 +
               fStack_410 * fVar263 + fVar195 * fVar282 + fStack_3f0 * fVar327;
          auVar318._20_4_ =
               fStack_ec * fStack_48c +
               fStack_40c * fVar264 + fVar197 * fVar284 + fStack_3ec * fVar213;
          auVar318._24_4_ =
               fStack_e8 * fStack_488 +
               fStack_408 * fVar265 + fVar235 * fVar286 + fStack_3e8 * fVar330;
          auVar318._28_4_ = fVar214 + fStack_7a4;
          local_780._0_4_ =
               (float)local_c0._0_4_ * fVar233 +
               fVar340 * fVar215 + fVar299 * fVar267 + fVar187 * fVar310;
          local_780._4_4_ =
               (float)local_c0._4_4_ * fVar247 +
               fVar346 * fVar212 + fVar307 * fVar276 + fVar296 * fVar321;
          local_780._8_4_ =
               fStack_b8 * fVar254 + fVar347 * fVar261 + fVar308 * fVar278 + fVar234 * fVar323;
          local_780._12_4_ =
               fStack_b4 * fVar260 + fVar348 * fVar262 + fVar309 * fVar280 + fVar248 * fVar325;
          local_780._16_4_ =
               fStack_b0 * fStack_490 + fVar250 * fVar263 + fVar236 * fVar282 + fVar231 * fVar327;
          local_780._20_4_ =
               fStack_ac * fStack_48c + fVar251 * fVar264 + fVar239 * fVar284 + fVar190 * fVar213;
          local_780._24_4_ =
               fStack_a8 * fStack_488 + fVar252 * fVar265 + fVar249 * fVar286 + fVar232 * fVar330;
          local_780._28_4_ = fStack_7a4 + fVar238 + fVar238 + auVar186._28_4_;
          auVar230 = ZEXT3264(local_780._0_32_);
          fStack_484 = pfVar1[7];
          fVar157 = fVar233 * (float)local_160._0_4_ +
                    fVar215 * (float)local_140._0_4_ +
                    (float)local_a0._0_4_ * fVar267 + fVar310 * (float)local_120._0_4_;
          fVar172 = fVar247 * (float)local_160._4_4_ +
                    fVar212 * (float)local_140._4_4_ +
                    (float)local_a0._4_4_ * fVar276 + fVar321 * (float)local_120._4_4_;
          fStack_7b8 = fVar254 * fStack_158 +
                       fVar261 * fStack_138 + fStack_98 * fVar278 + fVar323 * fStack_118;
          fStack_7b4 = fVar260 * fStack_154 +
                       fVar262 * fStack_134 + fStack_94 * fVar280 + fVar325 * fStack_114;
          fStack_7b0 = fStack_490 * fStack_150 +
                       fVar263 * fStack_130 + fStack_90 * fVar282 + fVar327 * fStack_110;
          fStack_7ac = fStack_48c * fStack_14c +
                       fVar264 * fStack_12c + fStack_8c * fVar284 + fVar213 * fStack_10c;
          fStack_7a8 = fStack_488 * fStack_148 +
                       fVar265 * fStack_128 + fStack_88 * fVar286 + fVar330 * fStack_108;
          fStack_7a4 = fStack_7a4 + fVar238 + fVar214;
          pauVar11 = (undefined1 (*) [28])(catmullrom_basis1 + lVar153 * 4 + lVar151);
          fVar215 = *(float *)*pauVar11;
          fVar212 = *(float *)(*pauVar11 + 4);
          fVar261 = *(float *)(*pauVar11 + 8);
          fVar262 = *(float *)(*pauVar11 + 0xc);
          fVar263 = *(float *)(*pauVar11 + 0x10);
          fVar264 = *(float *)(*pauVar11 + 0x14);
          fVar265 = *(float *)(*pauVar11 + 0x18);
          auVar142 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar151 + 0x21b5c10 + lVar153 * 4);
          fVar267 = *(float *)*pauVar11;
          fVar276 = *(float *)(*pauVar11 + 4);
          fVar278 = *(float *)(*pauVar11 + 8);
          fVar280 = *(float *)(*pauVar11 + 0xc);
          fVar282 = *(float *)(*pauVar11 + 0x10);
          fVar284 = *(float *)(*pauVar11 + 0x14);
          fVar286 = *(float *)(*pauVar11 + 0x18);
          auVar141 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar151 + 0x21b6094 + lVar153 * 4);
          fVar310 = *(float *)*pauVar11;
          fVar321 = *(float *)(*pauVar11 + 4);
          fVar323 = *(float *)(*pauVar11 + 8);
          fVar325 = *(float *)(*pauVar11 + 0xc);
          fVar327 = *(float *)(*pauVar11 + 0x10);
          fVar213 = *(float *)(*pauVar11 + 0x14);
          fVar330 = *(float *)(*pauVar11 + 0x18);
          auVar140 = *pauVar11;
          pauVar11 = (undefined1 (*) [28])(lVar151 + 0x21b6518 + lVar153 * 4);
          fVar214 = *(float *)*pauVar11;
          fVar238 = *(float *)(*pauVar11 + 4);
          fVar237 = *(float *)(*pauVar11 + 8);
          fVar332 = *(float *)(*pauVar11 + 0xc);
          fVar156 = *(float *)(*pauVar11 + 0x10);
          fVar155 = *(float *)(*pauVar11 + 0x14);
          fVar171 = *(float *)(*pauVar11 + 0x18);
          auVar139 = *pauVar11;
          fVar288 = fVar297 + *(float *)pauVar11[1];
          fVar253 = fVar297 + fVar297 + fStack_3e4;
          fVar266 = fVar297 + fVar297 + pfVar1[7];
          auVar374._0_4_ =
               (float)local_100._0_4_ * fVar215 +
               (float)local_420._0_4_ * fVar267 +
               fVar199 * fVar310 + (float)local_400._0_4_ * fVar214;
          auVar374._4_4_ =
               (float)local_100._4_4_ * fVar212 +
               (float)local_420._4_4_ * fVar276 +
               fVar191 * fVar321 + (float)local_400._4_4_ * fVar238;
          auVar374._8_4_ =
               fStack_f8 * fVar261 + fStack_418 * fVar278 + fVar298 * fVar323 + fStack_3f8 * fVar237
          ;
          auVar374._12_4_ =
               fStack_f4 * fVar262 + fStack_414 * fVar280 + fVar193 * fVar325 + fStack_3f4 * fVar332
          ;
          auVar374._16_4_ =
               fStack_f0 * fVar263 + fStack_410 * fVar282 + fVar195 * fVar327 + fStack_3f0 * fVar156
          ;
          auVar374._20_4_ =
               fStack_ec * fVar264 + fStack_40c * fVar284 + fVar197 * fVar213 + fStack_3ec * fVar155
          ;
          auVar374._24_4_ =
               fStack_e8 * fVar265 + fStack_408 * fVar286 + fVar235 * fVar330 + fStack_3e8 * fVar171
          ;
          auVar374._28_4_ = fVar288 + fVar253;
          auVar210._0_4_ =
               fVar215 * (float)local_c0._0_4_ +
               fVar340 * fVar267 + fVar299 * fVar310 + fVar187 * fVar214;
          auVar210._4_4_ =
               fVar212 * (float)local_c0._4_4_ +
               fVar346 * fVar276 + fVar307 * fVar321 + fVar296 * fVar238;
          auVar210._8_4_ =
               fVar261 * fStack_b8 + fVar347 * fVar278 + fVar308 * fVar323 + fVar234 * fVar237;
          auVar210._12_4_ =
               fVar262 * fStack_b4 + fVar348 * fVar280 + fVar309 * fVar325 + fVar248 * fVar332;
          auVar210._16_4_ =
               fVar263 * fStack_b0 + fVar250 * fVar282 + fVar236 * fVar327 + fVar231 * fVar156;
          auVar210._20_4_ =
               fVar264 * fStack_ac + fVar251 * fVar284 + fVar239 * fVar213 + fVar190 * fVar155;
          auVar210._24_4_ =
               fVar265 * fStack_a8 + fVar252 * fVar286 + fVar249 * fVar330 + fVar232 * fVar171;
          auVar210._28_4_ = fVar253 + fVar266;
          auVar361._0_4_ =
               fVar267 * (float)local_140._0_4_ +
               (float)local_a0._0_4_ * fVar310 + fVar214 * (float)local_120._0_4_ +
               fVar215 * (float)local_160._0_4_;
          auVar361._4_4_ =
               fVar276 * (float)local_140._4_4_ +
               (float)local_a0._4_4_ * fVar321 + fVar238 * (float)local_120._4_4_ +
               fVar212 * (float)local_160._4_4_;
          auVar361._8_4_ =
               fVar278 * fStack_138 + fStack_98 * fVar323 + fVar237 * fStack_118 +
               fVar261 * fStack_158;
          auVar361._12_4_ =
               fVar280 * fStack_134 + fStack_94 * fVar325 + fVar332 * fStack_114 +
               fVar262 * fStack_154;
          auVar361._16_4_ =
               fVar282 * fStack_130 + fStack_90 * fVar327 + fVar156 * fStack_110 +
               fVar263 * fStack_150;
          auVar361._20_4_ =
               fVar284 * fStack_12c + fStack_8c * fVar213 + fVar155 * fStack_10c +
               fVar264 * fStack_14c;
          auVar361._24_4_ =
               fVar286 * fStack_128 + fStack_88 * fVar330 + fVar171 * fStack_108 +
               fVar265 * fStack_148;
          auVar361._28_4_ = fVar297 + fVar288 + fVar253;
          auVar37 = vsubps_avx(auVar374,auVar318);
          _local_340 = vsubps_avx(auVar210,local_780._0_32_);
          fVar297 = auVar37._0_4_;
          fVar234 = auVar37._4_4_;
          auVar87._4_4_ = fVar234 * local_780._4_4_;
          auVar87._0_4_ = fVar297 * local_780._0_4_;
          fVar236 = auVar37._8_4_;
          auVar87._8_4_ = fVar236 * local_780._8_4_;
          fVar239 = auVar37._12_4_;
          auVar87._12_4_ = fVar239 * local_780._12_4_;
          fVar248 = auVar37._16_4_;
          auVar87._16_4_ = fVar248 * local_780._16_4_;
          fVar249 = auVar37._20_4_;
          auVar87._20_4_ = fVar249 * local_780._20_4_;
          fVar250 = auVar37._24_4_;
          auVar87._24_4_ = fVar250 * local_780._24_4_;
          auVar87._28_4_ = fVar253;
          fVar215 = local_340._0_4_;
          fVar187 = local_340._4_4_;
          auVar88._4_4_ = auVar318._4_4_ * fVar187;
          auVar88._0_4_ = auVar318._0_4_ * fVar215;
          fVar231 = local_340._8_4_;
          auVar88._8_4_ = auVar318._8_4_ * fVar231;
          fVar190 = local_340._12_4_;
          auVar88._12_4_ = auVar318._12_4_ * fVar190;
          fVar212 = local_340._16_4_;
          auVar88._16_4_ = auVar318._16_4_ * fVar212;
          fVar296 = local_340._20_4_;
          auVar88._20_4_ = auVar318._20_4_ * fVar296;
          fVar232 = local_340._24_4_;
          auVar88._24_4_ = auVar318._24_4_ * fVar232;
          auVar88._28_4_ = fVar266;
          auVar38 = vsubps_avx(auVar87,auVar88);
          auVar131._4_4_ = fVar172;
          auVar131._0_4_ = fVar157;
          auVar131._8_4_ = fStack_7b8;
          auVar131._12_4_ = fStack_7b4;
          auVar131._16_4_ = fStack_7b0;
          auVar131._20_4_ = fStack_7ac;
          auVar131._24_4_ = fStack_7a8;
          auVar131._28_4_ = fStack_7a4;
          auVar170 = ZEXT3264(auVar131);
          auVar160 = vmaxps_avx(auVar131,auVar361);
          auVar89._4_4_ = auVar160._4_4_ * auVar160._4_4_ * (fVar234 * fVar234 + fVar187 * fVar187);
          auVar89._0_4_ = auVar160._0_4_ * auVar160._0_4_ * (fVar297 * fVar297 + fVar215 * fVar215);
          auVar89._8_4_ = auVar160._8_4_ * auVar160._8_4_ * (fVar236 * fVar236 + fVar231 * fVar231);
          auVar89._12_4_ =
               auVar160._12_4_ * auVar160._12_4_ * (fVar239 * fVar239 + fVar190 * fVar190);
          auVar89._16_4_ =
               auVar160._16_4_ * auVar160._16_4_ * (fVar248 * fVar248 + fVar212 * fVar212);
          auVar89._20_4_ =
               auVar160._20_4_ * auVar160._20_4_ * (fVar249 * fVar249 + fVar296 * fVar296);
          auVar89._24_4_ =
               auVar160._24_4_ * auVar160._24_4_ * (fVar250 * fVar250 + fVar232 * fVar232);
          auVar89._28_4_ = fVar288 + fVar266;
          auVar90._4_4_ = auVar38._4_4_ * auVar38._4_4_;
          auVar90._0_4_ = auVar38._0_4_ * auVar38._0_4_;
          auVar90._8_4_ = auVar38._8_4_ * auVar38._8_4_;
          auVar90._12_4_ = auVar38._12_4_ * auVar38._12_4_;
          auVar90._16_4_ = auVar38._16_4_ * auVar38._16_4_;
          auVar90._20_4_ = auVar38._20_4_ * auVar38._20_4_;
          auVar90._24_4_ = auVar38._24_4_ * auVar38._24_4_;
          auVar90._28_4_ = auVar38._28_4_;
          auVar160 = vcmpps_avx(auVar90,auVar89,2);
          auVar186 = ZEXT3264(auVar160);
          local_280 = (uint)lVar153;
          auVar217 = vpshufd_avx(ZEXT416(local_280),0);
          auVar377 = vpor_avx(auVar217,_DAT_01f7fcf0);
          auVar217 = vpor_avx(auVar217,_DAT_01fafea0);
          auVar377 = vpcmpgtd_avx(_local_320,auVar377);
          auVar217 = vpcmpgtd_avx(_local_320,auVar217);
          auVar211._16_16_ = auVar217;
          auVar211._0_16_ = auVar377;
          auVar38 = auVar211 & auVar160;
          fVar187 = (float)local_740._0_4_;
          fVar296 = (float)local_740._4_4_;
          fVar234 = fStack_738;
          fVar248 = fStack_734;
          fVar231 = fStack_730;
          fVar190 = fStack_72c;
          fVar232 = fStack_728;
          fVar297 = fStack_724;
          fVar299 = (float)local_6e0._0_4_;
          fVar307 = (float)local_6e0._4_4_;
          fVar308 = fStack_6d8;
          fVar309 = fStack_6d4;
          fVar236 = fStack_6d0;
          fVar239 = fStack_6cc;
          fVar249 = fStack_6c8;
          fVar340 = (float)local_700._0_4_;
          fVar346 = (float)local_700._4_4_;
          fVar347 = fStack_6f8;
          fVar348 = fStack_6f4;
          fVar250 = fStack_6f0;
          fVar251 = fStack_6ec;
          fVar252 = fStack_6e8;
          if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar38 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar38 >> 0x7f,0) == '\0') &&
                (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar38 >> 0xbf,0) == '\0') &&
              (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar38[0x1f]) {
            auVar364 = ZEXT3264(auVar364._0_32_);
          }
          else {
            local_560._0_4_ = auVar142._0_4_;
            local_560._4_4_ = auVar142._4_4_;
            fStack_558 = auVar142._8_4_;
            fStack_554 = auVar142._12_4_;
            fStack_550 = auVar142._16_4_;
            fStack_54c = auVar142._20_4_;
            fStack_548 = auVar142._24_4_;
            fVar267 = (float)local_680._0_4_ * (float)local_560._0_4_;
            fVar276 = (float)local_680._4_4_ * (float)local_560._4_4_;
            fVar278 = fStack_678 * fStack_558;
            fVar280 = fStack_674 * fStack_554;
            fVar282 = fStack_670 * fStack_550;
            fVar284 = fStack_66c * fStack_54c;
            fVar286 = fStack_668 * fStack_548;
            local_5e0._0_4_ = auVar141._0_4_;
            local_5e0._4_4_ = auVar141._4_4_;
            fStack_5d8 = auVar141._8_4_;
            fStack_5d4 = auVar141._12_4_;
            fStack_5d0 = auVar141._16_4_;
            fStack_5cc = auVar141._20_4_;
            fStack_5c8 = auVar141._24_4_;
            fVar310 = (float)local_300._0_4_ * (float)local_5e0._0_4_;
            fVar321 = (float)local_300._4_4_ * (float)local_5e0._4_4_;
            fVar323 = fStack_2f8 * fStack_5d8;
            fVar325 = fStack_2f4 * fStack_5d4;
            fVar327 = fStack_2f0 * fStack_5d0;
            fVar213 = fStack_2ec * fStack_5cc;
            fVar330 = fStack_2e8 * fStack_5c8;
            _local_5e0 = auVar211;
            local_540._0_4_ = auVar140._0_4_;
            local_540._4_4_ = auVar140._4_4_;
            fStack_538 = auVar140._8_4_;
            fStack_534 = auVar140._12_4_;
            fStack_530 = auVar140._16_4_;
            fStack_52c = auVar140._20_4_;
            fStack_528 = auVar140._24_4_;
            fVar215 = (float)local_e0._0_4_ * (float)local_540._0_4_;
            fVar212 = (float)local_e0._4_4_ * (float)local_540._4_4_;
            fVar261 = fStack_d8 * fStack_538;
            fVar262 = fStack_d4 * fStack_534;
            fVar263 = fStack_d0 * fStack_530;
            fVar264 = fStack_cc * fStack_52c;
            fVar265 = fStack_c8 * fStack_528;
            _local_560 = auVar361;
            _local_540 = auVar160;
            local_460._0_4_ = auVar139._0_4_;
            local_460._4_4_ = auVar139._4_4_;
            fStack_458 = auVar139._8_4_;
            fStack_454 = auVar139._12_4_;
            fStack_450 = auVar139._16_4_;
            fStack_44c = auVar139._20_4_;
            fStack_448 = auVar139._24_4_;
            local_460._0_4_ =
                 fVar267 + fVar310 + fVar215 + (float)local_600._0_4_ * (float)local_460._0_4_;
            local_460._4_4_ =
                 fVar276 + fVar321 + fVar212 + (float)local_600._4_4_ * (float)local_460._4_4_;
            fStack_458 = fVar278 + fVar323 + fVar261 + fStack_5f8 * fStack_458;
            fStack_454 = fVar280 + fVar325 + fVar262 + fStack_5f4 * fStack_454;
            fStack_450 = fVar282 + fVar327 + fVar263 + fStack_5f0 * fStack_450;
            fStack_44c = fVar284 + fVar213 + fVar264 + fStack_5ec * fStack_44c;
            fStack_448 = fVar286 + fVar330 + fVar265 + fStack_5e8 * fStack_448;
            fStack_444 = auVar318._28_4_ + fStack_664 + auVar160._28_4_ + 0.0;
            local_5c0._0_4_ = auVar138._0_4_;
            local_5c0._4_4_ = auVar138._4_4_;
            fStack_5b8 = auVar138._8_4_;
            fStack_5b4 = auVar138._12_4_;
            fStack_5b0 = auVar138._16_4_;
            fStack_5ac = auVar138._20_4_;
            fStack_5a8 = auVar138._24_4_;
            local_520._0_4_ = auVar136._0_4_;
            local_520._4_4_ = auVar136._4_4_;
            fStack_518 = auVar136._8_4_;
            fStack_514 = auVar136._12_4_;
            fStack_510 = auVar136._16_4_;
            fStack_50c = auVar136._20_4_;
            fStack_508 = auVar136._24_4_;
            fVar288 = (float)local_e0._0_4_ * (float)local_520._0_4_;
            fVar188 = (float)local_e0._4_4_ * (float)local_520._4_4_;
            fVar189 = fStack_d8 * fStack_518;
            fVar192 = fStack_d4 * fStack_514;
            fVar194 = fStack_d0 * fStack_510;
            fVar196 = fStack_cc * fStack_50c;
            fVar198 = fStack_c8 * fStack_508;
            local_440._0_4_ = auVar135._0_4_;
            local_440._4_4_ = auVar135._4_4_;
            fStack_438 = auVar135._8_4_;
            fStack_434 = auVar135._12_4_;
            fStack_430 = auVar135._16_4_;
            fStack_42c = auVar135._20_4_;
            fStack_428 = auVar135._24_4_;
            fVar268 = (float)local_600._0_4_ * (float)local_440._0_4_;
            fVar277 = (float)local_600._4_4_ * (float)local_440._4_4_;
            fVar279 = fStack_5f8 * fStack_438;
            fVar281 = fStack_5f4 * fStack_434;
            fVar283 = fStack_5f0 * fStack_430;
            fVar285 = fStack_5ec * fStack_42c;
            fVar287 = fStack_5e8 * fStack_428;
            pfVar1 = (float *)(lVar151 + 0x21b4e84 + lVar153 * 4);
            fVar215 = *pfVar1;
            fVar261 = pfVar1[1];
            fVar262 = pfVar1[2];
            fVar263 = pfVar1[3];
            fVar264 = pfVar1[4];
            fVar265 = pfVar1[5];
            fVar267 = pfVar1[6];
            pfVar2 = (float *)(lVar151 + 0x21b5308 + lVar153 * 4);
            fVar276 = *pfVar2;
            fVar278 = pfVar2[1];
            fVar280 = pfVar2[2];
            fVar282 = pfVar2[3];
            fVar284 = pfVar2[4];
            fVar286 = pfVar2[5];
            fVar310 = pfVar2[6];
            _local_520 = auVar374;
            fVar212 = auVar364._28_4_;
            pfVar3 = (float *)(lVar151 + 0x21b4a00 + lVar153 * 4);
            fVar321 = *pfVar3;
            fVar323 = pfVar3[1];
            fVar325 = pfVar3[2];
            fVar327 = pfVar3[3];
            fVar213 = pfVar3[4];
            fVar330 = pfVar3[5];
            fVar214 = pfVar3[6];
            fVar266 = pfVar1[7] + pfVar2[7];
            fVar200 = pfVar2[7] + fVar212 + 0.0;
            fVar289 = fVar212 + auVar361._28_4_ + fVar212 + 0.0;
            pfVar1 = (float *)(lVar151 + 0x21b457c + lVar153 * 4);
            fVar238 = *pfVar1;
            fVar237 = pfVar1[1];
            fVar332 = pfVar1[2];
            fVar156 = pfVar1[3];
            fVar155 = pfVar1[4];
            fVar171 = pfVar1[5];
            fVar253 = pfVar1[6];
            local_440._4_4_ =
                 (float)local_100._4_4_ * fVar237 +
                 fVar323 * (float)local_420._4_4_ +
                 fVar191 * fVar261 + (float)local_400._4_4_ * fVar278;
            local_440._0_4_ =
                 (float)local_100._0_4_ * fVar238 +
                 fVar321 * (float)local_420._0_4_ +
                 fVar199 * fVar215 + (float)local_400._0_4_ * fVar276;
            fStack_438 = fStack_f8 * fVar332 +
                         fVar325 * fStack_418 + fVar298 * fVar262 + fStack_3f8 * fVar280;
            fStack_434 = fStack_f4 * fVar156 +
                         fVar327 * fStack_414 + fVar193 * fVar263 + fStack_3f4 * fVar282;
            fStack_430 = fStack_f0 * fVar155 +
                         fVar213 * fStack_410 + fVar195 * fVar264 + fStack_3f0 * fVar284;
            fStack_42c = fStack_ec * fVar171 +
                         fVar330 * fStack_40c + fVar197 * fVar265 + fStack_3ec * fVar286;
            fStack_428 = fStack_e8 * fVar253 +
                         fVar214 * fStack_408 + fVar235 * fVar267 + fStack_3e8 * fVar310;
            fStack_424 = fVar266 + fVar200;
            auVar183._0_4_ =
                 (float)local_c0._0_4_ * fVar238 +
                 (float)local_6e0._0_4_ * fVar215 + (float)local_740._0_4_ * fVar276 +
                 fVar321 * (float)local_700._0_4_;
            auVar183._4_4_ =
                 (float)local_c0._4_4_ * fVar237 +
                 (float)local_6e0._4_4_ * fVar261 + (float)local_740._4_4_ * fVar278 +
                 fVar323 * (float)local_700._4_4_;
            auVar183._8_4_ =
                 fStack_b8 * fVar332 +
                 fStack_6d8 * fVar262 + fStack_738 * fVar280 + fVar325 * fStack_6f8;
            auVar183._12_4_ =
                 fStack_b4 * fVar156 +
                 fStack_6d4 * fVar263 + fStack_734 * fVar282 + fVar327 * fStack_6f4;
            auVar183._16_4_ =
                 fStack_b0 * fVar155 +
                 fStack_6d0 * fVar264 + fStack_730 * fVar284 + fVar213 * fStack_6f0;
            auVar183._20_4_ =
                 fStack_ac * fVar171 +
                 fStack_6cc * fVar265 + fStack_72c * fVar286 + fVar330 * fStack_6ec;
            auVar183._24_4_ =
                 fStack_a8 * fVar253 +
                 fStack_6c8 * fVar267 + fStack_728 * fVar310 + fVar214 * fStack_6e8;
            auVar183._28_4_ = fVar200 + fVar289;
            auVar362._0_4_ =
                 fVar321 * (float)local_300._0_4_ +
                 (float)local_e0._0_4_ * fVar215 + (float)local_600._0_4_ * fVar276 +
                 fVar238 * (float)local_680._0_4_;
            auVar362._4_4_ =
                 fVar323 * (float)local_300._4_4_ +
                 (float)local_e0._4_4_ * fVar261 + (float)local_600._4_4_ * fVar278 +
                 fVar237 * (float)local_680._4_4_;
            auVar362._8_4_ =
                 fVar325 * fStack_2f8 + fStack_d8 * fVar262 + fStack_5f8 * fVar280 +
                 fVar332 * fStack_678;
            auVar362._12_4_ =
                 fVar327 * fStack_2f4 + fStack_d4 * fVar263 + fStack_5f4 * fVar282 +
                 fVar156 * fStack_674;
            auVar362._16_4_ =
                 fVar213 * fStack_2f0 + fStack_d0 * fVar264 + fStack_5f0 * fVar284 +
                 fVar155 * fStack_670;
            auVar362._20_4_ =
                 fVar330 * fStack_2ec + fStack_cc * fVar265 + fStack_5ec * fVar286 +
                 fVar171 * fStack_66c;
            auVar362._24_4_ =
                 fVar214 * fStack_2e8 + fStack_c8 * fVar267 + fStack_5e8 * fVar310 +
                 fVar253 * fStack_668;
            auVar362._28_4_ = pfVar3[7] + fVar266 + fVar289;
            pfVar1 = (float *)(lVar151 + 0x21b72a4 + lVar153 * 4);
            fVar215 = *pfVar1;
            fVar261 = pfVar1[1];
            fVar262 = pfVar1[2];
            fVar263 = pfVar1[3];
            fVar264 = pfVar1[4];
            fVar265 = pfVar1[5];
            fVar267 = pfVar1[6];
            pfVar2 = (float *)(lVar151 + 0x21b7728 + lVar153 * 4);
            fVar276 = *pfVar2;
            fVar278 = pfVar2[1];
            fVar280 = pfVar2[2];
            fVar282 = pfVar2[3];
            fVar284 = pfVar2[4];
            fVar286 = pfVar2[5];
            fVar310 = pfVar2[6];
            pfVar3 = (float *)(lVar151 + 0x21b6e20 + lVar153 * 4);
            fVar321 = *pfVar3;
            fVar323 = pfVar3[1];
            fVar325 = pfVar3[2];
            fVar327 = pfVar3[3];
            fVar213 = pfVar3[4];
            fVar330 = pfVar3[5];
            fVar214 = pfVar3[6];
            pfVar4 = (float *)(lVar151 + 0x21b699c + lVar153 * 4);
            fVar238 = *pfVar4;
            fVar237 = pfVar4[1];
            fVar332 = pfVar4[2];
            fVar156 = pfVar4[3];
            fVar155 = pfVar4[4];
            fVar171 = pfVar4[5];
            fVar253 = pfVar4[6];
            auVar319._0_4_ =
                 fVar238 * (float)local_100._0_4_ +
                 fVar321 * (float)local_420._0_4_ +
                 fVar199 * fVar215 + fVar276 * (float)local_400._0_4_;
            auVar319._4_4_ =
                 fVar237 * (float)local_100._4_4_ +
                 fVar323 * (float)local_420._4_4_ +
                 fVar191 * fVar261 + fVar278 * (float)local_400._4_4_;
            auVar319._8_4_ =
                 fVar332 * fStack_f8 +
                 fVar325 * fStack_418 + fVar298 * fVar262 + fVar280 * fStack_3f8;
            auVar319._12_4_ =
                 fVar156 * fStack_f4 +
                 fVar327 * fStack_414 + fVar193 * fVar263 + fVar282 * fStack_3f4;
            auVar319._16_4_ =
                 fVar155 * fStack_f0 +
                 fVar213 * fStack_410 + fVar195 * fVar264 + fVar284 * fStack_3f0;
            auVar319._20_4_ =
                 fVar171 * fStack_ec +
                 fVar330 * fStack_40c + fVar197 * fVar265 + fVar286 * fStack_3ec;
            auVar319._24_4_ =
                 fVar253 * fStack_e8 +
                 fVar214 * fStack_408 + fVar235 * fVar267 + fVar310 * fStack_3e8;
            auVar319._28_4_ = fStack_724 + fStack_724 + auVar318._28_4_ + fStack_3e4;
            auVar357._0_4_ =
                 (float)local_c0._0_4_ * fVar238 +
                 fVar321 * (float)local_700._0_4_ +
                 (float)local_6e0._0_4_ * fVar215 + (float)local_740._0_4_ * fVar276;
            auVar357._4_4_ =
                 (float)local_c0._4_4_ * fVar237 +
                 fVar323 * (float)local_700._4_4_ +
                 (float)local_6e0._4_4_ * fVar261 + (float)local_740._4_4_ * fVar278;
            auVar357._8_4_ =
                 fStack_b8 * fVar332 +
                 fVar325 * fStack_6f8 + fStack_6d8 * fVar262 + fStack_738 * fVar280;
            auVar357._12_4_ =
                 fStack_b4 * fVar156 +
                 fVar327 * fStack_6f4 + fStack_6d4 * fVar263 + fStack_734 * fVar282;
            auVar357._16_4_ =
                 fStack_b0 * fVar155 +
                 fVar213 * fStack_6f0 + fStack_6d0 * fVar264 + fStack_730 * fVar284;
            auVar357._20_4_ =
                 fStack_ac * fVar171 +
                 fVar330 * fStack_6ec + fStack_6cc * fVar265 + fStack_72c * fVar286;
            auVar357._24_4_ =
                 fStack_a8 * fVar253 +
                 fVar214 * fStack_6e8 + fStack_6c8 * fVar267 + fStack_728 * fVar310;
            auVar357._28_4_ = fStack_724 + fStack_724 + fStack_e4 + fStack_724;
            auVar259._8_4_ = 0x7fffffff;
            auVar259._0_8_ = 0x7fffffff7fffffff;
            auVar259._12_4_ = 0x7fffffff;
            auVar259._16_4_ = 0x7fffffff;
            auVar259._20_4_ = 0x7fffffff;
            auVar259._24_4_ = 0x7fffffff;
            auVar259._28_4_ = 0x7fffffff;
            auVar38 = vandps_avx(_local_440,auVar259);
            auVar39 = vandps_avx(auVar183,auVar259);
            auVar39 = vmaxps_avx(auVar38,auVar39);
            auVar38 = vandps_avx(auVar362,auVar259);
            auVar39 = vmaxps_avx(auVar39,auVar38);
            auVar39 = vcmpps_avx(auVar39,_local_360,1);
            auVar40 = vblendvps_avx(_local_440,auVar37,auVar39);
            auVar167._0_4_ =
                 fVar238 * (float)local_680._0_4_ +
                 fVar321 * (float)local_300._0_4_ +
                 fVar276 * (float)local_600._0_4_ + (float)local_e0._0_4_ * fVar215;
            auVar167._4_4_ =
                 fVar237 * (float)local_680._4_4_ +
                 fVar323 * (float)local_300._4_4_ +
                 fVar278 * (float)local_600._4_4_ + (float)local_e0._4_4_ * fVar261;
            auVar167._8_4_ =
                 fVar332 * fStack_678 +
                 fVar325 * fStack_2f8 + fVar280 * fStack_5f8 + fStack_d8 * fVar262;
            auVar167._12_4_ =
                 fVar156 * fStack_674 +
                 fVar327 * fStack_2f4 + fVar282 * fStack_5f4 + fStack_d4 * fVar263;
            auVar167._16_4_ =
                 fVar155 * fStack_670 +
                 fVar213 * fStack_2f0 + fVar284 * fStack_5f0 + fStack_d0 * fVar264;
            auVar167._20_4_ =
                 fVar171 * fStack_66c +
                 fVar330 * fStack_2ec + fVar286 * fStack_5ec + fStack_cc * fVar265;
            auVar167._24_4_ =
                 fVar253 * fStack_668 +
                 fVar214 * fStack_2e8 + fVar310 * fStack_5e8 + fStack_c8 * fVar267;
            auVar167._28_4_ = auVar38._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar41 = vblendvps_avx(auVar183,_local_340,auVar39);
            auVar38 = vandps_avx(auVar319,auVar259);
            auVar39 = vandps_avx(auVar357,auVar259);
            auVar42 = vmaxps_avx(auVar38,auVar39);
            auVar38 = vandps_avx(auVar167,auVar259);
            auVar38 = vmaxps_avx(auVar42,auVar38);
            auVar39 = vcmpps_avx(auVar38,_local_360,1);
            auVar38 = vblendvps_avx(auVar319,auVar37,auVar39);
            auVar168._0_4_ =
                 (float)local_680._0_4_ * fVar233 +
                 (float)local_300._0_4_ * (float)local_5c0._0_4_ + fVar288 + fVar268;
            auVar168._4_4_ =
                 (float)local_680._4_4_ * fVar247 +
                 (float)local_300._4_4_ * (float)local_5c0._4_4_ + fVar188 + fVar277;
            auVar168._8_4_ = fStack_678 * fVar254 + fStack_2f8 * fStack_5b8 + fVar189 + fVar279;
            auVar168._12_4_ = fStack_674 * fVar260 + fStack_2f4 * fStack_5b4 + fVar192 + fVar281;
            auVar168._16_4_ = fStack_670 * fStack_490 + fStack_2f0 * fStack_5b0 + fVar194 + fVar283;
            auVar168._20_4_ = fStack_66c * fStack_48c + fStack_2ec * fStack_5ac + fVar196 + fVar285;
            auVar168._24_4_ = fStack_668 * fStack_488 + fStack_2e8 * fStack_5a8 + fVar198 + fVar287;
            auVar168._28_4_ = auVar42._28_4_ + fStack_444 + auVar160._28_4_ + 0.0;
            auVar39 = vblendvps_avx(auVar357,_local_340,auVar39);
            fVar199 = auVar40._0_4_;
            fVar191 = auVar40._4_4_;
            fVar298 = auVar40._8_4_;
            fVar193 = auVar40._12_4_;
            fVar195 = auVar40._16_4_;
            fVar197 = auVar40._20_4_;
            fVar235 = auVar40._24_4_;
            fVar188 = auVar40._28_4_;
            fVar280 = auVar38._0_4_;
            fVar284 = auVar38._4_4_;
            fVar310 = auVar38._8_4_;
            fVar323 = auVar38._12_4_;
            fVar327 = auVar38._16_4_;
            fVar330 = auVar38._20_4_;
            fVar238 = auVar38._24_4_;
            fVar215 = auVar41._0_4_;
            fVar233 = auVar41._4_4_;
            fVar254 = auVar41._8_4_;
            fVar261 = auVar41._12_4_;
            fVar263 = auVar41._16_4_;
            fVar265 = auVar41._20_4_;
            fVar276 = auVar41._24_4_;
            auVar338._0_4_ = fVar215 * fVar215 + fVar199 * fVar199;
            auVar338._4_4_ = fVar233 * fVar233 + fVar191 * fVar191;
            auVar338._8_4_ = fVar254 * fVar254 + fVar298 * fVar298;
            auVar338._12_4_ = fVar261 * fVar261 + fVar193 * fVar193;
            auVar338._16_4_ = fVar263 * fVar263 + fVar195 * fVar195;
            auVar338._20_4_ = fVar265 * fVar265 + fVar197 * fVar197;
            auVar338._24_4_ = fVar276 * fVar276 + fVar235 * fVar235;
            auVar338._28_4_ = auVar37._28_4_ + fVar212;
            auVar37 = vrsqrtps_avx(auVar338);
            fVar212 = auVar37._0_4_;
            fVar247 = auVar37._4_4_;
            auVar91._4_4_ = fVar247 * 1.5;
            auVar91._0_4_ = fVar212 * 1.5;
            fVar260 = auVar37._8_4_;
            auVar91._8_4_ = fVar260 * 1.5;
            fVar262 = auVar37._12_4_;
            auVar91._12_4_ = fVar262 * 1.5;
            fVar264 = auVar37._16_4_;
            auVar91._16_4_ = fVar264 * 1.5;
            fVar267 = auVar37._20_4_;
            auVar91._20_4_ = fVar267 * 1.5;
            fVar278 = auVar37._24_4_;
            auVar91._24_4_ = fVar278 * 1.5;
            auVar91._28_4_ = auVar357._28_4_;
            auVar92._4_4_ = fVar247 * fVar247 * fVar247 * auVar338._4_4_ * 0.5;
            auVar92._0_4_ = fVar212 * fVar212 * fVar212 * auVar338._0_4_ * 0.5;
            auVar92._8_4_ = fVar260 * fVar260 * fVar260 * auVar338._8_4_ * 0.5;
            auVar92._12_4_ = fVar262 * fVar262 * fVar262 * auVar338._12_4_ * 0.5;
            auVar92._16_4_ = fVar264 * fVar264 * fVar264 * auVar338._16_4_ * 0.5;
            auVar92._20_4_ = fVar267 * fVar267 * fVar267 * auVar338._20_4_ * 0.5;
            auVar92._24_4_ = fVar278 * fVar278 * fVar278 * auVar338._24_4_ * 0.5;
            auVar92._28_4_ = auVar338._28_4_;
            auVar40 = vsubps_avx(auVar91,auVar92);
            fVar332 = auVar40._0_4_;
            fVar156 = auVar40._4_4_;
            fVar155 = auVar40._8_4_;
            fVar171 = auVar40._12_4_;
            fVar253 = auVar40._16_4_;
            fVar266 = auVar40._20_4_;
            fVar288 = auVar40._24_4_;
            fVar212 = auVar39._0_4_;
            fVar247 = auVar39._4_4_;
            fVar260 = auVar39._8_4_;
            fVar262 = auVar39._12_4_;
            fVar264 = auVar39._16_4_;
            fVar267 = auVar39._20_4_;
            fVar278 = auVar39._24_4_;
            auVar306._0_4_ = fVar212 * fVar212 + fVar280 * fVar280;
            auVar306._4_4_ = fVar247 * fVar247 + fVar284 * fVar284;
            auVar306._8_4_ = fVar260 * fVar260 + fVar310 * fVar310;
            auVar306._12_4_ = fVar262 * fVar262 + fVar323 * fVar323;
            auVar306._16_4_ = fVar264 * fVar264 + fVar327 * fVar327;
            auVar306._20_4_ = fVar267 * fVar267 + fVar330 * fVar330;
            auVar306._24_4_ = fVar278 * fVar278 + fVar238 * fVar238;
            auVar306._28_4_ = auVar37._28_4_ + auVar38._28_4_;
            auVar37 = vrsqrtps_avx(auVar306);
            fVar282 = auVar37._0_4_;
            fVar286 = auVar37._4_4_;
            auVar93._4_4_ = fVar286 * 1.5;
            auVar93._0_4_ = fVar282 * 1.5;
            fVar321 = auVar37._8_4_;
            auVar93._8_4_ = fVar321 * 1.5;
            fVar325 = auVar37._12_4_;
            auVar93._12_4_ = fVar325 * 1.5;
            fVar213 = auVar37._16_4_;
            auVar93._16_4_ = fVar213 * 1.5;
            fVar214 = auVar37._20_4_;
            auVar93._20_4_ = fVar214 * 1.5;
            fVar237 = auVar37._24_4_;
            auVar93._24_4_ = fVar237 * 1.5;
            auVar93._28_4_ = auVar357._28_4_;
            auVar94._4_4_ = fVar286 * fVar286 * fVar286 * auVar306._4_4_ * 0.5;
            auVar94._0_4_ = fVar282 * fVar282 * fVar282 * auVar306._0_4_ * 0.5;
            auVar94._8_4_ = fVar321 * fVar321 * fVar321 * auVar306._8_4_ * 0.5;
            auVar94._12_4_ = fVar325 * fVar325 * fVar325 * auVar306._12_4_ * 0.5;
            auVar94._16_4_ = fVar213 * fVar213 * fVar213 * auVar306._16_4_ * 0.5;
            auVar94._20_4_ = fVar214 * fVar214 * fVar214 * auVar306._20_4_ * 0.5;
            auVar94._24_4_ = fVar237 * fVar237 * fVar237 * auVar306._24_4_ * 0.5;
            auVar94._28_4_ = auVar306._28_4_;
            auVar38 = vsubps_avx(auVar93,auVar94);
            fVar282 = auVar38._0_4_;
            fVar286 = auVar38._4_4_;
            fVar321 = auVar38._8_4_;
            fVar325 = auVar38._12_4_;
            fVar213 = auVar38._16_4_;
            fVar214 = auVar38._20_4_;
            fVar237 = auVar38._24_4_;
            local_4a0 = fVar157 * fVar332 * fVar215;
            fStack_49c = fVar172 * fVar156 * fVar233;
            auVar95._4_4_ = fStack_49c;
            auVar95._0_4_ = local_4a0;
            fStack_498 = fStack_7b8 * fVar155 * fVar254;
            auVar95._8_4_ = fStack_498;
            fVar215 = fStack_7b4 * fVar171 * fVar261;
            auVar95._12_4_ = fVar215;
            fStack_490 = fStack_7b0 * fVar253 * fVar263;
            auVar95._16_4_ = fStack_490;
            fStack_48c = fStack_7ac * fVar266 * fVar265;
            auVar95._20_4_ = fStack_48c;
            fStack_488 = fStack_7a8 * fVar288 * fVar276;
            auVar95._24_4_ = fStack_488;
            auVar95._28_4_ = auVar37._28_4_;
            local_4a0 = local_4a0 + auVar318._0_4_;
            fStack_49c = fStack_49c + auVar318._4_4_;
            fStack_498 = fStack_498 + auVar318._8_4_;
            aStack_494.w = fVar215 + auVar318._12_4_;
            fStack_490 = fStack_490 + auVar318._16_4_;
            fStack_48c = fStack_48c + auVar318._20_4_;
            fStack_488 = fStack_488 + auVar318._24_4_;
            fStack_484 = auVar37._28_4_ + auVar318._28_4_;
            fVar215 = fVar157 * fVar332 * -fVar199;
            fVar233 = fVar172 * fVar156 * -fVar191;
            auVar96._4_4_ = fVar233;
            auVar96._0_4_ = fVar215;
            fVar254 = fStack_7b8 * fVar155 * -fVar298;
            auVar96._8_4_ = fVar254;
            fVar261 = fStack_7b4 * fVar171 * -fVar193;
            auVar96._12_4_ = fVar261;
            fVar263 = fStack_7b0 * fVar253 * -fVar195;
            auVar96._16_4_ = fVar263;
            fVar265 = fStack_7ac * fVar266 * -fVar197;
            auVar96._20_4_ = fVar265;
            fVar276 = fStack_7a8 * fVar288 * -fVar235;
            auVar96._24_4_ = fVar276;
            auVar96._28_4_ = -fVar188;
            local_5c0._4_4_ = local_780._4_4_ + fVar233;
            local_5c0._0_4_ = local_780._0_4_ + fVar215;
            fStack_5b8 = local_780._8_4_ + fVar254;
            fStack_5b4 = local_780._12_4_ + fVar261;
            fStack_5b0 = local_780._16_4_ + fVar263;
            fStack_5ac = local_780._20_4_ + fVar265;
            fStack_5a8 = local_780._24_4_ + fVar276;
            fStack_5a4 = local_780._28_4_ + -fVar188;
            fVar215 = fVar332 * 0.0 * fVar157;
            fVar233 = fVar156 * 0.0 * fVar172;
            auVar97._4_4_ = fVar233;
            auVar97._0_4_ = fVar215;
            fVar254 = fVar155 * 0.0 * fStack_7b8;
            auVar97._8_4_ = fVar254;
            fVar261 = fVar171 * 0.0 * fStack_7b4;
            auVar97._12_4_ = fVar261;
            fVar263 = fVar253 * 0.0 * fStack_7b0;
            auVar97._16_4_ = fVar263;
            fVar265 = fVar266 * 0.0 * fStack_7ac;
            auVar97._20_4_ = fVar265;
            fVar276 = fVar288 * 0.0 * fStack_7a8;
            auVar97._24_4_ = fVar276;
            auVar97._28_4_ = fVar188;
            auVar43 = vsubps_avx(auVar318,auVar95);
            auVar375._0_4_ = fVar215 + auVar168._0_4_;
            auVar375._4_4_ = fVar233 + auVar168._4_4_;
            auVar375._8_4_ = fVar254 + auVar168._8_4_;
            auVar375._12_4_ = fVar261 + auVar168._12_4_;
            auVar375._16_4_ = fVar263 + auVar168._16_4_;
            auVar375._20_4_ = fVar265 + auVar168._20_4_;
            auVar375._24_4_ = fVar276 + auVar168._24_4_;
            auVar375._28_4_ = fVar188 + auVar168._28_4_;
            fVar215 = auVar361._0_4_ * fVar282 * fVar212;
            fVar212 = auVar361._4_4_ * fVar286 * fVar247;
            auVar98._4_4_ = fVar212;
            auVar98._0_4_ = fVar215;
            fVar233 = auVar361._8_4_ * fVar321 * fVar260;
            auVar98._8_4_ = fVar233;
            fVar247 = auVar361._12_4_ * fVar325 * fVar262;
            auVar98._12_4_ = fVar247;
            fVar254 = auVar361._16_4_ * fVar213 * fVar264;
            auVar98._16_4_ = fVar254;
            fVar260 = auVar361._20_4_ * fVar214 * fVar267;
            auVar98._20_4_ = fVar260;
            fVar261 = auVar361._24_4_ * fVar237 * fVar278;
            auVar98._24_4_ = fVar261;
            auVar98._28_4_ = fStack_7a4;
            auVar161 = vsubps_avx(local_780._0_32_,auVar96);
            auVar363._0_4_ = auVar374._0_4_ + fVar215;
            auVar363._4_4_ = auVar374._4_4_ + fVar212;
            auVar363._8_4_ = auVar374._8_4_ + fVar233;
            auVar363._12_4_ = auVar374._12_4_ + fVar247;
            auVar363._16_4_ = auVar374._16_4_ + fVar254;
            auVar363._20_4_ = auVar374._20_4_ + fVar260;
            auVar363._24_4_ = auVar374._24_4_ + fVar261;
            auVar363._28_4_ = auVar374._28_4_ + fStack_7a4;
            fVar215 = fVar282 * -fVar280 * auVar361._0_4_;
            fVar212 = fVar286 * -fVar284 * auVar361._4_4_;
            auVar99._4_4_ = fVar212;
            auVar99._0_4_ = fVar215;
            fVar233 = fVar321 * -fVar310 * auVar361._8_4_;
            auVar99._8_4_ = fVar233;
            fVar247 = fVar325 * -fVar323 * auVar361._12_4_;
            auVar99._12_4_ = fVar247;
            fVar254 = fVar213 * -fVar327 * auVar361._16_4_;
            auVar99._16_4_ = fVar254;
            fVar260 = fVar214 * -fVar330 * auVar361._20_4_;
            auVar99._20_4_ = fVar260;
            fVar261 = fVar237 * -fVar238 * auVar361._24_4_;
            auVar99._24_4_ = fVar261;
            auVar99._28_4_ = auVar318._28_4_;
            auVar162 = vsubps_avx(auVar168,auVar97);
            auVar245._0_4_ = auVar210._0_4_ + fVar215;
            auVar245._4_4_ = auVar210._4_4_ + fVar212;
            auVar245._8_4_ = auVar210._8_4_ + fVar233;
            auVar245._12_4_ = auVar210._12_4_ + fVar247;
            auVar245._16_4_ = auVar210._16_4_ + fVar254;
            auVar245._20_4_ = auVar210._20_4_ + fVar260;
            auVar245._24_4_ = auVar210._24_4_ + fVar261;
            auVar245._28_4_ = auVar210._28_4_ + auVar318._28_4_;
            fVar215 = fVar282 * 0.0 * auVar361._0_4_;
            fVar212 = fVar286 * 0.0 * auVar361._4_4_;
            auVar100._4_4_ = fVar212;
            auVar100._0_4_ = fVar215;
            fVar233 = fVar321 * 0.0 * auVar361._8_4_;
            auVar100._8_4_ = fVar233;
            fVar247 = fVar325 * 0.0 * auVar361._12_4_;
            auVar100._12_4_ = fVar247;
            fVar254 = fVar213 * 0.0 * auVar361._16_4_;
            auVar100._16_4_ = fVar254;
            fVar260 = fVar214 * 0.0 * auVar361._20_4_;
            auVar100._20_4_ = fVar260;
            fVar261 = fVar237 * 0.0 * auVar361._24_4_;
            auVar100._24_4_ = fVar261;
            auVar100._28_4_ = auVar168._28_4_;
            auVar37 = vsubps_avx(auVar374,auVar98);
            auVar320._0_4_ = (float)local_460._0_4_ + fVar215;
            auVar320._4_4_ = (float)local_460._4_4_ + fVar212;
            auVar320._8_4_ = fStack_458 + fVar233;
            auVar320._12_4_ = fStack_454 + fVar247;
            auVar320._16_4_ = fStack_450 + fVar254;
            auVar320._20_4_ = fStack_44c + fVar260;
            auVar320._24_4_ = fStack_448 + fVar261;
            auVar320._28_4_ = fStack_444 + auVar168._28_4_;
            auVar39 = vsubps_avx(auVar210,auVar99);
            auVar40 = vsubps_avx(_local_460,auVar100);
            auVar41 = vsubps_avx(auVar245,auVar161);
            auVar42 = vsubps_avx(auVar320,auVar162);
            auVar101._4_4_ = auVar162._4_4_ * auVar41._4_4_;
            auVar101._0_4_ = auVar162._0_4_ * auVar41._0_4_;
            auVar101._8_4_ = auVar162._8_4_ * auVar41._8_4_;
            auVar101._12_4_ = auVar162._12_4_ * auVar41._12_4_;
            auVar101._16_4_ = auVar162._16_4_ * auVar41._16_4_;
            auVar101._20_4_ = auVar162._20_4_ * auVar41._20_4_;
            auVar101._24_4_ = auVar162._24_4_ * auVar41._24_4_;
            auVar101._28_4_ = auVar357._28_4_;
            auVar102._4_4_ = auVar161._4_4_ * auVar42._4_4_;
            auVar102._0_4_ = auVar161._0_4_ * auVar42._0_4_;
            auVar102._8_4_ = auVar161._8_4_ * auVar42._8_4_;
            auVar102._12_4_ = auVar161._12_4_ * auVar42._12_4_;
            auVar102._16_4_ = auVar161._16_4_ * auVar42._16_4_;
            auVar102._20_4_ = auVar161._20_4_ * auVar42._20_4_;
            auVar102._24_4_ = auVar161._24_4_ * auVar42._24_4_;
            auVar102._28_4_ = auVar210._28_4_;
            auVar44 = vsubps_avx(auVar102,auVar101);
            auVar103._4_4_ = auVar43._4_4_ * auVar42._4_4_;
            auVar103._0_4_ = auVar43._0_4_ * auVar42._0_4_;
            auVar103._8_4_ = auVar43._8_4_ * auVar42._8_4_;
            auVar103._12_4_ = auVar43._12_4_ * auVar42._12_4_;
            auVar103._16_4_ = auVar43._16_4_ * auVar42._16_4_;
            auVar103._20_4_ = auVar43._20_4_ * auVar42._20_4_;
            auVar103._24_4_ = auVar43._24_4_ * auVar42._24_4_;
            auVar103._28_4_ = auVar42._28_4_;
            auVar42 = vsubps_avx(auVar363,auVar43);
            auVar104._4_4_ = auVar162._4_4_ * auVar42._4_4_;
            auVar104._0_4_ = auVar162._0_4_ * auVar42._0_4_;
            auVar104._8_4_ = auVar162._8_4_ * auVar42._8_4_;
            auVar104._12_4_ = auVar162._12_4_ * auVar42._12_4_;
            auVar104._16_4_ = auVar162._16_4_ * auVar42._16_4_;
            auVar104._20_4_ = auVar162._20_4_ * auVar42._20_4_;
            auVar104._24_4_ = auVar162._24_4_ * auVar42._24_4_;
            auVar104._28_4_ = auVar38._28_4_;
            auVar46 = vsubps_avx(auVar104,auVar103);
            auVar105._4_4_ = auVar161._4_4_ * auVar42._4_4_;
            auVar105._0_4_ = auVar161._0_4_ * auVar42._0_4_;
            auVar105._8_4_ = auVar161._8_4_ * auVar42._8_4_;
            auVar105._12_4_ = auVar161._12_4_ * auVar42._12_4_;
            auVar105._16_4_ = auVar161._16_4_ * auVar42._16_4_;
            auVar105._20_4_ = auVar161._20_4_ * auVar42._20_4_;
            auVar105._24_4_ = auVar161._24_4_ * auVar42._24_4_;
            auVar105._28_4_ = auVar38._28_4_;
            auVar106._4_4_ = auVar43._4_4_ * auVar41._4_4_;
            auVar106._0_4_ = auVar43._0_4_ * auVar41._0_4_;
            auVar106._8_4_ = auVar43._8_4_ * auVar41._8_4_;
            auVar106._12_4_ = auVar43._12_4_ * auVar41._12_4_;
            auVar106._16_4_ = auVar43._16_4_ * auVar41._16_4_;
            auVar106._20_4_ = auVar43._20_4_ * auVar41._20_4_;
            auVar106._24_4_ = auVar43._24_4_ * auVar41._24_4_;
            auVar106._28_4_ = auVar41._28_4_;
            auVar38 = vsubps_avx(auVar106,auVar105);
            auVar184._0_4_ = auVar44._0_4_ * 0.0 + auVar38._0_4_ + auVar46._0_4_ * 0.0;
            auVar184._4_4_ = auVar44._4_4_ * 0.0 + auVar38._4_4_ + auVar46._4_4_ * 0.0;
            auVar184._8_4_ = auVar44._8_4_ * 0.0 + auVar38._8_4_ + auVar46._8_4_ * 0.0;
            auVar184._12_4_ = auVar44._12_4_ * 0.0 + auVar38._12_4_ + auVar46._12_4_ * 0.0;
            auVar184._16_4_ = auVar44._16_4_ * 0.0 + auVar38._16_4_ + auVar46._16_4_ * 0.0;
            auVar184._20_4_ = auVar44._20_4_ * 0.0 + auVar38._20_4_ + auVar46._20_4_ * 0.0;
            auVar184._24_4_ = auVar44._24_4_ * 0.0 + auVar38._24_4_ + auVar46._24_4_ * 0.0;
            auVar184._28_4_ = auVar44._28_4_ + auVar38._28_4_ + auVar46._28_4_;
            auVar36 = vcmpps_avx(auVar184,ZEXT832(0) << 0x20,2);
            auVar134._4_4_ = fStack_49c;
            auVar134._0_4_ = local_4a0;
            auVar134._8_4_ = fStack_498;
            auVar134._12_4_ = aStack_494;
            auVar134._16_4_ = fStack_490;
            auVar134._20_4_ = fStack_48c;
            auVar134._24_4_ = fStack_488;
            auVar134._28_4_ = fStack_484;
            auVar37 = vblendvps_avx(auVar37,auVar134,auVar36);
            auVar230 = ZEXT3264(auVar37);
            auVar38 = vblendvps_avx(auVar39,_local_5c0,auVar36);
            auVar39 = vblendvps_avx(auVar40,auVar375,auVar36);
            auVar40 = vblendvps_avx(auVar43,auVar363,auVar36);
            auVar41 = vblendvps_avx(auVar161,auVar245,auVar36);
            auVar42 = vblendvps_avx(auVar162,auVar320,auVar36);
            auVar43 = vblendvps_avx(auVar363,auVar43,auVar36);
            auVar44 = vblendvps_avx(auVar245,auVar161,auVar36);
            auVar46 = vblendvps_avx(auVar320,auVar162,auVar36);
            local_780._0_32_ = vandps_avx(auVar160,auVar211);
            auVar43 = vsubps_avx(auVar43,auVar37);
            auVar178 = vsubps_avx(auVar44,auVar38);
            auVar46 = vsubps_avx(auVar46,auVar39);
            auVar160 = vsubps_avx(auVar38,auVar41);
            fVar215 = auVar178._0_4_;
            fVar268 = auVar39._0_4_;
            fVar262 = auVar178._4_4_;
            fVar277 = auVar39._4_4_;
            auVar107._4_4_ = fVar277 * fVar262;
            auVar107._0_4_ = fVar268 * fVar215;
            fVar280 = auVar178._8_4_;
            fVar279 = auVar39._8_4_;
            auVar107._8_4_ = fVar279 * fVar280;
            fVar325 = auVar178._12_4_;
            fVar281 = auVar39._12_4_;
            auVar107._12_4_ = fVar281 * fVar325;
            fVar332 = auVar178._16_4_;
            fVar283 = auVar39._16_4_;
            auVar107._16_4_ = fVar283 * fVar332;
            fVar199 = auVar178._20_4_;
            fVar285 = auVar39._20_4_;
            auVar107._20_4_ = fVar285 * fVar199;
            fVar188 = auVar178._24_4_;
            fVar287 = auVar39._24_4_;
            auVar107._24_4_ = fVar287 * fVar188;
            auVar107._28_4_ = auVar44._28_4_;
            fVar212 = auVar38._0_4_;
            fVar289 = auVar46._0_4_;
            fVar263 = auVar38._4_4_;
            fVar322 = auVar46._4_4_;
            auVar108._4_4_ = fVar322 * fVar263;
            auVar108._0_4_ = fVar289 * fVar212;
            fVar282 = auVar38._8_4_;
            fVar324 = auVar46._8_4_;
            auVar108._8_4_ = fVar324 * fVar282;
            fVar327 = auVar38._12_4_;
            fVar326 = auVar46._12_4_;
            auVar108._12_4_ = fVar326 * fVar327;
            fVar156 = auVar38._16_4_;
            fVar328 = auVar46._16_4_;
            auVar108._16_4_ = fVar328 * fVar156;
            fVar191 = auVar38._20_4_;
            fVar329 = auVar46._20_4_;
            auVar108._20_4_ = fVar329 * fVar191;
            fVar189 = auVar38._24_4_;
            fVar331 = auVar46._24_4_;
            uVar12 = auVar161._28_4_;
            auVar108._24_4_ = fVar331 * fVar189;
            auVar108._28_4_ = uVar12;
            auVar44 = vsubps_avx(auVar108,auVar107);
            fVar233 = auVar37._0_4_;
            fVar264 = auVar37._4_4_;
            auVar109._4_4_ = fVar322 * fVar264;
            auVar109._0_4_ = fVar289 * fVar233;
            fVar284 = auVar37._8_4_;
            auVar109._8_4_ = fVar324 * fVar284;
            fVar213 = auVar37._12_4_;
            auVar109._12_4_ = fVar326 * fVar213;
            fVar155 = auVar37._16_4_;
            auVar109._16_4_ = fVar328 * fVar155;
            fVar298 = auVar37._20_4_;
            auVar109._20_4_ = fVar329 * fVar298;
            fVar192 = auVar37._24_4_;
            auVar109._24_4_ = fVar331 * fVar192;
            auVar109._28_4_ = uVar12;
            fVar247 = auVar43._0_4_;
            fVar265 = auVar43._4_4_;
            auVar110._4_4_ = fVar277 * fVar265;
            auVar110._0_4_ = fVar268 * fVar247;
            fVar286 = auVar43._8_4_;
            auVar110._8_4_ = fVar279 * fVar286;
            fVar330 = auVar43._12_4_;
            auVar110._12_4_ = fVar281 * fVar330;
            fVar171 = auVar43._16_4_;
            auVar110._16_4_ = fVar283 * fVar171;
            fVar193 = auVar43._20_4_;
            auVar110._20_4_ = fVar285 * fVar193;
            fVar194 = auVar43._24_4_;
            auVar110._24_4_ = fVar287 * fVar194;
            auVar110._28_4_ = auVar363._28_4_;
            auVar161 = vsubps_avx(auVar110,auVar109);
            auVar111._4_4_ = fVar263 * fVar265;
            auVar111._0_4_ = fVar212 * fVar247;
            auVar111._8_4_ = fVar282 * fVar286;
            auVar111._12_4_ = fVar327 * fVar330;
            auVar111._16_4_ = fVar156 * fVar171;
            auVar111._20_4_ = fVar191 * fVar193;
            auVar111._24_4_ = fVar189 * fVar194;
            auVar111._28_4_ = uVar12;
            auVar112._4_4_ = fVar264 * fVar262;
            auVar112._0_4_ = fVar233 * fVar215;
            auVar112._8_4_ = fVar284 * fVar280;
            auVar112._12_4_ = fVar213 * fVar325;
            auVar112._16_4_ = fVar155 * fVar332;
            auVar112._20_4_ = fVar298 * fVar199;
            auVar112._24_4_ = fVar192 * fVar188;
            auVar112._28_4_ = auVar162._28_4_;
            auVar162 = vsubps_avx(auVar112,auVar111);
            auVar179 = vsubps_avx(auVar39,auVar42);
            fVar260 = auVar162._28_4_ + auVar161._28_4_;
            auVar339._0_4_ = auVar162._0_4_ + auVar161._0_4_ * 0.0 + auVar44._0_4_ * 0.0;
            auVar339._4_4_ = auVar162._4_4_ + auVar161._4_4_ * 0.0 + auVar44._4_4_ * 0.0;
            auVar339._8_4_ = auVar162._8_4_ + auVar161._8_4_ * 0.0 + auVar44._8_4_ * 0.0;
            auVar339._12_4_ = auVar162._12_4_ + auVar161._12_4_ * 0.0 + auVar44._12_4_ * 0.0;
            auVar339._16_4_ = auVar162._16_4_ + auVar161._16_4_ * 0.0 + auVar44._16_4_ * 0.0;
            auVar339._20_4_ = auVar162._20_4_ + auVar161._20_4_ * 0.0 + auVar44._20_4_ * 0.0;
            auVar339._24_4_ = auVar162._24_4_ + auVar161._24_4_ * 0.0 + auVar44._24_4_ * 0.0;
            auVar339._28_4_ = fVar260 + auVar44._28_4_;
            fVar254 = auVar160._0_4_;
            fVar267 = auVar160._4_4_;
            auVar113._4_4_ = auVar42._4_4_ * fVar267;
            auVar113._0_4_ = auVar42._0_4_ * fVar254;
            fVar310 = auVar160._8_4_;
            auVar113._8_4_ = auVar42._8_4_ * fVar310;
            fVar214 = auVar160._12_4_;
            auVar113._12_4_ = auVar42._12_4_ * fVar214;
            fVar253 = auVar160._16_4_;
            auVar113._16_4_ = auVar42._16_4_ * fVar253;
            fVar195 = auVar160._20_4_;
            auVar113._20_4_ = auVar42._20_4_ * fVar195;
            fVar196 = auVar160._24_4_;
            auVar113._24_4_ = auVar42._24_4_ * fVar196;
            auVar113._28_4_ = fVar260;
            fVar260 = auVar179._0_4_;
            fVar276 = auVar179._4_4_;
            auVar114._4_4_ = auVar41._4_4_ * fVar276;
            auVar114._0_4_ = auVar41._0_4_ * fVar260;
            fVar321 = auVar179._8_4_;
            auVar114._8_4_ = auVar41._8_4_ * fVar321;
            fVar238 = auVar179._12_4_;
            auVar114._12_4_ = auVar41._12_4_ * fVar238;
            fVar266 = auVar179._16_4_;
            auVar114._16_4_ = auVar41._16_4_ * fVar266;
            fVar197 = auVar179._20_4_;
            auVar114._20_4_ = auVar41._20_4_ * fVar197;
            fVar198 = auVar179._24_4_;
            auVar114._24_4_ = auVar41._24_4_ * fVar198;
            auVar114._28_4_ = auVar162._28_4_;
            auVar160 = vsubps_avx(auVar114,auVar113);
            auVar161 = vsubps_avx(auVar37,auVar40);
            fVar261 = auVar161._0_4_;
            fVar278 = auVar161._4_4_;
            auVar115._4_4_ = auVar42._4_4_ * fVar278;
            auVar115._0_4_ = auVar42._0_4_ * fVar261;
            fVar323 = auVar161._8_4_;
            auVar115._8_4_ = auVar42._8_4_ * fVar323;
            fVar237 = auVar161._12_4_;
            auVar115._12_4_ = auVar42._12_4_ * fVar237;
            fVar288 = auVar161._16_4_;
            auVar115._16_4_ = auVar42._16_4_ * fVar288;
            fVar235 = auVar161._20_4_;
            auVar115._20_4_ = auVar42._20_4_ * fVar235;
            fVar200 = auVar161._24_4_;
            auVar115._24_4_ = auVar42._24_4_ * fVar200;
            auVar115._28_4_ = auVar42._28_4_;
            auVar116._4_4_ = fVar276 * auVar40._4_4_;
            auVar116._0_4_ = fVar260 * auVar40._0_4_;
            auVar116._8_4_ = fVar321 * auVar40._8_4_;
            auVar116._12_4_ = fVar238 * auVar40._12_4_;
            auVar116._16_4_ = fVar266 * auVar40._16_4_;
            auVar116._20_4_ = fVar197 * auVar40._20_4_;
            auVar116._24_4_ = fVar198 * auVar40._24_4_;
            auVar116._28_4_ = auVar44._28_4_;
            auVar42 = vsubps_avx(auVar115,auVar116);
            auVar117._4_4_ = auVar41._4_4_ * fVar278;
            auVar117._0_4_ = auVar41._0_4_ * fVar261;
            auVar117._8_4_ = auVar41._8_4_ * fVar323;
            auVar117._12_4_ = auVar41._12_4_ * fVar237;
            auVar117._16_4_ = auVar41._16_4_ * fVar288;
            auVar117._20_4_ = auVar41._20_4_ * fVar235;
            auVar117._24_4_ = auVar41._24_4_ * fVar200;
            auVar117._28_4_ = auVar41._28_4_;
            auVar118._4_4_ = fVar267 * auVar40._4_4_;
            auVar118._0_4_ = fVar254 * auVar40._0_4_;
            auVar118._8_4_ = fVar310 * auVar40._8_4_;
            auVar118._12_4_ = fVar214 * auVar40._12_4_;
            auVar118._16_4_ = fVar253 * auVar40._16_4_;
            auVar118._20_4_ = fVar195 * auVar40._20_4_;
            auVar118._24_4_ = fVar196 * auVar40._24_4_;
            auVar118._28_4_ = auVar40._28_4_;
            auVar40 = vsubps_avx(auVar118,auVar117);
            auVar169._0_4_ = auVar160._0_4_ * 0.0 + auVar40._0_4_ + auVar42._0_4_ * 0.0;
            auVar169._4_4_ = auVar160._4_4_ * 0.0 + auVar40._4_4_ + auVar42._4_4_ * 0.0;
            auVar169._8_4_ = auVar160._8_4_ * 0.0 + auVar40._8_4_ + auVar42._8_4_ * 0.0;
            auVar169._12_4_ = auVar160._12_4_ * 0.0 + auVar40._12_4_ + auVar42._12_4_ * 0.0;
            auVar169._16_4_ = auVar160._16_4_ * 0.0 + auVar40._16_4_ + auVar42._16_4_ * 0.0;
            auVar169._20_4_ = auVar160._20_4_ * 0.0 + auVar40._20_4_ + auVar42._20_4_ * 0.0;
            auVar169._24_4_ = auVar160._24_4_ * 0.0 + auVar40._24_4_ + auVar42._24_4_ * 0.0;
            auVar169._28_4_ = auVar42._28_4_ + auVar40._28_4_ + auVar42._28_4_;
            auVar170 = ZEXT3264(auVar169);
            auVar160 = vmaxps_avx(auVar339,auVar169);
            auVar160 = vcmpps_avx(auVar160,ZEXT432(0) << 0x20,2);
            auVar40 = local_780._0_32_ & auVar160;
            if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar40 >> 0x7f,0) == '\0') &&
                  (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar40 >> 0xbf,0) == '\0') &&
                (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar40[0x1f]) {
LAB_011b6d4a:
              auVar186 = ZEXT3264(CONCAT824(uStack_4a8,
                                            CONCAT816(uStack_4b0,CONCAT88(uStack_4b8,local_4c0))));
            }
            else {
              auVar40 = vandps_avx(auVar160,local_780._0_32_);
              auVar119._4_4_ = fVar276 * fVar262;
              auVar119._0_4_ = fVar260 * fVar215;
              auVar119._8_4_ = fVar321 * fVar280;
              auVar119._12_4_ = fVar238 * fVar325;
              auVar119._16_4_ = fVar266 * fVar332;
              auVar119._20_4_ = fVar197 * fVar199;
              auVar119._24_4_ = fVar198 * fVar188;
              auVar119._28_4_ = local_780._28_4_;
              auVar120._4_4_ = fVar267 * fVar322;
              auVar120._0_4_ = fVar254 * fVar289;
              auVar120._8_4_ = fVar310 * fVar324;
              auVar120._12_4_ = fVar214 * fVar326;
              auVar120._16_4_ = fVar253 * fVar328;
              auVar120._20_4_ = fVar195 * fVar329;
              auVar120._24_4_ = fVar196 * fVar331;
              auVar120._28_4_ = auVar160._28_4_;
              auVar41 = vsubps_avx(auVar120,auVar119);
              auVar121._4_4_ = fVar278 * fVar322;
              auVar121._0_4_ = fVar261 * fVar289;
              auVar121._8_4_ = fVar323 * fVar324;
              auVar121._12_4_ = fVar237 * fVar326;
              auVar121._16_4_ = fVar288 * fVar328;
              auVar121._20_4_ = fVar235 * fVar329;
              auVar121._24_4_ = fVar200 * fVar331;
              auVar121._28_4_ = auVar46._28_4_;
              auVar122._4_4_ = fVar276 * fVar265;
              auVar122._0_4_ = fVar260 * fVar247;
              auVar122._8_4_ = fVar321 * fVar286;
              auVar122._12_4_ = fVar238 * fVar330;
              auVar122._16_4_ = fVar266 * fVar171;
              auVar122._20_4_ = fVar197 * fVar193;
              auVar122._24_4_ = fVar198 * fVar194;
              auVar122._28_4_ = auVar179._28_4_;
              auVar42 = vsubps_avx(auVar122,auVar121);
              auVar123._4_4_ = fVar267 * fVar265;
              auVar123._0_4_ = fVar254 * fVar247;
              auVar123._8_4_ = fVar310 * fVar286;
              auVar123._12_4_ = fVar214 * fVar330;
              auVar123._16_4_ = fVar253 * fVar171;
              auVar123._20_4_ = fVar195 * fVar193;
              auVar123._24_4_ = fVar196 * fVar194;
              auVar123._28_4_ = auVar43._28_4_;
              auVar124._4_4_ = fVar278 * fVar262;
              auVar124._0_4_ = fVar261 * fVar215;
              auVar124._8_4_ = fVar323 * fVar280;
              auVar124._12_4_ = fVar237 * fVar325;
              auVar124._16_4_ = fVar288 * fVar332;
              auVar124._20_4_ = fVar235 * fVar199;
              auVar124._24_4_ = fVar200 * fVar188;
              auVar124._28_4_ = auVar178._28_4_;
              auVar44 = vsubps_avx(auVar124,auVar123);
              auVar185._0_4_ = auVar41._0_4_ * 0.0 + auVar44._0_4_ + auVar42._0_4_ * 0.0;
              auVar185._4_4_ = auVar41._4_4_ * 0.0 + auVar44._4_4_ + auVar42._4_4_ * 0.0;
              auVar185._8_4_ = auVar41._8_4_ * 0.0 + auVar44._8_4_ + auVar42._8_4_ * 0.0;
              auVar185._12_4_ = auVar41._12_4_ * 0.0 + auVar44._12_4_ + auVar42._12_4_ * 0.0;
              auVar185._16_4_ = auVar41._16_4_ * 0.0 + auVar44._16_4_ + auVar42._16_4_ * 0.0;
              auVar185._20_4_ = auVar41._20_4_ * 0.0 + auVar44._20_4_ + auVar42._20_4_ * 0.0;
              auVar185._24_4_ = auVar41._24_4_ * 0.0 + auVar44._24_4_ + auVar42._24_4_ * 0.0;
              auVar185._28_4_ = auVar178._28_4_ + auVar44._28_4_ + auVar43._28_4_;
              auVar160 = vrcpps_avx(auVar185);
              fVar247 = auVar160._0_4_;
              fVar254 = auVar160._4_4_;
              auVar125._4_4_ = auVar185._4_4_ * fVar254;
              auVar125._0_4_ = auVar185._0_4_ * fVar247;
              fVar260 = auVar160._8_4_;
              auVar125._8_4_ = auVar185._8_4_ * fVar260;
              fVar261 = auVar160._12_4_;
              auVar125._12_4_ = auVar185._12_4_ * fVar261;
              fVar262 = auVar160._16_4_;
              auVar125._16_4_ = auVar185._16_4_ * fVar262;
              fVar265 = auVar160._20_4_;
              auVar125._20_4_ = auVar185._20_4_ * fVar265;
              fVar267 = auVar160._24_4_;
              auVar125._24_4_ = auVar185._24_4_ * fVar267;
              auVar125._28_4_ = auVar179._28_4_;
              auVar358._8_4_ = 0x3f800000;
              auVar358._0_8_ = 0x3f8000003f800000;
              auVar358._12_4_ = 0x3f800000;
              auVar358._16_4_ = 0x3f800000;
              auVar358._20_4_ = 0x3f800000;
              auVar358._24_4_ = 0x3f800000;
              auVar358._28_4_ = 0x3f800000;
              auVar160 = vsubps_avx(auVar358,auVar125);
              fVar247 = auVar160._0_4_ * fVar247 + fVar247;
              fVar254 = auVar160._4_4_ * fVar254 + fVar254;
              fVar260 = auVar160._8_4_ * fVar260 + fVar260;
              fVar261 = auVar160._12_4_ * fVar261 + fVar261;
              fVar262 = auVar160._16_4_ * fVar262 + fVar262;
              fVar265 = auVar160._20_4_ * fVar265 + fVar265;
              fVar267 = auVar160._24_4_ * fVar267 + fVar267;
              auVar126._4_4_ =
                   (fVar264 * auVar41._4_4_ + auVar42._4_4_ * fVar263 + auVar44._4_4_ * fVar277) *
                   fVar254;
              auVar126._0_4_ =
                   (fVar233 * auVar41._0_4_ + auVar42._0_4_ * fVar212 + auVar44._0_4_ * fVar268) *
                   fVar247;
              auVar126._8_4_ =
                   (fVar284 * auVar41._8_4_ + auVar42._8_4_ * fVar282 + auVar44._8_4_ * fVar279) *
                   fVar260;
              auVar126._12_4_ =
                   (fVar213 * auVar41._12_4_ + auVar42._12_4_ * fVar327 + auVar44._12_4_ * fVar281)
                   * fVar261;
              auVar126._16_4_ =
                   (fVar155 * auVar41._16_4_ + auVar42._16_4_ * fVar156 + auVar44._16_4_ * fVar283)
                   * fVar262;
              auVar126._20_4_ =
                   (fVar298 * auVar41._20_4_ + auVar42._20_4_ * fVar191 + auVar44._20_4_ * fVar285)
                   * fVar265;
              auVar126._24_4_ =
                   (fVar192 * auVar41._24_4_ + auVar42._24_4_ * fVar189 + auVar44._24_4_ * fVar287)
                   * fVar267;
              auVar126._28_4_ = auVar37._28_4_ + auVar38._28_4_ + auVar39._28_4_;
              auVar230 = ZEXT3264(auVar126);
              fVar215 = ray->tfar;
              auVar246._4_4_ = fVar215;
              auVar246._0_4_ = fVar215;
              auVar246._8_4_ = fVar215;
              auVar246._12_4_ = fVar215;
              auVar246._16_4_ = fVar215;
              auVar246._20_4_ = fVar215;
              auVar246._24_4_ = fVar215;
              auVar246._28_4_ = fVar215;
              auVar160 = vcmpps_avx(local_380,auVar126,2);
              auVar37 = vcmpps_avx(auVar126,auVar246,2);
              auVar160 = vandps_avx(auVar160,auVar37);
              auVar38 = auVar40 & auVar160;
              if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar38 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar38 >> 0x7f,0) == '\0') &&
                    (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar38 >> 0xbf,0) == '\0') &&
                  (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar38[0x1f]) goto LAB_011b6d4a;
              auVar160 = vandps_avx(auVar40,auVar160);
              auVar38 = vcmpps_avx(ZEXT432(0) << 0x20,auVar185,4);
              auVar39 = auVar160 & auVar38;
              auVar186 = ZEXT3264(CONCAT824(uStack_4a8,
                                            CONCAT816(uStack_4b0,CONCAT88(uStack_4b8,local_4c0))));
              if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar39 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar39 >> 0x7f,0) != '\0') ||
                    (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar39 >> 0xbf,0) != '\0') ||
                  (auVar39 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar39[0x1f] < '\0') {
                auVar160 = vandps_avx(auVar38,auVar160);
                auVar186 = ZEXT3264(auVar160);
                auVar127._4_4_ = fVar254 * auVar339._4_4_;
                auVar127._0_4_ = fVar247 * auVar339._0_4_;
                auVar127._8_4_ = fVar260 * auVar339._8_4_;
                auVar127._12_4_ = fVar261 * auVar339._12_4_;
                auVar127._16_4_ = fVar262 * auVar339._16_4_;
                auVar127._20_4_ = fVar265 * auVar339._20_4_;
                auVar127._24_4_ = fVar267 * auVar339._24_4_;
                auVar127._28_4_ = auVar37._28_4_;
                auVar128._4_4_ = auVar169._4_4_ * fVar254;
                auVar128._0_4_ = auVar169._0_4_ * fVar247;
                auVar128._8_4_ = auVar169._8_4_ * fVar260;
                auVar128._12_4_ = auVar169._12_4_ * fVar261;
                auVar128._16_4_ = auVar169._16_4_ * fVar262;
                auVar128._20_4_ = auVar169._20_4_ * fVar265;
                auVar128._24_4_ = auVar169._24_4_ * fVar267;
                auVar128._28_4_ = auVar169._28_4_;
                auVar275._8_4_ = 0x3f800000;
                auVar275._0_8_ = 0x3f8000003f800000;
                auVar275._12_4_ = 0x3f800000;
                auVar275._16_4_ = 0x3f800000;
                auVar275._20_4_ = 0x3f800000;
                auVar275._24_4_ = 0x3f800000;
                auVar275._28_4_ = 0x3f800000;
                auVar160 = vsubps_avx(auVar275,auVar127);
                local_180 = vblendvps_avx(auVar160,auVar127,auVar36);
                auVar160 = vsubps_avx(auVar275,auVar128);
                _local_3c0 = vblendvps_avx(auVar160,auVar128,auVar36);
                auVar170 = ZEXT3264(_local_3c0);
                local_1a0 = auVar126;
              }
            }
            auVar364 = ZEXT3264(local_720);
            auVar160 = auVar186._0_32_;
            auVar132._4_4_ = fVar172;
            auVar132._0_4_ = fVar157;
            auVar132._8_4_ = fStack_7b8;
            auVar132._12_4_ = fStack_7b4;
            auVar132._16_4_ = fStack_7b0;
            auVar132._20_4_ = fStack_7ac;
            auVar132._24_4_ = fStack_7a8;
            auVar132._28_4_ = fStack_7a4;
            if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar160 >> 0x7f,0) != '\0') ||
                  (auVar186 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar160 >> 0xbf,0) != '\0') ||
                (auVar186 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar186[0x1f] < '\0') {
              auVar37 = vsubps_avx(auVar361,auVar132);
              auVar230 = ZEXT3264(local_180);
              fVar157 = fVar157 + auVar37._0_4_ * local_180._0_4_;
              fVar172 = fVar172 + auVar37._4_4_ * local_180._4_4_;
              fVar212 = fStack_7b8 + auVar37._8_4_ * local_180._8_4_;
              fVar233 = fStack_7b4 + auVar37._12_4_ * local_180._12_4_;
              fVar247 = fStack_7b0 + auVar37._16_4_ * local_180._16_4_;
              fVar254 = fStack_7ac + auVar37._20_4_ * local_180._20_4_;
              fVar260 = fStack_7a8 + auVar37._24_4_ * local_180._24_4_;
              fVar261 = fStack_7a4 + auVar37._28_4_;
              fVar215 = local_748->depth_scale;
              auVar129._4_4_ = (fVar172 + fVar172) * fVar215;
              auVar129._0_4_ = (fVar157 + fVar157) * fVar215;
              auVar129._8_4_ = (fVar212 + fVar212) * fVar215;
              auVar129._12_4_ = (fVar233 + fVar233) * fVar215;
              auVar129._16_4_ = (fVar247 + fVar247) * fVar215;
              auVar129._20_4_ = (fVar254 + fVar254) * fVar215;
              auVar129._24_4_ = (fVar260 + fVar260) * fVar215;
              auVar129._28_4_ = fVar261 + fVar261;
              auVar37 = vcmpps_avx(local_1a0,auVar129,6);
              auVar170 = ZEXT3264(auVar37);
              auVar38 = auVar160 & auVar37;
              if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar38 >> 0x7f,0) != '\0') ||
                    (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar38 >> 0xbf,0) != '\0') ||
                  (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar38[0x1f] < '\0') {
                local_220 = vandps_avx(auVar37,auVar160);
                auVar170 = ZEXT3264(local_220);
                local_1e0._0_4_ = (float)local_3c0._0_4_ + (float)local_3c0._0_4_ + -1.0;
                local_1e0._4_4_ = (float)local_3c0._4_4_ + (float)local_3c0._4_4_ + -1.0;
                local_1e0._8_4_ = fStack_3b8 + fStack_3b8 + -1.0;
                local_1e0._12_4_ = fStack_3b4 + fStack_3b4 + -1.0;
                auVar177._16_4_ = (float)uStack_3b0 + (float)uStack_3b0 + -1.0;
                auVar177._0_16_ = local_1e0._0_16_;
                auVar177._20_4_ = uStack_3b0._4_4_ + uStack_3b0._4_4_ + -1.0;
                fStack_2a8 = (float)uStack_3a8 + (float)uStack_3a8 + -1.0;
                _local_2c0 = auVar177;
                fStack_2a4 = uStack_3a8._4_4_ + uStack_3a8._4_4_ + -1.0;
                auVar186 = ZEXT3264(_local_2c0);
                local_2e0 = local_180;
                local_2a0 = local_1a0;
                local_27c = uVar147;
                local_270 = local_650;
                uStack_268 = uStack_648;
                local_260 = local_570;
                uStack_258 = uStack_568;
                local_250 = local_580;
                uStack_248 = uStack_578;
                local_240 = _local_590;
                local_7a0._0_8_ = (context->scene->geometries).items[local_750].ptr;
                _local_3c0 = _local_2c0;
                auVar160 = _local_3c0;
                if ((((Geometry *)local_7a0._0_8_)->mask & ray->mask) == 0) {
                  pRVar146 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar146 = context->args;
                  if ((pRVar146->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar146 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar146 >> 8),1),
                     ((Geometry *)local_7a0._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    stack0xfffffffffffff868 = auVar339._8_24_;
                    auVar176._0_4_ = (float)(int)local_280;
                    auVar176._4_8_ = SUB128(ZEXT812(0),4);
                    auVar176._12_4_ = 0;
                    auVar377 = vshufps_avx(auVar176,auVar176,0);
                    local_200[0] = (auVar377._0_4_ + local_180._0_4_ + 0.0) * (float)local_3e0._0_4_
                    ;
                    local_200[1] = (auVar377._4_4_ + local_180._4_4_ + 1.0) * (float)local_3e0._4_4_
                    ;
                    local_200[2] = (auVar377._8_4_ + local_180._8_4_ + 2.0) * fStack_3d8;
                    local_200[3] = (auVar377._12_4_ + local_180._12_4_ + 3.0) * fStack_3d4;
                    fStack_1f0 = (auVar377._0_4_ + local_180._16_4_ + 4.0) * fStack_3d0;
                    fStack_1ec = (auVar377._4_4_ + local_180._20_4_ + 5.0) * fStack_3cc;
                    fStack_1e8 = (auVar377._8_4_ + local_180._24_4_ + 6.0) * fStack_3c8;
                    fStack_1e4 = auVar377._12_4_ + (float)local_180._28_4_ + 7.0;
                    uStack_3b0 = auVar177._16_8_;
                    uStack_3a8 = local_2c0._24_8_;
                    local_1e0._16_8_ = uStack_3b0;
                    local_1e0._24_8_ = uStack_3a8;
                    auVar186 = ZEXT3264(local_1a0);
                    local_1c0 = local_1a0;
                    iVar144 = vmovmskps_avx(local_220);
                    uVar148 = CONCAT44((int)((ulong)pRVar146 >> 0x20),iVar144);
                    lVar149 = 0;
                    if (uVar148 != 0) {
                      for (; (uVar148 >> lVar149 & 1) == 0; lVar149 = lVar149 + 1) {
                      }
                    }
                    local_7c0 = (uint)lVar149;
                    uStack_7bc = (undefined4)((ulong)lVar149 >> 0x20);
                    local_780._0_8_ = uVar148;
                    _local_3c0 = auVar160;
                    if (iVar144 == 0) {
                      pRVar146 = (RTCIntersectArguments *)0x0;
LAB_011b6d67:
                      auVar364 = ZEXT3264(local_720);
                    }
                    else {
                      local_480._4_28_ = auVar210._4_28_;
                      local_480._0_4_ = ray->tfar;
                      pGVar152 = (Geometry *)local_7a0._0_8_;
                      do {
                        lVar149 = CONCAT44(uStack_7bc,local_7c0);
                        local_634 = local_200[lVar149];
                        auVar170 = ZEXT464((uint)local_634);
                        local_630 = *(uint *)(local_1e0 + lVar149 * 4);
                        auVar186 = ZEXT464(local_630);
                        ray->tfar = *(float *)(local_1c0 + lVar149 * 4);
                        fVar187 = 1.0 - local_634;
                        fVar215 = local_634 * 3.0;
                        auVar377 = ZEXT416((uint)((fVar187 * -2.0 * local_634 +
                                                  local_634 * local_634) * 0.5));
                        auVar377 = vshufps_avx(auVar377,auVar377,0);
                        auVar217 = ZEXT416((uint)(((fVar187 + fVar187) * (fVar215 + 2.0) +
                                                  fVar187 * fVar187 * -3.0) * 0.5));
                        auVar217 = vshufps_avx(auVar217,auVar217,0);
                        auVar218 = ZEXT416((uint)(((local_634 + local_634) * (fVar215 + -5.0) +
                                                  local_634 * fVar215) * 0.5));
                        auVar218 = vshufps_avx(auVar218,auVar218,0);
                        auVar219 = ZEXT416((uint)((local_634 * (fVar187 + fVar187) -
                                                  fVar187 * fVar187) * 0.5));
                        auVar219 = vshufps_avx(auVar219,auVar219,0);
                        auVar220._0_4_ = auVar219._0_4_ * (float)local_650._0_4_;
                        auVar220._4_4_ = auVar219._4_4_ * (float)local_650._4_4_;
                        auVar220._8_4_ = auVar219._8_4_ * (float)uStack_648;
                        auVar220._12_4_ = auVar219._12_4_ * uStack_648._4_4_;
                        auVar230 = ZEXT1664(auVar220);
                        auVar205._0_4_ =
                             auVar220._0_4_ +
                             auVar218._0_4_ * (float)local_570._0_4_ +
                             auVar377._0_4_ * (float)local_590._0_4_ +
                             auVar217._0_4_ * (float)local_580._0_4_;
                        auVar205._4_4_ =
                             auVar220._4_4_ +
                             auVar218._4_4_ * (float)local_570._4_4_ +
                             auVar377._4_4_ * (float)local_590._4_4_ +
                             auVar217._4_4_ * (float)local_580._4_4_;
                        auVar205._8_4_ =
                             auVar220._8_4_ +
                             auVar218._8_4_ * (float)uStack_568 +
                             auVar377._8_4_ * fStack_588 + auVar217._8_4_ * (float)uStack_578;
                        auVar205._12_4_ =
                             auVar220._12_4_ +
                             auVar218._12_4_ * uStack_568._4_4_ +
                             auVar377._12_4_ * fStack_584 + auVar217._12_4_ * uStack_578._4_4_;
                        local_6b0.context = context->user;
                        local_640 = vmovlps_avx(auVar205);
                        local_638 = vextractps_avx(auVar205,2);
                        local_62c = (int)local_608;
                        local_628 = (int)local_750;
                        local_624 = (local_6b0.context)->instID[0];
                        local_620 = (local_6b0.context)->instPrimID[0];
                        local_7c4 = -1;
                        local_6b0.valid = &local_7c4;
                        local_6b0.geometryUserPtr = pGVar152->userPtr;
                        local_6b0.ray = (RTCRayN *)ray;
                        local_6b0.hit = (RTCHitN *)&local_640;
                        local_6b0.N = 1;
                        if (pGVar152->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_011b6c65:
                          p_Var35 = context->args->filter;
                          if ((p_Var35 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              ((*(byte *)(local_7a0._0_8_ + 0x3e) & 0x40) != 0)))) {
                            auVar230 = ZEXT1664(auVar230._0_16_);
                            auVar377 = (*p_Var35)(&local_6b0);
                            auVar186._0_8_ = auVar377._8_8_;
                            auVar170._0_8_ = auVar377._0_8_;
                            auVar186._8_56_ = extraout_var_04;
                            auVar170._8_56_ = extraout_var_00;
                            if (*local_6b0.valid == 0) goto LAB_011b6cad;
                          }
                          pRVar146 = (RTCIntersectArguments *)0x1;
                          goto LAB_011b6d67;
                        }
                        auVar230 = ZEXT1664(auVar220);
                        auVar377 = (*pGVar152->occlusionFilterN)(&local_6b0);
                        auVar186._0_8_ = auVar377._8_8_;
                        auVar170._0_8_ = auVar377._0_8_;
                        auVar186._8_56_ = extraout_var_03;
                        auVar170._8_56_ = extraout_var;
                        if (*local_6b0.valid != 0) goto LAB_011b6c65;
LAB_011b6cad:
                        auVar170 = ZEXT464((uint)local_480._0_4_);
                        ray->tfar = (float)local_480._0_4_;
                        uVar148 = local_780._0_8_ ^ 1L << ((ulong)local_7c0 & 0x3f);
                        lVar149 = 0;
                        if (uVar148 != 0) {
                          for (; (uVar148 >> lVar149 & 1) == 0; lVar149 = lVar149 + 1) {
                          }
                        }
                        local_7c0 = (uint)lVar149;
                        uStack_7bc = (undefined4)((ulong)lVar149 >> 0x20);
                        pRVar146 = (RTCIntersectArguments *)0x0;
                        local_780._0_8_ = uVar148;
                        auVar364 = ZEXT3264(local_720);
                        pGVar152 = (Geometry *)local_7a0._0_8_;
                      } while (uVar148 != 0);
                    }
                  }
                }
                bVar154 = (bool)(bVar154 | (byte)pRVar146);
                fVar187 = (float)local_740._0_4_;
                fVar296 = (float)local_740._4_4_;
                fVar234 = fStack_738;
                fVar248 = fStack_734;
                fVar231 = fStack_730;
                fVar190 = fStack_72c;
                fVar232 = fStack_728;
                fVar297 = fStack_724;
                fVar299 = (float)local_6e0._0_4_;
                fVar307 = (float)local_6e0._4_4_;
                fVar308 = fStack_6d8;
                fVar309 = fStack_6d4;
                fVar236 = fStack_6d0;
                fVar239 = fStack_6cc;
                fVar249 = fStack_6c8;
                fVar340 = (float)local_700._0_4_;
                fVar346 = (float)local_700._4_4_;
                fVar347 = fStack_6f8;
                fVar348 = fStack_6f4;
                fVar250 = fStack_6f0;
                fVar251 = fStack_6ec;
                fVar252 = fStack_6e8;
              }
            }
          }
          lVar153 = lVar153 + 8;
        } while ((int)lVar153 < (int)uVar147);
      }
      if (bVar154 != false) {
        return bVar154;
      }
      fVar215 = ray->tfar;
      auVar166._4_4_ = fVar215;
      auVar166._0_4_ = fVar215;
      auVar166._8_4_ = fVar215;
      auVar166._12_4_ = fVar215;
      auVar166._16_4_ = fVar215;
      auVar166._20_4_ = fVar215;
      auVar166._24_4_ = fVar215;
      auVar166._28_4_ = fVar215;
      auVar160 = vcmpps_avx(local_80,auVar166,2);
      uVar147 = vmovmskps_avx(auVar160);
      uVar143 = uVar143 & uVar143 + 0xff & uVar147;
    } while (uVar143 != 0);
  }
  return false;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }